

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O2

void __thiscall
Spaghetti<RemSP>::PerformLabelingMem
          (Spaghetti<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  undefined8 uVar4;
  char cVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer piVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  uint uVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int c;
  int iVar19;
  void *__child_stack;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  char cVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  int r;
  long lVar32;
  void *__arg;
  long lVar33;
  long *plVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double dVar43;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long *local_3b0;
  long local_3a0;
  long *local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  ulong local_368;
  ulong local_360;
  long local_358;
  long *local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  ulong local_328;
  long *local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  int local_2d0;
  MemMat<int> img_labels;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  MemMat<unsigned_char> img;
  allocator_type local_10d;
  int local_10c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_108;
  value_type_conflict3 local_100;
  Size local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar20 = *(int *)&pMVar6->field_0x8;
  lVar17 = (long)iVar20;
  iVar36 = *(int *)&pMVar6->field_0xc;
  lVar26 = (long)iVar36;
  RemSP::MemAlloc(((iVar20 + 1) / 2) * ((iVar36 + 1) / 2) + 1);
  RemSP::MemSetup();
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar4 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_f8.height = (int)uVar4;
  local_f8.width = (int)((ulong)uVar4 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_f8,0);
  lVar15 = lVar26 + -2;
  local_2d0 = (int)lVar15;
  local_108 = accesses;
  if (iVar20 != 1) {
    local_350 = (long *)0x1;
    uVar22 = 0xfffffffffffffffe;
    while( true ) {
      lVar18 = (long)(int)uVar22;
      uVar10 = (int)uVar22 + 2;
      uVar22 = (ulong)uVar10;
      if (local_2d0 <= (int)uVar10) break;
      piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(img.img_._16_8_ + 2 + lVar18) != '\0') goto LAB_00152fa5;
      lVar32 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 8 + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      lVar27 = *(long *)img.img_._72_8_;
      if (*(char *)(lVar18 + 2 + img.img_._16_8_ + lVar27) != '\0') goto LAB_00152fa5;
LAB_00152d6c:
      lVar18 = (long)(int)uVar22;
      piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      if ((*(char *)(img.img_._16_8_ + 1 + lVar18) != '\0') ||
         (piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 4 + lVar18 * 4), *piVar3 = *piVar3 + 1,
         *(char *)(lVar18 + 1 + img.img_._16_8_ + lVar27) != '\0')) {
        uVar10 = RemSP::MemNewLabel();
        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
        local_380 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
LAB_00152dcc:
        do {
          lVar18 = (long)(int)uVar22;
          uVar10 = (int)uVar22 + 2;
          uVar22 = (ulong)uVar10;
          if (local_2d0 <= (int)uVar10) {
            piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            cVar28 = *(char *)(img.img_._16_8_ + 2 + lVar18);
            if (local_2d0 < (int)uVar10) {
              if (cVar28 == '\0') {
                piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + 8 +
                                lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar18 + 2 + img.img_._16_8_ + *(long *)img.img_._72_8_) == '\0') {
                  piVar3 = (int *)(local_380 + 8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_2d8 + 8 + lVar18 * 4) = 0;
                }
                else {
                  piVar3 = (int *)(local_380 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)(local_2d8 + lVar18 * 4);
                  piVar3 = (int *)(local_380 + 8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_2d8 + 8 + lVar18 * 4) = uVar12;
                }
              }
              else {
                piVar3 = (int *)(local_380 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                uVar12 = *(undefined4 *)(local_2d8 + lVar18 * 4);
                piVar3 = (int *)(local_380 + 8 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(local_2d8 + 8 + lVar18 * 4) = uVar12;
              }
            }
            else {
              if (cVar28 == '\0') {
                lVar32 = *(long *)img.accesses_._72_8_;
                piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 8 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                lVar27 = *(long *)img.img_._72_8_;
                if (*(char *)(lVar18 + 2 + img.img_._16_8_ + lVar27) == '\0') goto LAB_0015344b;
              }
LAB_00153377:
              lVar18 = (long)(int)uVar10;
              piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              piVar3 = (int *)(local_380 + -8 + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(local_2d8 + -8 + lVar18 * 4);
              piVar3 = (int *)(local_380 + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(local_2d8 + lVar18 * 4) = uVar12;
            }
            goto LAB_00153494;
          }
          piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(img.img_._16_8_ + 2 + lVar18) == '\0') {
            lVar32 = *(long *)img.accesses_._72_8_;
            piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 8 + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar18 + 2 + img.img_._16_8_ + lVar27) == '\0') goto LAB_00152d6c;
          }
          while( true ) {
            lVar32 = (long)(int)uVar22;
            piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = (long)((int)uVar22 + -2);
            if (*(char *)(img.img_._16_8_ + 1 + lVar32) != '\0') break;
            piVar3 = (int *)(local_380 + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            uVar12 = *(undefined4 *)(local_2d8 + lVar18 * 4);
            piVar3 = (int *)(local_380 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(local_2d8 + lVar32 * 4) = uVar12;
            while( true ) {
              iVar11 = (int)uVar22;
              lVar41 = (long)iVar11;
              lVar40 = lVar41 << 0x20;
              lVar18 = lVar41 * 4;
              lVar35 = 0;
              while( true ) {
                lVar25 = lVar40 >> 0x1e;
                if (lVar15 <= lVar35 + lVar41 + 2) {
                  lVar41 = lVar40 + 0x200000000 >> 0x1e;
                  *(int *)(img.accesses_._16_8_ + lVar41) =
                       *(int *)(img.accesses_._16_8_ + lVar41) + 1;
                  uVar10 = iVar11 + 2 + (int)lVar35;
                  lVar18 = lVar40 + 0x200000000 >> 0x20;
                  if (local_2d0 < (int)uVar10) {
                    if (*(char *)(img.img_._16_8_ + lVar18) == '\0') {
                      lVar32 = *(long *)img.accesses_._72_8_;
                      piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + lVar18 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar27 = *(long *)img.img_._72_8_;
                      if (*(char *)(lVar18 + img.img_._16_8_ + lVar27) == '\0') {
                        piVar3 = (int *)(local_380 + lVar18 * 4);
                        *piVar3 = *piVar3 + 1;
                        *(undefined4 *)(local_2d8 + lVar18 * 4) = 0;
                        goto LAB_00153494;
                      }
                    }
                    else {
                      lVar32 = *(long *)img.accesses_._72_8_;
                      lVar27 = *(long *)img.img_._72_8_;
                    }
                  }
                  else {
                    lVar32 = *(long *)img.accesses_._72_8_;
                    if (*(char *)(img.img_._16_8_ + lVar18) != '\0') {
                      piVar3 = (int *)(img.accesses_._16_8_ + lVar32 +
                                      (lVar40 + 0x100000000 >> 0x1e));
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)((lVar40 + 0x100000000 >> 0x20) +
                                   img.img_._16_8_ + *(long *)img.img_._72_8_) != '\0')
                      goto LAB_00153377;
                      goto LAB_001531d5;
                    }
                    piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + lVar18 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar27 = *(long *)img.img_._72_8_;
                    if (*(char *)(lVar18 + img.img_._16_8_ + lVar27) == '\0') goto LAB_0015344b;
                    piVar3 = (int *)(img.accesses_._16_8_ + 0xc + lVar25);
                    *piVar3 = *piVar3 + 1;
                  }
                  piVar3 = (int *)((lVar40 + 0x100000000 >> 0x1e) + img.accesses_._16_8_ + lVar32);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)((lVar40 + 0x100000000 >> 0x20) + img.img_._16_8_ + lVar27) == '\0')
                  {
                    uVar10 = RemSP::MemNewLabel();
                    *(int *)(img_labels.accesses_._16_8_ + lVar41) =
                         *(int *)(img_labels.accesses_._16_8_ + lVar41) + 1;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                  }
                  else {
                    *(int *)(local_380 + lVar25) = *(int *)(local_380 + lVar25) + 1;
                    uVar10 = *(uint *)(local_2d8 + lVar25);
                    *(int *)(local_380 + lVar41) = *(int *)(local_380 + lVar41) + 1;
                  }
                  *(uint *)(local_2d8 + lVar41) = uVar10;
                  goto LAB_00153494;
                }
                piVar3 = (int *)(img.accesses_._16_8_ + lVar18 + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + 2 + img.img_._16_8_ + lVar41) != '\0') break;
                lVar32 = *(long *)img.accesses_._72_8_;
                lVar42 = img.accesses_._16_8_ + lVar32 + lVar18;
                piVar3 = (int *)(lVar42 + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                lVar27 = *(long *)img.img_._72_8_;
                lVar39 = img.img_._16_8_ + lVar27 + lVar41;
                if (*(char *)(lVar35 + 2 + lVar39) == '\0') {
                  uVar22 = (ulong)(iVar11 + (int)lVar35 + 2);
                  goto LAB_00152d6c;
                }
                piVar3 = (int *)(img.accesses_._16_8_ + lVar18 + 0xc + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + 3 + img.img_._16_8_ + lVar41) != '\0') {
                  piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + (lVar40 + 0x100000000 >> 0x1e));
                  *piVar3 = *piVar3 + 1;
                  uVar22 = (ulong)(iVar11 + 2) + lVar35;
                  if (*(char *)(img.img_._16_8_ + lVar27 + (lVar40 + 0x100000000 >> 0x20)) == '\0')
                  {
                    uVar10 = RemSP::MemNewLabel();
                    piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 + 8 + lVar35 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(uint *)(img_labels.img_._16_8_ + lVar41 * 4 + 8 + lVar35 * 4) = uVar10;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                  }
                  else {
                    *(int *)(img_labels.accesses_._16_8_ + lVar25) =
                         *(int *)(img_labels.accesses_._16_8_ + lVar25) + 1;
                    uVar12 = *(undefined4 *)(img_labels.img_._16_8_ + lVar25);
                    piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 + 8 + lVar35 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(img_labels.img_._16_8_ + lVar41 * 4 + 8 + lVar35 * 4) = uVar12;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                  }
                  goto LAB_00152dcc;
                }
                piVar3 = (int *)(lVar42 + 4 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + 1 + lVar39) == '\0') {
                  uVar10 = RemSP::MemNewLabel();
                  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + 8 + lVar35 * 4);
                  *piVar3 = *piVar3 + 1;
                }
                else {
                  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + lVar35 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)(img_labels.img_._16_8_ + lVar18 + lVar35 * 4);
                  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + 8 + lVar35 * 4);
                  *piVar3 = *piVar3 + 1;
                }
                *(uint *)(img_labels.img_._16_8_ + lVar18 + 8 + lVar35 * 4) = uVar10;
                lVar40 = lVar40 + 0x200000000;
                lVar35 = lVar35 + 2;
                local_380 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
              }
              uVar22 = (ulong)(iVar11 + 2) + lVar35;
              piVar3 = (int *)((lVar40 + 0x100000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
              *piVar3 = *piVar3 + 1;
              if (*(char *)((lVar40 + 0x100000000 >> 0x20) +
                           *(long *)img.img_._72_8_ + img.img_._16_8_) != '\0') break;
LAB_00152fa5:
              lVar18 = (long)(int)uVar22;
              piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              cVar28 = *(char *)(img.img_._16_8_ + 1 + lVar18);
              uVar10 = RemSP::MemNewLabel();
              piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
              local_380 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              if (cVar28 != '\0') goto LAB_00152dcc;
            }
          }
          piVar3 = (int *)(local_380 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          uVar12 = *(undefined4 *)(local_2d8 + lVar18 * 4);
          piVar3 = (int *)(local_380 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(local_2d8 + lVar32 * 4) = uVar12;
        } while( true );
      }
      piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + lVar18 * 4) = 0;
    }
    piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar18 * 4);
    *piVar3 = *piVar3 + 1;
    cVar28 = *(char *)(img.img_._16_8_ + 2 + lVar18);
    if (local_2d0 < (int)uVar10) {
      if (cVar28 == '\0') {
        piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + 8 + lVar18 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar18 + 2 + img.img_._16_8_ + *(long *)img.img_._72_8_) == '\0') {
          piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar18 * 4) = 0;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
        else {
          uVar10 = RemSP::MemNewLabel();
          piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(img_labels.img_._16_8_ + 8 + lVar18 * 4) = uVar10;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
      }
      else {
        uVar10 = RemSP::MemNewLabel();
        piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar18 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(img_labels.img_._16_8_ + 8 + lVar18 * 4) = uVar10;
        local_380 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
      }
    }
    else {
      if (cVar28 == '\0') {
        lVar32 = *(long *)img.accesses_._72_8_;
        piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 8 + lVar18 * 4);
        *piVar3 = *piVar3 + 1;
        lVar27 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar18 + 2 + img.img_._16_8_ + lVar27) == '\0') {
LAB_0015344b:
          lVar18 = (long)(int)uVar10;
          piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
          *piVar3 = *piVar3 + 1;
          if ((*(char *)(img.img_._16_8_ + 1 + lVar18) == '\0') &&
             (piVar3 = (int *)(img.accesses_._16_8_ + lVar32 + 4 + lVar18 * 4),
             *piVar3 = *piVar3 + 1, *(char *)(lVar18 + 1 + img.img_._16_8_ + lVar27) == '\0')) {
            piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar18 * 4) = 0;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
          }
          else {
            uVar10 = RemSP::MemNewLabel();
            piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
            *piVar3 = *piVar3 + 1;
            *(uint *)(img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
          }
          goto LAB_00153494;
        }
      }
LAB_001531d5:
      lVar18 = (long)(int)uVar10;
      piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      uVar10 = RemSP::MemNewLabel();
      piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * 4);
      *piVar3 = *piVar3 + 1;
      *(uint *)(img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
      local_380 = img_labels.accesses_._16_8_;
      local_2d8 = img_labels.img_._16_8_;
    }
LAB_00153494:
    local_10c = iVar20 % 2;
    iVar11 = iVar20 - local_10c;
    local_318 = 3;
    local_308 = 0;
    for (uVar22 = 2; (long)uVar22 < (long)iVar11; uVar22 = uVar22 + 2) {
      local_338 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(img.accesses_._16_8_ + local_338 * uVar22);
      *piVar3 = *piVar3 + 1;
      lVar18 = *(long *)img.img_._72_8_;
      cVar28 = *(char *)(img.img_._16_8_ + lVar18 * uVar22);
      if (2 < iVar36) {
        local_3c8 = (long *)img.img_._16_8_;
        uVar21 = 0;
        uVar23 = uVar21;
        lVar32 = img.accesses_._16_8_;
        if (cVar28 == '\0') goto LAB_0015398a;
LAB_001535cc:
        lVar27 = uVar22 - 1;
        iVar19 = (int)uVar23;
        uVar29 = (ulong)iVar19;
        piVar3 = (int *)(local_338 * lVar27 + img.accesses_._16_8_ + 4 + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        lVar35 = lVar18 * lVar27 + img.img_._16_8_;
        uVar21 = uVar23;
        if (*(char *)(uVar29 + 1 + lVar35) == '\0') {
          local_338 = *(long *)img.accesses_._72_8_;
          piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          local_3c8 = (long *)img.img_._16_8_;
          lVar32 = img.accesses_._16_8_;
          if (*(char *)(uVar29 + 1 + lVar18 * uVar22 + img.img_._16_8_) != '\0') goto LAB_00153b6a;
          uVar16 = (ulong)iVar19;
          piVar3 = (int *)(lVar27 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                          uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar35 + uVar16) == '\0') {
            uVar10 = RemSP::MemNewLabel();
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_328 = *(ulong *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
            *piVar3 = *piVar3 + 1;
            local_320 = (long *)img_labels.img_._72_8_;
            local_2e0 = *(long *)img_labels.img_._72_8_;
            *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + uVar16 * 4) = uVar10;
            local_388 = img_labels.img_._16_8_;
            local_380 = img_labels.accesses_._16_8_;
            local_370 = img_labels.img_._16_8_;
            local_378 = img_labels.accesses_._16_8_;
            local_398 = (long *)img_labels.img_._16_8_;
            local_3c0 = img_labels.accesses_._16_8_;
            local_358 = img_labels.img_._16_8_;
            local_3b8 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
            local_348 = img_labels.accesses_._16_8_;
            local_2e8 = img_labels.img_._16_8_;
            local_2f8 = img_labels.accesses_._16_8_;
            local_390 = img_labels.img_._16_8_;
            local_1e8 = img_labels.img_._16_8_;
            local_3a0 = img_labels.accesses_._16_8_;
            local_300 = img_labels.accesses_._16_8_;
            local_340 = local_328;
            local_2f0 = local_328;
            local_1f8 = local_2e0;
            local_1f0 = local_2e0;
            goto LAB_00155baa;
          }
          local_328 = *(ulong *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_328 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + img_labels.img_._16_8_ + uVar16 * 4);
          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          goto LAB_001571bc;
        }
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f0 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + img_labels.img_._16_8_ + uVar29 * 4);
        do {
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          local_2d8 = img_labels.img_._16_8_;
LAB_0015b6b3:
          *(uint *)(local_1f0 * uVar22 + local_2d8 + uVar29 * 4) = uVar10;
          uVar29 = uVar22 | 1;
          lVar35 = uVar22 - 1;
          lVar41 = uVar22 - 2;
          iVar19 = (int)uVar21;
          lVar39 = (long)iVar19;
          local_360 = lVar39 << 0x20;
          local_3c8 = (long *)img.img_._16_8_;
          lVar27 = img.img_._16_8_ + lVar39;
          lVar32 = img.accesses_._16_8_ + lVar39 * 4;
          lVar42 = img_labels.img_._16_8_ + lVar39 * 4 + 8;
          lVar40 = img_labels.accesses_._16_8_ + lVar39 * 4 + 8;
          lVar25 = 0;
LAB_0015b759:
          uVar16 = lVar39 + lVar25 + 2;
          lVar37 = (long)local_360 >> 0x1e;
          if (lVar15 <= (long)uVar16) {
            uVar21 = (ulong)(iVar19 + 2) + lVar25;
            uVar23 = (long)(local_360 + 0x200000000) >> 0x20;
            lVar32 = (long)(local_360 + 0x200000000) >> 0x1e;
            piVar3 = (int *)(lVar32 + *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_)
            ;
            *piVar3 = *piVar3 + 1;
            uVar10 = (uint)uVar21;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
            if (local_2d0 < (int)uVar10) {
              lVar18 = *(long *)img.img_._72_8_;
              lVar27 = lVar18 * uVar22 + img.img_._16_8_;
              if (*(char *)(uVar23 + lVar27) != '\0') {
                piVar3 = (int *)(((long)(local_360 + 0x100000000) >> 0x1e) +
                                img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22);
                *piVar3 = *piVar3 + 1;
                lVar32 = (long)(local_360 + 0x100000000) >> 0x20;
                if ((*(char *)(lVar27 + lVar32) == '\0') &&
                   (piVar3 = (int *)(uVar29 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                    lVar32 * 4), *piVar3 = *piVar3 + 1,
                   *(char *)(lVar32 + lVar18 * uVar29 + img.img_._16_8_) == '\0')) {
                  lVar18 = lVar18 * lVar35;
                  goto LAB_0015c8b1;
                }
                lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                ;
                *(int *)(lVar37 + lVar18) = *(int *)(lVar37 + lVar18) + 1;
                lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                uVar12 = *(undefined4 *)(lVar37 + lVar32);
LAB_0015b9ca:
                piVar3 = (int *)(lVar18 + uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                goto LAB_0015b9cd;
              }
              piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar29 +
                              uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = lVar18 * uVar29;
              if (*(char *)(uVar23 + img.img_._16_8_ + lVar27) != '\0') goto LAB_0015c360;
LAB_0015c218:
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                               img_labels.accesses_._16_8_ + uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)
               (*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = 0;
              local_380 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
            }
            else {
              lVar18 = *(long *)img.img_._72_8_;
              lVar40 = lVar18 * uVar22 + img.img_._16_8_;
              if (*(char *)(uVar23 + lVar40) == '\0') {
                piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar29 +
                                uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                lVar27 = lVar18 * uVar29;
                if (*(char *)(uVar23 + img.img_._16_8_ + lVar27) == '\0') {
                  uVar23 = uVar21 & 0xffffffff;
                  goto LAB_00153717;
                }
                piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                                *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_);
                *piVar3 = *piVar3 + 1;
                lVar25 = (long)(local_360 + 0x300000000) >> 0x20;
                if (*(char *)(lVar40 + lVar25) == '\0') {
LAB_0015c360:
                  piVar3 = (int *)(((long)(local_360 + 0x100000000) >> 0x1e) +
                                  uVar29 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
                  *piVar3 = *piVar3 + 1;
                  lVar35 = (long)(local_360 + 0x100000000) >> 0x20;
                  if ((*(char *)(lVar35 + lVar27 + img.img_._16_8_) == '\0') &&
                     (piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_
                                      + lVar35 * 4), *piVar3 = *piVar3 + 1,
                     *(char *)(lVar35 + img.img_._16_8_ + lVar18 * uVar22) == '\0')) {
                    uVar10 = RemSP::MemNewLabel();
                    piVar3 = (int *)(lVar32 + *(long *)img_labels.accesses_._72_8_ * uVar22 +
                                              img_labels.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    *(uint *)(lVar32 + *(long *)img_labels.img_._72_8_ * uVar22 +
                                       img_labels.img_._16_8_) = uVar10;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                  }
                  else {
                    lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar37 + lVar18);
                    *piVar3 = *piVar3 + 1;
                    lVar27 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar37 + lVar27);
                    piVar3 = (int *)(lVar32 + lVar18);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar32 + lVar27) = uVar12;
                  }
                }
                else {
                  piVar3 = (int *)(((long)(local_360 + 0x100000000) >> 0x1e) +
                                  *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = (long)(local_360 + 0x100000000) >> 0x20;
                  if (*(char *)(lVar40 + lVar32) != '\0') goto LAB_001597b6;
                  piVar3 = (int *)(uVar29 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                  lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(img.img_._16_8_ + lVar27 + lVar32) == '\0') {
                    uVar21 = uVar21 & 0xffffffff;
                    goto LAB_0015374c;
                  }
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_ +
                                  lVar25 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = lVar18 * lVar35;
                  if (*(char *)(lVar25 + img.img_._16_8_ + lVar32) != '\0') goto LAB_00159fbd;
                  piVar3 = (int *)(lVar35 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                  uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.accesses_._72_8_;
                  if (*(char *)(img.img_._16_8_ + lVar32 + uVar23) == '\0') {
                    lVar18 = lVar18 * uVar22 + img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar37 + lVar18);
                    *piVar3 = *piVar3 + 1;
                    lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar37 + lVar32);
                    piVar3 = (int *)(lVar18 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                  }
                  else {
                    piVar3 = (int *)(lVar18 * lVar41 + img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar32 = *(long *)img_labels.img_._72_8_;
                    uVar12 = *(undefined4 *)(lVar41 * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
                    piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar32 = lVar32 * uVar22 + img_labels.img_._16_8_;
                  }
                  *(undefined4 *)(lVar32 + uVar23 * 4) = uVar12;
                }
              }
              else {
                piVar3 = (int *)(((long)(local_360 + 0x100000000) >> 0x1e) +
                                img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22);
                *piVar3 = *piVar3 + 1;
                lVar32 = (long)(local_360 + 0x100000000) >> 0x20;
                if (*(char *)(lVar40 + lVar32) != '\0') goto LAB_001597b6;
                piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar29 + img.accesses_._16_8_ +
                                lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                if (*(char *)(lVar32 + uVar29 * lVar18 + img.img_._16_8_) != '\0')
                goto LAB_001597b6;
                piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                                *(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_);
                *piVar3 = *piVar3 + 1;
                lVar18 = lVar18 * lVar35;
                if (*(char *)(((long)(local_360 + 0x300000000) >> 0x20) + img.img_._16_8_ + lVar18)
                    != '\0') {
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_ +
                                  uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img.img_._72_8_;
                  if (*(char *)(uVar23 + lVar35 * lVar18 + img.img_._16_8_) == '\0')
                  goto LAB_0015665f;
                  goto LAB_0015c85b;
                }
LAB_0015c8b1:
                piVar3 = (int *)(lVar35 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                lVar32 = *(long *)img_labels.accesses_._72_8_;
                lVar27 = lVar32 * lVar41 + img_labels.accesses_._16_8_;
                if (*(char *)(uVar23 + lVar18 + img.img_._16_8_) == '\0') {
                  piVar3 = (int *)(lVar27 + lVar37);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  uVar12 = *(undefined4 *)(lVar37 + lVar41 * lVar18 + img_labels.img_._16_8_);
                }
                else {
                  piVar3 = (int *)(lVar27 + uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  uVar12 = *(undefined4 *)(lVar41 * lVar18 + img_labels.img_._16_8_ + uVar23 * 4);
                }
                piVar3 = (int *)(lVar32 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar18 * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = uVar12;
              }
            }
            goto LAB_0015b9d6;
          }
          local_338 = *(long *)img.accesses_._72_8_;
          lVar30 = uVar22 * local_338 + lVar32;
          piVar3 = (int *)(lVar30 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          lVar38 = lVar27 + lVar18 * uVar22;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1e8 = img_labels.img_._16_8_;
          local_300 = img_labels.accesses_._16_8_;
          local_390 = img_labels.img_._16_8_;
          if (*(char *)(lVar25 + 2 + lVar38) == '\0') {
            uVar21 = (ulong)(iVar19 + 2) + lVar25;
            local_338 = *(long *)img.accesses_._72_8_;
            piVar3 = (int *)(local_338 * local_318 + img.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = img.accesses_._16_8_;
            if (*(char *)(lVar25 + 2 + local_318 * lVar18 + lVar27) == '\0') goto LAB_00153acd;
            lVar42 = lVar18 * uVar22 + img.img_._16_8_;
            lVar41 = lVar18 * uVar29 + img.img_._16_8_;
            lVar38 = (long)(local_360 + 0x300000000) >> 0x20;
            piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_);
            *piVar3 = *piVar3 + 1;
            lVar40 = (long)(local_360 + 0x100000000) >> 0x20;
            if (*(char *)(lVar42 + lVar38) == '\0') {
              piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar29 +
                              lVar40 * 4);
              *piVar3 = *piVar3 + 1;
              if ((*(char *)(lVar41 + lVar40) == '\0') &&
                 (piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ +
                                  lVar40 * 4), *piVar3 = *piVar3 + 1,
                 *(char *)(lVar42 + lVar40) == '\0')) {
                uVar10 = RemSP::MemNewLabel();
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                                lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *(long *)img_labels.img_._72_8_;
                *(uint *)(local_1f8 * uVar22 + img_labels.img_._16_8_ + lVar39 * 4 + 8 + lVar25 * 4)
                     = uVar10;
                local_300 = img_labels.accesses_._16_8_;
                local_1f0 = local_1f8;
                local_320 = (long *)img_labels.img_._72_8_;
                local_1e8 = img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_340 = local_328;
                local_2f8 = img_labels.accesses_._16_8_;
                local_2f0 = local_328;
                local_2e8 = img_labels.img_._16_8_;
                local_2e0 = local_1f8;
                local_2d8 = img_labels.img_._16_8_;
                goto LAB_001561a1;
              }
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
              piVar3 = (int *)(lVar37 + lVar18);
              *piVar3 = *piVar3 + 1;
              local_1f8 = *(long *)img_labels.img_._72_8_;
              lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
              uVar12 = *(undefined4 *)(lVar37 + lVar32);
              piVar3 = (int *)(lVar18 + lVar39 * 4 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar32 + lVar39 * 4 + 8 + lVar25 * 4) = uVar12;
              local_3a0 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_2e8 = img_labels.img_._16_8_;
              local_2f8 = img_labels.accesses_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_1f0 = local_1f8;
              local_340 = local_328;
              local_2f0 = local_328;
              local_2e0 = local_1f8;
              goto LAB_001561a1;
            }
            piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22 +
                            lVar40 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar42 + lVar40) != '\0') goto LAB_0015baf7;
            local_338 = *(long *)img.accesses_._72_8_;
            piVar3 = (int *)(uVar29 * local_338 + img.accesses_._16_8_ + lVar40 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar41 + lVar40) == '\0') goto LAB_00153af5;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_ +
                            lVar38 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = lVar18 * lVar35;
            if (*(char *)(lVar38 + img.img_._16_8_ + lVar32) != '\0') goto LAB_0015bb2b;
            piVar3 = (int *)(((long)(local_360 + 0x400000000) >> 0x1e) +
                            lVar35 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(img.img_._16_8_ + lVar32 + ((long)(local_360 + 0x400000000) >> 0x20)) !=
                '\0') goto LAB_00159ad9;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (long)local_350 + img.accesses_._16_8_
                             + lVar39 * 4 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_328 = *(ulong *)img_labels.accesses_._72_8_;
            local_3a0 = img_labels.accesses_._16_8_;
            if (*(char *)(lVar25 + 2 + lVar27 + lVar18 * (long)local_350) == '\0') {
              lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
              piVar3 = (int *)(lVar37 + lVar18);
              *piVar3 = *piVar3 + 1;
              local_2e0 = *(long *)img_labels.img_._72_8_;
              lVar32 = local_2e0 * uVar22 + img_labels.img_._16_8_;
              uVar12 = *(undefined4 *)(lVar37 + lVar32);
              piVar3 = (int *)(lVar18 + lVar39 * 4 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar32 + lVar39 * 4 + 8 + lVar25 * 4) = uVar12;
              local_380 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_2e8 = img_labels.img_._16_8_;
              local_2f8 = img_labels.accesses_._16_8_;
              local_2f0 = local_328;
              local_1f8 = local_2e0;
              goto LAB_00157c21;
            }
            piVar3 = (int *)(local_328 * local_308 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_1f0 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(local_1f0 * local_308 + img_labels.img_._16_8_ + lVar39 * 4 + 8 +
                              lVar25 * 4);
            piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
LAB_0015c1ec:
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_3c0 = img_labels.accesses_._16_8_;
            local_398 = (long *)img_labels.img_._16_8_;
            local_3b8 = local_3c0;
            local_3a0 = local_3c0;
            local_390 = (long)local_398;
            local_388 = (long)local_398;
            local_380 = local_3c0;
            local_378 = local_3c0;
            local_370 = (long)local_398;
            local_358 = (long)local_398;
            local_348 = local_3c0;
            local_2d8 = (long)local_398;
LAB_00153cbb:
            *(uint *)(local_1f0 * uVar22 + local_1e8 + uVar16 * 4) = uVar10;
            lVar32 = (long)(int)uVar21;
            local_360 = lVar32 + 2;
            uVar10 = (uint)local_360;
            if (local_2d0 <= (int)uVar10) {
              if (local_2d0 < (int)uVar10) {
LAB_00157d5e:
                uVar10 = (uint)local_360;
LAB_0015968d:
                local_338 = *(long *)img.accesses_._72_8_;
                uVar21 = (ulong)(int)uVar10;
                piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + uVar21 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                if (*(char *)(uVar21 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
                  iVar19 = uVar10 - 2;
LAB_00159720:
                  piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  if (*(char *)(uVar21 + lVar18 * (uVar22 | 1) + img.img_._16_8_) == '\0') {
                    piVar3 = (int *)(lVar32 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)
                     (*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + uVar21 * 4
                     ) = 0;
                  }
                  else {
                    piVar3 = (int *)(lVar32 + (long)iVar19 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar18 + (long)iVar19 * 4);
                    piVar3 = (int *)(lVar32 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar18 + uVar21 * 4) = uVar12;
                  }
                }
                else {
                  lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_;
                  piVar3 = (int *)(lVar18 + -8 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                  uVar12 = *(undefined4 *)(lVar32 + -8 + uVar21 * 4);
                  piVar3 = (int *)(lVar18 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar32 + uVar21 * 4) = uVar12;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                }
                goto LAB_0015b9d6;
              }
              local_338 = *(long *)img.accesses_._72_8_;
              lVar27 = local_338 * uVar22 + img.accesses_._16_8_;
              piVar3 = (int *)(lVar27 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar18 = *(long *)img.img_._72_8_;
              lVar35 = lVar18 * uVar22 + img.img_._16_8_;
              if (*(char *)(lVar32 + 2 + lVar35) == '\0') {
                piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar32 + 2 + (uVar22 | 1) * lVar18 + img.img_._16_8_) != '\0') {
                  piVar3 = (int *)(lVar27 + 0xc + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar35 + 3 + lVar32) != '\0') {
                    lVar27 = lVar32 + 3;
                    goto LAB_00153ddd;
                  }
                  goto LAB_00154879;
                }
LAB_00159435:
                lVar25 = (long)(int)uVar10;
                piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ + 4 +
                                lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                local_3c8 = (long *)img.img_._16_8_;
                if (*(char *)(lVar25 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0')
                goto LAB_00159510;
                piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_
                                 + 4 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar25 + 1 + img.img_._16_8_ + lVar18 * (uVar22 - 1)) != '\0') {
                  lVar18 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + lVar25 * 4)
                  ;
                  *piVar3 = *piVar3 + 1;
                  lVar32 = *(long *)img_labels.img_._72_8_;
                  uVar12 = *(undefined4 *)
                            ((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + lVar25 * 4);
                  piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar25 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar32 * uVar22 + img_labels.img_._16_8_ + lVar25 * 4) = uVar12;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  goto LAB_0015b9d6;
                }
                goto LAB_00153690;
              }
              lVar27 = (long)((int)uVar21 + 3);
LAB_00153ddd:
              piVar3 = (int *)(local_338 * (uVar22 - 1) + img.accesses_._16_8_ + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + (uVar22 - 1) * lVar18 + img.img_._16_8_) != '\0') {
                lVar27 = uVar22 - 2;
                piVar3 = (int *)(local_338 * lVar27 + img.accesses_._16_8_ + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar32 + 2 + lVar18 * lVar27 + img.img_._16_8_) == '\0') {
                  lVar18 = *local_3b0;
                  piVar3 = (int *)(lVar18 * lVar27 + local_380 + 8 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar35 = *local_320;
                  uVar10 = *(uint *)(lVar27 * lVar35 + local_388 + 8 + lVar32 * 4);
                  piVar3 = (int *)(lVar18 * uVar22 + local_380 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar35 * uVar22 + local_388 + lVar32 * 4
                                                           ));
                  piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                   img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + 8 +
                           lVar32 * 4) = uVar10;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  goto LAB_0015b9d6;
                }
LAB_0015a283:
                lVar32 = uVar22 - 2;
                lVar27 = (long)(int)uVar10;
                piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + -4 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                cVar28 = *(char *)(lVar27 + -1 + lVar18 * lVar32 + img.img_._16_8_);
                lVar18 = *(long *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar35 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(uint *)(lVar32 * lVar35 + img_labels.img_._16_8_ + lVar27 * 4);
                lVar18 = lVar18 * uVar22;
                if (cVar28 != '\0') {
                  piVar3 = (int *)(lVar18 + img_labels.accesses_._16_8_ + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(uint *)(lVar35 * uVar22 + img_labels.img_._16_8_ + lVar27 * 4) = uVar10;
                  local_380 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  goto LAB_0015b9d6;
                }
                piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + -8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                local_1e8 = img_labels.img_._16_8_ + lVar35 * uVar22;
LAB_0015a311:
                uVar14 = *(uint *)(local_1e8 + -8 + lVar27 * 4);
LAB_0015a7d2:
                uVar10 = RemSP::MemMerge(uVar10,uVar14);
                goto LAB_0015a7d7;
              }
LAB_00154879:
              lVar18 = *local_3b0 * uVar22 + local_380;
              piVar3 = (int *)(lVar18 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = *local_320 * uVar22 + local_388;
              uVar12 = *(undefined4 *)(lVar27 + lVar32 * 4);
              piVar3 = (int *)(lVar18 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar27 + 8 + lVar32 * 4) = uVar12;
              local_380 = local_380;
              local_2d8 = local_388;
              goto LAB_0015b9d6;
            }
            local_338 = *(long *)img.accesses_._72_8_;
            lVar35 = local_338 * uVar22 + img.accesses_._16_8_;
            piVar3 = (int *)(lVar35 + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = *(long *)img.img_._72_8_;
            lVar27 = lVar18 * uVar22 + img.img_._16_8_;
            if (*(char *)(lVar32 + 2 + lVar27) == '\0') {
              piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar21 = local_360;
              if (*(char *)(lVar32 + 2 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
              goto LAB_001582be;
              piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + 3 + lVar32) == '\0') {
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
                piVar3 = (int *)(lVar18 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *(long *)img_labels.img_._72_8_;
                lVar27 = local_1f8 * uVar22 + img_labels.img_._16_8_;
                uVar12 = *(undefined4 *)(lVar27 + lVar32 * 4);
                piVar3 = (int *)(lVar18 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar27 + 8 + lVar32 * 4) = uVar12;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                uVar21 = local_360 & 0xffffffff;
                local_2d8 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_300 = img_labels.accesses_._16_8_;
                local_1f0 = local_1f8;
                local_320 = (long *)img_labels.img_._72_8_;
                local_1e8 = img_labels.img_._16_8_;
                local_340 = local_328;
                local_2f0 = local_328;
                local_2e0 = local_1f8;
                goto LAB_001561a1;
              }
              lVar40 = local_338 * (uVar22 - 1);
              piVar3 = (int *)(lVar40 + img.accesses_._16_8_ + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar41 = (uVar22 - 1) * lVar18;
              if (*(char *)(lVar32 + 3 + img.img_._16_8_ + lVar41) != '\0') {
                lVar27 = uVar22 - 2;
                piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar27 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar32 + 2 + img.img_._16_8_ + lVar18 * lVar27) == '\0') {
                  lVar18 = *local_3b0;
                  piVar3 = (int *)(lVar18 * lVar27 + local_3a0 + 8 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar35 = *local_320;
                  uVar10 = *(uint *)(lVar27 * lVar35 + local_390 + 8 + lVar32 * 4);
                  piVar3 = (int *)(lVar18 * uVar22 + local_3a0 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar35 * uVar22 + local_390 + lVar32 * 4
                                                           ));
                  piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                   img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  local_368 = local_360 & 0xffffffff;
                  local_358 = img_labels.img_._16_8_;
                  goto LAB_00159593;
                }
                uVar21 = local_360 & 0xffffffff;
LAB_00158d6a:
                uVar23 = (ulong)(int)uVar21;
                piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 2) + img.accesses_._16_8_
                                 + -4 + uVar23 * 4);
                *piVar3 = *piVar3 + 1;
                cVar28 = *(char *)((uVar23 - 1) +
                                  *(long *)img.img_._72_8_ * (uVar22 - 2) + img.img_._16_8_);
                do {
                  lVar32 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(lVar32 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4)
                  ;
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(uint *)((uVar22 - 2) * lVar18 + img_labels.img_._16_8_ + uVar23 * 4);
                  lVar32 = img_labels.accesses_._16_8_ + lVar32 * uVar22;
                  local_368 = uVar21;
                  if (cVar28 == '\0') {
                    piVar3 = (int *)(lVar32 + -8 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = RemSP::MemMerge(uVar10,*(uint *)(img_labels.img_._16_8_ +
                                                              lVar18 * uVar22 + -8 + uVar23 * 4));
                    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                     img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img_labels.img_._72_8_;
                    uVar21 = uVar23;
                    local_358 = img_labels.img_._16_8_;
                  }
                  else {
                    piVar3 = (int *)(lVar32 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar21 = uVar23;
                    local_358 = img_labels.img_._16_8_;
                  }
LAB_00159593:
                  *(uint *)(lVar18 * uVar22 + local_358 + uVar21 * 4) = uVar10;
                  lVar27 = (long)(int)local_368;
                  uVar10 = (int)local_368 + 2;
                  uVar21 = (ulong)uVar10;
                  local_3c8 = (long *)img.img_._16_8_;
                  if (local_2d0 <= (int)uVar10) {
                    if (local_2d0 < (int)uVar10) goto LAB_0015968d;
                    piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22 +
                                     8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img.img_._72_8_;
                    if (*(char *)(lVar27 + 2 + lVar18 * uVar22 + img.img_._16_8_) != '\0')
                    goto LAB_001597b6;
                    piVar3 = (int *)((uVar22 | 1) * *(long *)img.accesses_._72_8_ +
                                     img.accesses_._16_8_ + 8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar27 + 2 + lVar18 * (uVar22 | 1) + img.img_._16_8_) == '\0') {
                      uVar23 = (ulong)uVar10;
                      goto LAB_00153717;
                    }
                    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ +
                                     0xc + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img.img_._72_8_;
                    if (*(char *)(lVar27 + 3 + lVar18 * uVar22 + img.img_._16_8_) != '\0')
                    goto LAB_001597b6;
                    lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar18 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                    piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
                    local_380 = img_labels.accesses_._16_8_;
                    local_2d8 = img_labels.img_._16_8_;
                    goto LAB_0015b9d6;
                  }
                  local_338 = *(long *)img.accesses_._72_8_;
                  piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img.img_._72_8_;
                  lVar35 = lVar18 * uVar22 + img.img_._16_8_;
                  if (*(char *)(lVar27 + 2 + lVar35) != '\0') goto LAB_001599ef;
                  local_338 = *(long *)img.accesses_._72_8_;
                  piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar27 * 4)
                  ;
                  *piVar3 = *piVar3 + 1;
                  lVar32 = img.accesses_._16_8_;
                  if (*(char *)(lVar27 + 2 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                  goto LAB_00153acd;
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ +
                                   0xc + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar35 + 3 + lVar27) == '\0') {
                    local_3c0 = img_labels.accesses_._16_8_;
                    local_3b0 = (long *)img_labels.accesses_._72_8_;
                    local_328 = *(ulong *)img_labels.accesses_._72_8_;
                    lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar18 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_398 = (long *)img_labels.img_._16_8_;
                    local_1f8 = *(long *)img_labels.img_._72_8_;
                    lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                    piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
                    local_300 = img_labels.accesses_._16_8_;
                    local_1f0 = local_1f8;
                    local_320 = (long *)img_labels.img_._72_8_;
                    local_1e8 = img_labels.img_._16_8_;
                    local_3b8 = local_3c0;
                    local_3a0 = local_3c0;
                    local_390 = (long)local_398;
                    local_388 = (long)local_398;
                    local_380 = local_3c0;
                    local_378 = local_3c0;
                    local_370 = (long)local_398;
                    local_358 = (long)local_398;
                    local_348 = local_3c0;
                    local_340 = local_328;
                    local_2f8 = local_3c0;
                    local_2f0 = local_328;
                    local_2e8 = (long)local_398;
                    local_2e0 = local_1f8;
                    local_2d8 = (long)local_398;
LAB_001561a1:
                    lVar27 = (long)(int)uVar21;
                    uVar21 = lVar27 + 2;
                    uVar10 = (uint)uVar21;
                    lVar32 = img.accesses_._16_8_;
                    if ((int)uVar10 < local_2d0) {
                      local_338 = *(long *)img.accesses_._72_8_;
                      piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_3c8 = (long *)img.img_._16_8_;
                      lVar18 = *(long *)img.img_._72_8_;
                      if (*(char *)(lVar27 + 2 + lVar18 * uVar22 + img.img_._16_8_) == '\0')
                      goto LAB_00155ec3;
                      piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                      lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                      goto LAB_001556ba;
LAB_00156269:
                      iVar19 = (int)uVar21;
                      uVar29 = (ulong)iVar19;
                      lVar41 = local_338 * (uVar22 - 1);
                      lVar32 = lVar41 + img.accesses_._16_8_;
                      piVar3 = (int *)(lVar32 + 4 + uVar29 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar35 = (uVar22 - 1) * lVar18;
                      lVar27 = img.img_._16_8_ + lVar35;
                      if (*(char *)(uVar29 + 1 + lVar27) == '\0') {
                        piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 + uVar29 * 4)
                        ;
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)(uVar29 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
                          uVar16 = (ulong)iVar19;
                          piVar3 = (int *)(lVar32 + -4 + uVar16 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar27 + -1 + uVar16) == '\0') goto LAB_00157113;
                          piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + uVar16 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + -8 + uVar16 * 4)
                          ;
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar16 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 +
                                                                    -8 + uVar16 * 4));
                          local_3b0 = (long *)img_labels.accesses_._72_8_;
                          local_328 = *(ulong *)img_labels.accesses_._72_8_;
                          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ +
                                          uVar16 * 4);
                          *piVar3 = *piVar3 + 1;
                          local_1f8 = *(long *)img_labels.img_._72_8_;
                          *(uint *)(local_1f8 * uVar22 + img_labels.img_._16_8_ + uVar16 * 4) =
                               uVar10;
                          local_388 = img_labels.img_._16_8_;
                          local_380 = img_labels.accesses_._16_8_;
                          local_370 = img_labels.img_._16_8_;
                          local_378 = img_labels.accesses_._16_8_;
                          local_3c0 = img_labels.accesses_._16_8_;
                          local_358 = img_labels.img_._16_8_;
                          local_2d8 = img_labels.img_._16_8_;
                          local_2e8 = img_labels.img_._16_8_;
                          local_3a0 = img_labels.accesses_._16_8_;
                          local_2f8 = img_labels.accesses_._16_8_;
                          local_398 = (long *)img_labels.img_._16_8_;
                          local_348 = img_labels.accesses_._16_8_;
                          local_390 = img_labels.img_._16_8_;
                          local_320 = (long *)img_labels.img_._72_8_;
                          local_3b8 = img_labels.accesses_._16_8_;
                          local_2f0 = local_328;
                          local_2e0 = local_1f8;
                          goto LAB_00159d37;
                        }
                        uVar23 = (ulong)iVar19;
                        piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)(lVar27 + 2 + uVar23) == '\0') {
                          lVar18 = (long)iVar19;
                          piVar3 = (int *)(lVar32 + -4 + lVar18 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar27 + -1 + lVar18) == '\0') goto LAB_00156ad5;
                          piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + lVar18 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + -8 + lVar18 * 4)
                          ;
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar18 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 +
                                                                    -8 + lVar18 * 4));
                          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                           img_labels.accesses_._16_8_ + lVar18 * 4);
                          *piVar3 = *piVar3 + 1;
                          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                    img_labels.img_._16_8_ + lVar18 * 4) = uVar10;
                          goto LAB_0015847a;
                        }
                        piVar3 = (int *)(lVar32 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)(lVar27 + uVar23) != '\0') {
                          lVar32 = uVar22 - 2;
                          piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 + 4 +
                                          uVar29 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar27 = local_340 * lVar32 + local_300;
                          lVar35 = lVar32 * local_1f0 + local_1e8;
                          if (*(char *)(uVar29 + 1 + img.img_._16_8_ + lVar18 * lVar32) == '\0') {
                            piVar3 = (int *)(lVar27 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = *(uint *)(lVar35 + uVar23 * 4);
                            piVar3 = (int *)(lVar27 + 8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar35 + 8 + uVar23 * 4));
                            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                             img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                               img_labels.img_._16_8_ + -8 + uVar23 * 4);
                          }
                          else {
                            piVar3 = (int *)(lVar27 + 8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = *(uint *)(lVar35 + 8 + uVar23 * 4);
                            piVar3 = (int *)(local_300 + local_340 * uVar22 + -8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(local_1e8 + local_1f0 * uVar22 + -8 + uVar23 * 4);
                          }
LAB_00153f49:
                          uVar10 = RemSP::MemMerge(uVar10,uVar14);
                          local_328 = *(ulong *)img_labels.accesses_._72_8_;
                          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ +
                                          uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          local_1f8 = *(long *)img_labels.img_._72_8_;
                          lVar32 = img_labels.accesses_._16_8_;
                          local_1f0 = local_1f8;
                          local_320 = (long *)img_labels.img_._72_8_;
                          local_1e8 = img_labels.img_._16_8_;
                          local_2d8 = img_labels.img_._16_8_;
                          local_3c0 = img_labels.accesses_._16_8_;
                          local_3b8 = img_labels.accesses_._16_8_;
                          local_3b0 = (long *)img_labels.accesses_._72_8_;
                          local_3a0 = img_labels.accesses_._16_8_;
                          local_398 = (long *)img_labels.img_._16_8_;
                          local_390 = img_labels.img_._16_8_;
                          local_388 = img_labels.img_._16_8_;
                          local_380 = img_labels.accesses_._16_8_;
                          local_378 = img_labels.accesses_._16_8_;
                          local_370 = img_labels.img_._16_8_;
                          local_358 = img_labels.img_._16_8_;
LAB_00153fc1:
                          *(uint *)(local_1f0 * uVar22 + local_1e8 + uVar23 * 4) = uVar10;
                          lVar35 = uVar22 - 1;
                          lVar41 = uVar22 - 2;
                          iVar19 = (int)uVar21;
                          lVar40 = (long)iVar19;
                          lVar25 = lVar40 << 0x20;
                          lVar27 = lVar40 * 4;
                          lVar42 = 0;
                          local_1f0 = local_1f8;
LAB_0015402d:
                          uVar29 = lVar40 + lVar42 + 2;
                          lVar39 = lVar25 >> 0x1e;
                          iVar13 = (int)lVar42;
                          local_3c8 = (long *)img.img_._16_8_;
                          if (lVar15 <= (long)uVar29) {
                            uVar10 = iVar19 + 2 + iVar13;
                            if (local_2d0 < (int)uVar10) goto LAB_0015968d;
                            lVar27 = *(long *)img.accesses_._72_8_;
                            lVar42 = lVar27 * uVar22 + img.accesses_._16_8_;
                            piVar3 = (int *)((lVar25 + 0x200000000 >> 0x1e) + lVar42);
                            *piVar3 = *piVar3 + 1;
                            lVar40 = lVar25 + 0x200000000 >> 0x20;
                            lVar18 = *(long *)img.img_._72_8_;
                            lVar37 = lVar18 * uVar22 + img.img_._16_8_;
                            local_380 = lVar32;
                            if (*(char *)(lVar40 + lVar37) == '\0') {
                              piVar3 = (int *)(lVar27 * (uVar22 | 1) + img.accesses_._16_8_ +
                                              lVar40 * 4);
                              *piVar3 = *piVar3 + 1;
                              cVar28 = *(char *)(lVar40 + (uVar22 | 1) * lVar18 + img.img_._16_8_);
                              piVar3 = (int *)(lVar42 + (lVar25 + 0x300000000 >> 0x1e));
                              *piVar3 = *piVar3 + 1;
                              lVar25 = lVar25 + 0x300000000 >> 0x20;
                              cVar5 = *(char *)(lVar37 + lVar25);
                              if (cVar28 == '\0') {
                                if (cVar5 == '\0') goto LAB_00159513;
                                piVar3 = (int *)(local_328 * lVar41 + lVar32 + lVar40 * 4);
                                *piVar3 = *piVar3 + 1;
                                uVar12 = *(undefined4 *)
                                          (lVar41 * local_1f0 + local_2d8 + lVar40 * 4);
                                piVar3 = (int *)(local_328 * uVar22 + lVar32 + lVar40 * 4);
                                *piVar3 = *piVar3 + 1;
                                *(undefined4 *)(local_1f0 * uVar22 + local_2d8 + lVar40 * 4) =
                                     uVar12;
                                goto LAB_0015b9d6;
                              }
                              if (cVar5 != '\0') goto LAB_00154768;
LAB_00154bf1:
                              lVar32 = local_328 * uVar22 + lVar32;
                              piVar3 = (int *)(lVar39 + lVar32);
                              *piVar3 = *piVar3 + 1;
                              lVar18 = local_1f0 * uVar22 + local_2d8;
                              uVar12 = *(undefined4 *)(lVar39 + lVar18);
                              piVar3 = (int *)(lVar32 + lVar40 * 4);
                              *piVar3 = *piVar3 + 1;
                            }
                            else {
                              lVar25 = lVar25 + 0x300000000 >> 0x20;
LAB_00154768:
                              piVar3 = (int *)(img.accesses_._16_8_ + lVar27 * lVar35 + lVar25 * 4);
                              *piVar3 = *piVar3 + 1;
                              if (*(char *)(lVar25 + img.img_._16_8_ + lVar18 * lVar35) == '\0')
                              goto LAB_00154bf1;
                              piVar3 = (int *)(local_328 * lVar41 + lVar32 + lVar40 * 4);
                              *piVar3 = *piVar3 + 1;
                              uVar12 = *(undefined4 *)(lVar41 * local_1f0 + local_2d8 + lVar40 * 4);
                              piVar3 = (int *)(local_328 * uVar22 + lVar32 + lVar40 * 4);
                              *piVar3 = *piVar3 + 1;
                              lVar18 = local_1f0 * uVar22 + local_2d8;
                            }
                            *(undefined4 *)(lVar18 + lVar40 * 4) = uVar12;
                            goto LAB_0015b9d6;
                          }
                          local_338 = *(long *)img.accesses_._72_8_;
                          lVar37 = local_338 * uVar22;
                          piVar3 = (int *)(lVar37 + img.accesses_._16_8_ + lVar27 + 8 + lVar42 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar18 = *(long *)img.img_._72_8_;
                          lVar38 = lVar18 * uVar22;
                          if (*(char *)(lVar42 + 2 + lVar40 + img.img_._16_8_ + lVar38) == '\0') {
                            lVar32 = lVar27 + img.accesses_._16_8_;
                            piVar3 = (int *)(local_318 * local_338 + lVar32 + 8 + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            lVar30 = img.img_._16_8_ + lVar40;
                            if (*(char *)(lVar42 + 2 + local_318 * lVar18 + lVar30) == '\0') {
                              piVar3 = (int *)(lVar37 + img.accesses_._16_8_ +
                                              (lVar25 + 0x300000000 >> 0x1e));
                              *piVar3 = *piVar3 + 1;
                              uVar21 = (ulong)(iVar19 + 2) + lVar42;
                              lVar32 = lVar25 + 0x300000000 >> 0x20;
                              if (*(char *)(img.img_._16_8_ + lVar38 + lVar32) == '\0') {
                                uVar23 = uVar21 & 0xffffffff;
                                lVar32 = img.accesses_._16_8_;
                                goto LAB_0015509b;
                              }
                              uVar16 = lVar40 + lVar42 + 2;
                              lVar41 = img.accesses_._16_8_ + local_338 * lVar35;
                              piVar3 = (int *)(lVar41 + lVar32 * 4);
                              *piVar3 = *piVar3 + 1;
                              lVar27 = lVar35 * lVar18 + img.img_._16_8_;
                              if (*(char *)(lVar32 + lVar27) != '\0') {
                                lVar32 = *local_3b0;
                                piVar3 = (int *)(lVar32 * local_308 + local_378 + lVar40 * 4 + 8 +
                                                lVar42 * 4);
                                *piVar3 = *piVar3 + 1;
                                lVar18 = *local_320;
                                uVar10 = *(uint *)(lVar18 * local_308 + local_370 + lVar40 * 4 + 8 +
                                                  lVar42 * 4);
                                piVar3 = (int *)(lVar32 * uVar22 + local_378 + lVar40 * 4 + 8 +
                                                lVar42 * 4);
                                *piVar3 = *piVar3 + 1;
                                local_368 = uVar21;
                                uVar21 = uVar16;
                                local_358 = local_370;
                                goto LAB_00159593;
                              }
                              piVar3 = (int *)(lVar41 + (lVar25 + 0x400000000 >> 0x1e));
                              *piVar3 = *piVar3 + 1;
                              if (*(char *)(lVar27 + (lVar25 + 0x400000000 >> 0x20)) != '\0')
                              goto LAB_00153b9f;
                              piVar3 = (int *)(local_378 + *local_3b0 * local_308 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              uVar10 = *(uint *)(local_370 + *local_320 * local_308 + lVar40 * 4 + 8
                                                + lVar42 * 4);
                              piVar3 = (int *)(*local_3b0 * uVar22 + local_380 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              local_1f0 = *local_320;
                              local_370 = local_388;
                              local_378 = local_380;
                              local_398 = (long *)local_388;
                              local_3c0 = local_380;
                              local_358 = local_388;
                              local_3b8 = local_380;
                              local_2d8 = local_388;
                              local_348 = local_380;
                              local_1e8 = local_388;
                              goto LAB_00153cbb;
                            }
                            piVar3 = (int *)(lVar37 + lVar32 + 0xc + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar42 + 3 + lVar38 + lVar30) == '\0') {
                              iVar19 = iVar19 + iVar13;
                              piVar3 = (int *)(lVar39 + local_3c0 + *local_3b0 * uVar22);
                              *piVar3 = *piVar3 + 1;
                              uVar12 = *(undefined4 *)
                                        (lVar39 + (long)local_398 + *local_320 * uVar22);
                              local_328 = *local_3b0;
                              piVar3 = (int *)(local_328 * uVar22 + local_378 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              local_1f8 = *local_320;
                              *(undefined4 *)
                               (local_1f8 * uVar22 + local_370 + lVar40 * 4 + 8 + lVar42 * 4) =
                                   uVar12;
LAB_00158ca2:
                              uVar21 = (ulong)(iVar19 + 2);
                              local_300 = local_378;
                              local_1f0 = local_1f8;
                              local_1e8 = local_370;
                              local_3c0 = local_378;
                              local_3b8 = local_378;
                              local_398 = (long *)local_370;
                              local_358 = local_370;
                              local_348 = local_378;
                              local_340 = local_328;
                              local_2f8 = local_378;
                              local_2f0 = local_328;
                              local_2e8 = local_370;
                              local_2e0 = local_1f8;
                              local_2d8 = local_370;
                              goto LAB_001561a1;
                            }
                            piVar3 = (int *)(lVar32 + (long)local_350 * local_338 + 0xc + lVar42 * 4
                                            );
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar42 + 3 + lVar30 + (long)local_350 * lVar18) != '\0') {
                              lVar32 = *local_3b0;
                              piVar3 = (int *)(lVar32 * local_308 + local_3b8 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              lVar18 = *local_320;
                              uVar10 = *(uint *)(lVar18 * local_308 + local_358 + lVar40 * 4 + 8 +
                                                lVar42 * 4);
                              piVar3 = (int *)(lVar32 * uVar22 + local_3b8 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              local_368 = (ulong)(iVar19 + iVar13 + 2);
                              uVar21 = lVar40 + lVar42 + 2;
                              goto LAB_00159593;
                            }
                          }
                          else {
                            piVar3 = (int *)((long)local_350 * local_338 +
                                             lVar27 + img.accesses_._16_8_ + 0xc + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar42 + 3 +
                                         (long)local_350 * lVar18 + img.img_._16_8_ + lVar40) !=
                                '\0') {
                              piVar3 = (int *)(local_308 * local_328 + lVar32 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              uVar21 = (ulong)(iVar19 + iVar13 + 2);
                              uVar10 = *(uint *)(local_308 * local_1f0 + local_2d8 + lVar40 * 4 + 8
                                                + lVar42 * 4);
                              piVar3 = (int *)(local_328 * uVar22 + lVar32 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              goto LAB_0015b6b3;
                            }
                            piVar3 = (int *)(lVar27 + img.accesses_._16_8_ + lVar37 + 0xc +
                                            lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar42 + 3 + img.img_._16_8_ + lVar40 + lVar38) == '\0') {
                              uVar21 = (ulong)(iVar19 + iVar13 + 2);
                              piVar3 = (int *)(lVar39 + lVar32 + local_328 * uVar22);
                              *piVar3 = *piVar3 + 1;
                              uVar12 = *(undefined4 *)(lVar39 + local_2d8 + local_1f0 * uVar22);
                              local_328 = *local_3b0;
                              piVar3 = (int *)(local_328 * uVar22 + local_3b8 + lVar40 * 4 + 8 +
                                              lVar42 * 4);
                              *piVar3 = *piVar3 + 1;
                              local_1f8 = *local_320;
                              *(undefined4 *)
                               (local_1f8 * uVar22 + local_358 + lVar40 * 4 + 8 + lVar42 * 4) =
                                   uVar12;
                              local_2d8 = local_358;
                              local_2e8 = local_358;
                              local_2f8 = local_3b8;
                              local_348 = local_3b8;
                              local_2f0 = local_328;
                              local_2e0 = local_1f8;
                              goto LAB_00159d37;
                            }
                          }
                          piVar3 = (int *)(local_338 * lVar35 + img.accesses_._16_8_ + lVar27 + 0x10
                                          + lVar42 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar42 + 4 + lVar18 * lVar35 + img.img_._16_8_ + lVar40) ==
                              '\0') goto LAB_001543ed;
                          piVar3 = (int *)(img.accesses_._16_8_ + lVar27 + local_338 * local_308 +
                                           0xc + lVar42 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar42 + 3 + img.img_._16_8_ + lVar40 + lVar18 * local_308)
                              == '\0') {
                            lVar18 = *local_3b0;
                            piVar3 = (int *)(local_308 * lVar18 + local_3c0 + lVar27 + 0x10 +
                                            lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            lVar32 = *local_320;
                            uVar10 = *(uint *)(local_308 * lVar32 + (long)local_398 + lVar27 + 0x10
                                              + lVar42 * 4);
                            piVar3 = (int *)(lVar18 * uVar22 + local_3c0 + lVar27 + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 +
                                                                      (long)local_398 + lVar27 +
                                                                     lVar42 * 4));
                            local_3b0 = (long *)img_labels.accesses_._72_8_;
                            local_328 = *(ulong *)img_labels.accesses_._72_8_;
                            piVar3 = (int *)(uVar22 * local_328 + img_labels.accesses_._16_8_ +
                                             lVar27 + 8 + lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            local_390 = img_labels.img_._16_8_;
                            local_388 = img_labels.img_._16_8_;
                            local_380 = img_labels.accesses_._16_8_;
                            local_370 = img_labels.img_._16_8_;
                            local_378 = img_labels.accesses_._16_8_;
                            local_3a0 = img_labels.accesses_._16_8_;
                            lVar32 = img_labels.accesses_._16_8_;
                            local_320 = (long *)img_labels.img_._72_8_;
                            local_398 = (long *)img_labels.img_._16_8_;
                          }
                          else {
                            piVar3 = (int *)(local_3b8 + lVar27 + *local_3b0 * local_308 + 0x10 +
                                            lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = *(uint *)(local_358 + lVar27 + *local_320 * local_308 + 0x10 +
                                              lVar42 * 4);
                            local_328 = *local_3b0;
                            piVar3 = (int *)(uVar22 * local_328 + local_3c0 + lVar27 + 8 +
                                            lVar42 * 4);
                            *piVar3 = *piVar3 + 1;
                            lVar32 = local_3c0;
                          }
                          local_1f0 = *local_320;
                          *(uint *)(uVar22 * local_1f0 + (long)local_398 + lVar27 + 8 + lVar42 * 4)
                               = uVar10;
                          lVar25 = lVar25 + 0x200000000;
                          lVar42 = lVar42 + 2;
                          local_3c0 = lVar32;
                          local_2d8 = (long)local_398;
                          local_3b8 = lVar32;
                          local_358 = (long)local_398;
                          goto LAB_0015402d;
                        }
                        lVar35 = (long)iVar19;
                        piVar3 = (int *)(lVar32 + -4 + lVar35 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar32 = uVar22 - 2;
                        if (*(char *)(lVar27 + -1 + lVar35) == '\0') {
                          piVar3 = (int *)(local_340 * lVar32 + local_300 + 8 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)(lVar32 * local_1f0 + local_1e8 + 8 + uVar23 * 4);
LAB_001574d2:
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar14 = *(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + lVar35 * 4);
                        }
                        else {
                          lVar27 = img.accesses_._16_8_ + local_338 * lVar32;
                          piVar3 = (int *)(lVar27 + 4 + uVar29 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar18 = img.img_._16_8_ + lVar18 * lVar32;
                          if (*(char *)(uVar29 + 1 + lVar18) == '\0') {
                            local_300 = local_300 + local_340 * lVar32;
                            piVar3 = (int *)(local_300 + -8 + lVar35 * 4);
                            *piVar3 = *piVar3 + 1;
                            local_1e8 = local_1e8 + local_1f0 * lVar32;
                            uVar10 = *(uint *)(local_1e8 + -8 + lVar35 * 4);
                            piVar3 = (int *)(local_300 + 8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(local_1e8 + 8 + uVar23 * 4);
                          }
                          else {
                            piVar3 = (int *)(lVar27 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            if (*(char *)(lVar18 + uVar23) != '\0') {
                              piVar3 = (int *)(local_340 * lVar32 + local_300 + 8 + uVar23 * 4);
                              *piVar3 = *piVar3 + 1;
                              uVar10 = *(uint *)(lVar32 * local_1f0 + local_1e8 + 8 + uVar23 * 4);
                              goto LAB_001574d2;
                            }
                            local_300 = local_300 + local_340 * lVar32;
                            piVar3 = (int *)(local_300 + -8 + lVar35 * 4);
                            *piVar3 = *piVar3 + 1;
                            local_1e8 = local_1e8 + local_1f0 * lVar32;
                            uVar10 = *(uint *)(local_1e8 + -8 + lVar35 * 4);
                            piVar3 = (int *)(local_300 + 8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(local_1e8 + 8 + uVar23 * 4);
                          }
                          uVar10 = RemSP::MemMerge(uVar10,uVar14);
                          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                           img_labels.accesses_._16_8_ + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                             img_labels.img_._16_8_ + -8 + lVar35 * 4);
                        }
                        uVar10 = RemSP::MemMerge(uVar10,uVar14);
                        local_3b0 = (long *)img_labels.accesses_._72_8_;
                        local_328 = *(ulong *)img_labels.accesses_._72_8_;
                        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ +
                                        uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        local_1f8 = *(long *)img_labels.img_._72_8_;
                        local_390 = img_labels.img_._16_8_;
                        local_388 = img_labels.img_._16_8_;
                        local_380 = img_labels.accesses_._16_8_;
                        local_370 = img_labels.img_._16_8_;
                        local_378 = img_labels.accesses_._16_8_;
                        local_398 = (long *)img_labels.img_._16_8_;
                        local_3c0 = img_labels.accesses_._16_8_;
                        local_358 = img_labels.img_._16_8_;
                        local_3b8 = img_labels.accesses_._16_8_;
                        local_3a0 = img_labels.accesses_._16_8_;
                        lVar32 = img_labels.accesses_._16_8_;
                        local_1f0 = local_1f8;
                        local_320 = (long *)img_labels.img_._72_8_;
                        local_1e8 = img_labels.img_._16_8_;
                        local_2d8 = img_labels.img_._16_8_;
                        goto LAB_00153fc1;
                      }
                      piVar3 = (int *)(lVar32 + uVar29 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar27 + uVar29) == '\0') {
                        lVar35 = (long)iVar19;
                        piVar3 = (int *)(lVar32 + -4 + lVar35 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar32 = uVar22 - 2;
                        if ((*(char *)(lVar27 + -1 + lVar35) == '\0') ||
                           (piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 + uVar29 * 4)
                           , *piVar3 = *piVar3 + 1,
                           *(char *)(uVar29 + img.img_._16_8_ + lVar18 * lVar32) != '\0')) {
                          piVar3 = (int *)(local_340 * lVar32 + local_300 + uVar29 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)(lVar32 * local_1f0 + local_1e8 + uVar29 * 4);
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar14 = *(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + lVar35 * 4);
                        }
                        else {
                          local_300 = local_300 + local_340 * lVar32;
                          piVar3 = (int *)(local_300 + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          local_1e8 = local_1e8 + local_1f0 * lVar32;
                          uVar10 = *(uint *)(local_1e8 + -8 + lVar35 * 4);
                          piVar3 = (int *)(local_300 + uVar29 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1e8 + uVar29 * 4));
                          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                           img_labels.accesses_._16_8_ + -8 + lVar35 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                             img_labels.img_._16_8_ + -8 + lVar35 * 4);
                        }
                        uVar10 = RemSP::MemMerge(uVar10,uVar14);
                        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                         img_labels.accesses_._16_8_ + uVar29 * 4);
                        *piVar3 = *piVar3 + 1;
                      }
                      else {
                        piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar29 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar29 * 4);
                        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar29 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 +
                                                                  -8 + uVar29 * 4));
                        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                         img_labels.accesses_._16_8_ + uVar29 * 4);
                        *piVar3 = *piVar3 + 1;
                      }
                      local_1f0 = *(long *)img_labels.img_._72_8_;
                      local_2d8 = img_labels.img_._16_8_;
                      goto LAB_0015b6b3;
                    }
                    local_338 = *(long *)img.accesses_._72_8_;
                    piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img.img_._72_8_;
                    cVar28 = *(char *)(lVar27 + 2 + lVar18 * uVar22 + img.img_._16_8_);
                    local_3a0 = local_300;
                    local_1f8 = local_1f0;
                    if (local_2d0 < (int)uVar10) {
                      uVar23 = uVar21;
                      if (cVar28 == '\0') {
                        uVar21 = uVar21 & 0xffffffff;
LAB_0015a3ef:
                        iVar19 = (int)uVar21;
                        lVar41 = local_338 * (uVar22 | 1);
                        piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar40 = (uVar22 | 1) * lVar18;
                        if (*(char *)(uVar23 + img.img_._16_8_ + lVar40) == '\0') goto LAB_0015c218;
LAB_0015a419:
                        uVar23 = (ulong)iVar19;
                        piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + -4 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)((uVar23 - 1) + lVar40 + img.img_._16_8_) == '\0')
                        goto LAB_0015a72f;
                        lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
                                 img_labels.accesses_._16_8_;
                        piVar3 = (int *)(lVar18 + -8 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                        uVar12 = *(undefined4 *)(lVar32 + -8 + uVar23 * 4);
                        goto LAB_0015b9ca;
                      }
                      piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                      lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_3c8 = (long *)img.img_._16_8_;
                      local_328 = local_340;
                      if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0') {
LAB_00156d83:
                        lVar32 = local_338 * (uVar22 - 1) + lVar32;
                        piVar3 = (int *)(lVar32 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar18 = lVar18 * (uVar22 - 1) + (long)local_3c8;
                        if (*(char *)(uVar23 + lVar18) == '\0') {
                          lVar27 = (long)(int)uVar10;
                          piVar3 = (int *)(lVar32 + -4 + lVar27 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar18 + -1 + lVar27) == '\0') goto LAB_0015a72f;
                          piVar3 = (int *)(local_328 * (uVar22 - 2) + local_3a0 + -8 + lVar27 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar12 = *(undefined4 *)
                                    ((uVar22 - 2) * local_1f8 + local_1e8 + -8 + lVar27 * 4);
                          piVar3 = (int *)(local_328 * uVar22 + local_3a0 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          *(undefined4 *)(local_1f8 * uVar22 + local_1e8 + uVar23 * 4) = uVar12;
                          local_380 = local_3a0;
                          local_2d8 = local_1e8;
                        }
                        else {
LAB_00156dac:
                          piVar3 = (int *)(local_328 * (uVar22 - 2) + local_3a0 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar18 = (uVar22 - 2) * local_1f8;
LAB_00156dda:
                          uVar12 = *(undefined4 *)(lVar18 + local_1e8 + uVar23 * 4);
                          piVar3 = (int *)(local_328 * uVar22 + local_3a0 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          *(undefined4 *)(local_1f8 * uVar22 + local_1e8 + uVar23 * 4) = uVar12;
                          local_380 = local_3a0;
                          local_2d8 = local_1e8;
                        }
                        goto LAB_0015b9d6;
                      }
LAB_00156998:
                      iVar13 = (int)uVar21;
                      uVar23 = (ulong)iVar13;
                      local_338 = local_338 * (uVar22 - 1);
                      piVar3 = (int *)(local_338 + img.accesses_._16_8_ + -4 + uVar23 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar18 = lVar18 * (uVar22 - 1);
                      local_1f0 = local_1f8;
                      if (*(char *)((uVar23 - 1) + img.img_._16_8_ + lVar18) != '\0') {
                        piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = *(uint *)((uVar22 - 2) * local_1f8 + local_1e8 + -8 + uVar23 * 4);
                        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar14 = *(uint *)(local_1f8 * uVar22 + local_1e8 + -8 + uVar23 * 4);
                        goto LAB_00156d6e;
                      }
                    }
                    else {
                      if (cVar28 != '\0') {
                        piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                        lVar27 * 4);
                        *piVar3 = *piVar3 + 1;
                        local_3c8 = (long *)img.img_._16_8_;
                        local_328 = local_340;
                        if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                        {
LAB_001565fe:
                          uVar10 = (uint)uVar21;
                          uVar23 = (ulong)(int)uVar10;
                          lVar35 = local_338 * (uVar22 - 1) + lVar32;
                          piVar3 = (int *)(lVar35 + 4 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar27 = (uVar22 - 1) * lVar18 + (long)local_3c8;
                          if (*(char *)(uVar23 + 1 + lVar27) == '\0') goto LAB_00156d83;
                          piVar3 = (int *)(lVar35 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar27 + uVar23) != '\0') goto LAB_00156dac;
                          piVar3 = (int *)(lVar35 + -4 + (long)(int)uVar10 * 4);
                          *piVar3 = *piVar3 + 1;
                          if (*(char *)(lVar27 + -1 + (long)(int)uVar10) == '\0') {
                            piVar3 = (int *)(local_328 * (uVar22 - 2) + local_3a0 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            lVar18 = (uVar22 - 2) * local_1f8;
                            goto LAB_00156dda;
                          }
                          lVar18 = *(long *)img.img_._72_8_;
                          goto LAB_0015665f;
                        }
LAB_00156461:
                        uVar23 = (ulong)(int)uVar21;
                        lVar32 = local_338 * (uVar22 - 1) + img.accesses_._16_8_;
                        piVar3 = (int *)(lVar32 + 4 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar27 = (uVar22 - 1) * lVar18 + img.img_._16_8_;
                        if (*(char *)(uVar23 + 1 + lVar27) == '\0') goto LAB_00156998;
                        piVar3 = (int *)(lVar32 + uVar23 * 4);
                        *piVar3 = *piVar3 + 1;
                        if (*(char *)(lVar27 + uVar23) == '\0') {
                          piVar3 = (int *)(lVar32 + -4 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          lVar32 = uVar22 - 2;
                          if ((*(char *)(lVar27 + -1 + uVar23) != '\0') &&
                             (piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 +
                                              uVar23 * 4), *piVar3 = *piVar3 + 1,
                             *(char *)(uVar23 + img.img_._16_8_ + lVar18 * lVar32) == '\0')) {
                            local_300 = local_300 + local_340 * lVar32;
                            piVar3 = (int *)(local_300 + -8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            local_1e8 = local_1e8 + local_1f8 * lVar32;
                            uVar10 = *(uint *)(local_1e8 + -8 + uVar23 * 4);
                            piVar3 = (int *)(local_300 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1e8 + uVar23 * 4));
                            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                             img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
                            *piVar3 = *piVar3 + 1;
                            uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 +
                                               img_labels.img_._16_8_ + -8 + uVar23 * 4);
                            goto LAB_00156d6e;
                          }
                          piVar3 = (int *)(local_340 * lVar32 + local_300 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)(lVar32 * local_1f8 + local_1e8 + uVar23 * 4);
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                        }
                        else {
                          piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                          uVar10 = *(uint *)((uVar22 - 2) * local_1f8 + local_1e8 + uVar23 * 4);
                          piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
                          *piVar3 = *piVar3 + 1;
                        }
                        uVar14 = *(uint *)(local_1f8 * uVar22 + local_1e8 + -8 + uVar23 * 4);
                        goto LAB_00156d6e;
                      }
                      uVar23 = uVar21 & 0xffffffff;
LAB_00156815:
                      iVar19 = (int)uVar23;
                      lVar41 = local_338 * (uVar22 | 1);
                      piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + uVar21 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar40 = (uVar22 | 1) * lVar18;
                      local_3c8 = (long *)img.img_._16_8_;
                      if (*(char *)(uVar21 + img.img_._16_8_ + lVar40) == '\0') goto LAB_00153717;
                      piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 +
                                      (long)iVar19 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)((long)iVar19 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0')
                      goto LAB_0015a419;
LAB_0015686c:
                      iVar13 = (int)uVar23;
                      piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + -4 + (long)iVar13 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar21 = uVar23 & 0xffffffff;
                      local_3c8 = (long *)img.img_._16_8_;
                      if (*(char *)((long)iVar13 + -1 + lVar40 + img.img_._16_8_) == '\0')
                      goto LAB_0015374c;
LAB_0015689a:
                      lVar27 = (long)iVar13;
                      local_338 = local_338 * (uVar22 - 1);
                      piVar3 = (int *)(local_338 + img.accesses_._16_8_ + 4 + lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar18 = lVar18 * (uVar22 - 1);
                      if (*(char *)(lVar27 + 1 + img.img_._16_8_ + lVar18) != '\0') {
                        piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + lVar27 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + lVar27 * 4);
                        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar27 * 4);
                        *piVar3 = *piVar3 + 1;
                        local_1e8 = local_1f0 * uVar22 + local_1e8;
                        goto LAB_0015a311;
                      }
                    }
LAB_00156a3f:
                    uVar23 = (ulong)iVar13;
                    piVar3 = (int *)(local_338 + img.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(uVar23 + lVar18 + img.img_._16_8_) == '\0') {
                      lVar32 = local_340 * uVar22 + local_300;
                      piVar3 = (int *)(lVar32 + -8 + uVar23 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar18 = local_1f0 * uVar22 + local_1e8;
                      uVar12 = *(undefined4 *)(lVar18 + -8 + uVar23 * 4);
                      piVar3 = (int *)(lVar32 + uVar23 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)(lVar18 + uVar23 * 4) = uVar12;
                      local_380 = local_300;
                      local_2d8 = local_1e8;
                      goto LAB_0015b9d6;
                    }
                    piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar23 * 4);
                    piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_1e8 = local_1f0 * uVar22 + local_1e8;
                    goto LAB_00156a8f;
                  }
LAB_0015baf7:
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 1) +
                                   img.accesses_._16_8_ + 4 + (long)(int)uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = lVar18 * (uVar22 - 1);
                  if (*(char *)((long)(int)uVar21 + 1 + img.img_._16_8_ + lVar32) == '\0')
                  goto LAB_00159aaa;
LAB_0015bb2b:
                  uVar23 = (ulong)(int)uVar21;
                  piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ +
                                   img.accesses_._16_8_ + uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar27 = uVar22 - 2;
                  if (*(char *)(uVar23 + lVar32 + img.img_._16_8_) != '\0') {
                    lVar32 = *(long *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(lVar32 * lVar27 + img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(uint *)(lVar27 * lVar18 + img_labels.img_._16_8_ + uVar23 * 4);
                    piVar3 = (int *)(lVar32 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_368 = uVar21;
                    uVar21 = uVar23;
                    local_358 = img_labels.img_._16_8_;
                    goto LAB_00159593;
                  }
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ +
                                  uVar23 * 4);
                  *piVar3 = *piVar3 + 1;
                  cVar28 = *(char *)(uVar23 + img.img_._16_8_ + lVar18 * lVar27);
                } while( true );
              }
              goto LAB_001547e5;
            }
            lVar40 = local_338 * (uVar22 - 1);
            piVar3 = (int *)(lVar40 + img.accesses_._16_8_ + 0xc + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = (uVar22 - 1) * lVar18;
            if (*(char *)(lVar32 + 3 + img.img_._16_8_ + lVar41) == '\0') {
              piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + 3 + lVar32) == '\0') {
                piVar3 = (int *)(local_380 + *local_3b0 * uVar22 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                uVar12 = *(undefined4 *)(local_388 + *local_320 * uVar22 + lVar32 * 4);
                local_328 = *local_3b0;
                piVar3 = (int *)(local_328 * uVar22 + local_3a0 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *local_320;
                *(undefined4 *)(local_1f8 * uVar22 + local_390 + 8 + lVar32 * 4) = uVar12;
                local_388 = local_390;
                local_380 = local_3a0;
                local_370 = local_390;
                local_378 = local_3a0;
                local_3c0 = local_3a0;
                local_358 = local_390;
                local_2d8 = local_390;
                local_2e8 = local_390;
                uVar21 = local_360 & 0xffffffff;
                local_2f8 = local_3a0;
                local_398 = (long *)local_390;
                local_348 = local_3a0;
                local_390 = local_390;
                local_3b8 = local_3a0;
                local_2f0 = local_328;
                local_2e0 = local_1f8;
                goto LAB_00159d37;
              }
LAB_001547e5:
              piVar3 = (int *)(lVar40 + img.accesses_._16_8_ + 0x10 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar32 + 4 + lVar41 + img.img_._16_8_) == '\0') {
                local_3a0 = local_3a0 + *local_3b0 * uVar22;
                piVar3 = (int *)(local_3a0 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                local_390 = local_390 + *local_320 * uVar22;
                uVar12 = *(undefined4 *)(local_390 + lVar32 * 4);
                piVar3 = (int *)(local_3a0 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(local_390 + 8 + lVar32 * 4) = uVar12;
                uVar21 = local_360 & 0xffffffff;
                goto LAB_0015847a;
              }
              lVar27 = uVar22 - 2;
              lVar41 = img.accesses_._16_8_ + local_338 * lVar27;
              piVar3 = (int *)(lVar41 + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = lVar18 * lVar27;
              if ((*(char *)(lVar32 + 3 + img.img_._16_8_ + lVar35) != '\0') &&
                 (piVar3 = (int *)(lVar41 + 8 + lVar32 * 4), *piVar3 = *piVar3 + 1,
                 *(char *)(img.img_._16_8_ + lVar35 + 2 + lVar32) != '\0')) {
                uVar21 = local_360 & 0xffffffff;
                goto LAB_001587bc;
              }
              lVar18 = *local_3b0;
              piVar3 = (int *)(lVar18 * lVar27 + local_3a0 + 0x10 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = *local_320;
              uVar10 = *(uint *)(lVar27 * lVar35 + local_390 + 0x10 + lVar32 * 4);
              piVar3 = (int *)(lVar18 * uVar22 + local_3a0 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar35 * uVar22 + local_390 + lVar32 * 4));
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f8 = *(long *)img_labels.img_._72_8_;
              uVar21 = local_360 & 0xffffffff;
              lVar32 = img_labels.accesses_._16_8_;
              uVar23 = local_360;
              local_1f0 = local_1f8;
              local_320 = (long *)img_labels.img_._72_8_;
              local_1e8 = img_labels.img_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_3a0 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_390 = img_labels.img_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_358 = img_labels.img_._16_8_;
              goto LAB_00153fc1;
            }
            lVar27 = uVar22 - 2;
            piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar27 + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar32 + 2 + img.img_._16_8_ + lVar18 * lVar27) == '\0') {
              lVar18 = *local_3b0;
              piVar3 = (int *)(lVar18 * lVar27 + local_380 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = *local_320;
              uVar10 = *(uint *)(lVar27 * lVar35 + local_388 + 8 + lVar32 * 4);
              piVar3 = (int *)(lVar18 * uVar22 + local_380 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar35 * uVar22 + local_388 + lVar32 * 4));
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                               img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f0 = *(long *)img_labels.img_._72_8_;
              uVar29 = local_360;
LAB_00157d35:
              uVar21 = uVar29 & 0xffffffff;
              local_2d8 = img_labels.img_._16_8_;
            }
            else {
              uVar21 = local_360 & 0xffffffff;
LAB_0015892c:
              uVar29 = (ulong)(int)uVar21;
              piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 2) + img.accesses_._16_8_ +
                               -4 + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              cVar28 = *(char *)((uVar29 - 1) +
                                *(long *)img.img_._72_8_ * (uVar22 - 2) + img.img_._16_8_);
LAB_00159beb:
              lVar18 = *(long *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f0 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + img_labels.img_._16_8_ + uVar29 * 4);
              lVar18 = img_labels.accesses_._16_8_ + lVar18 * uVar22;
              if (cVar28 == '\0') {
                piVar3 = (int *)(lVar18 + -8 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = RemSP::MemMerge(uVar10,*(uint *)(img_labels.img_._16_8_ +
                                                          local_1f0 * uVar22 + -8 + uVar29 * 4));
                piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                 img_labels.accesses_._16_8_ + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f0 = *(long *)img_labels.img_._72_8_;
                local_2d8 = img_labels.img_._16_8_;
              }
              else {
                piVar3 = (int *)(lVar18 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                local_2d8 = img_labels.img_._16_8_;
              }
            }
            goto LAB_0015b6b3;
          }
          piVar3 = (int *)(lVar30 + 4 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          if ((*(char *)(lVar25 + 1 + lVar38) != '\0') ||
             (piVar3 = (int *)(local_318 * local_338 + lVar32 + 4 + lVar25 * 4),
             *piVar3 = *piVar3 + 1, *(char *)(lVar25 + 1 + local_318 * lVar18 + lVar27) != '\0')) {
            uVar21 = (ulong)(iVar19 + (int)lVar25 + 2);
LAB_001599ef:
            lVar27 = (long)(int)uVar21;
            lVar35 = local_338 * (uVar22 - 1);
            piVar3 = (int *)(lVar35 + img.accesses_._16_8_ + 4 + lVar27 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = lVar18 * (uVar22 - 1);
            if (*(char *)(lVar27 + 1 + img.img_._16_8_ + lVar32) == '\0') {
              piVar3 = (int *)(img.accesses_._16_8_ + local_338 * uVar22 + 4 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
                piVar3 = (int *)(lVar18 + -8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *(long *)img_labels.img_._72_8_;
                lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
                uVar12 = *(undefined4 *)(lVar32 + -8 + lVar27 * 4);
                piVar3 = (int *)(lVar18 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar32 + lVar27 * 4) = uVar12;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_320 = (long *)img_labels.img_._72_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_2f0 = local_328;
                local_2e0 = local_1f8;
                goto LAB_00159d37;
              }
LAB_00159aaa:
              lVar27 = (long)(int)uVar21;
              piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                               8 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar27 + 2 + lVar32 + img.img_._16_8_) == '\0') {
                lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                ;
                piVar3 = (int *)(lVar18 + -8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
                uVar12 = *(undefined4 *)(lVar32 + -8 + lVar27 * 4);
                piVar3 = (int *)(lVar18 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar32 + lVar27 * 4) = uVar12;
                goto LAB_0015847a;
              }
LAB_00159ad9:
              lVar32 = uVar22 - 2;
              uVar23 = (ulong)(int)uVar21;
              piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 4 +
                              uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(uVar23 + 1 + lVar18 * lVar32 + img.img_._16_8_) != '\0')
              goto LAB_00159b0c;
              lVar18 = *(long *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
              piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
              *piVar3 = *piVar3 + 1;
              uVar14 = *(uint *)(lVar27 * uVar22 + img_labels.img_._16_8_ + -8 + uVar23 * 4);
              goto LAB_0015a984;
            }
LAB_00159a18:
            uVar29 = (ulong)(int)uVar21;
            piVar3 = (int *)(lVar35 + img.accesses_._16_8_ + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = uVar22 - 2;
            if (*(char *)(uVar29 + lVar32 + img.img_._16_8_) == '\0') {
              piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar27 + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              cVar28 = *(char *)(uVar29 + img.img_._16_8_ + lVar18 * lVar27);
              goto LAB_00159beb;
            }
            lVar18 = *(long *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(lVar18 * lVar27 + img_labels.accesses_._16_8_ + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
            local_1f0 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(lVar27 * local_1f0 + img_labels.img_._16_8_ + uVar29 * 4);
            piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
            local_2d8 = img_labels.img_._16_8_;
            goto LAB_0015b6b3;
          }
          lVar30 = local_338 * (long)local_350 + lVar32;
          piVar3 = (int *)(lVar30 + 0xc + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar33 = (long)local_350 * lVar18 + lVar27;
          if (*(char *)(lVar25 + 3 + lVar33) == '\0') {
            uVar21 = (ulong)(iVar19 + 2) + lVar25;
            iVar19 = (int)uVar21;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ +
                             lVar39 * 4 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar25 + 3 + lVar38) == '\0') {
              piVar3 = (int *)(img.accesses_._16_8_ +
                               *(long *)img.accesses_._72_8_ * (long)local_350 + lVar39 * 4 + 8 +
                              lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              local_3a0 = img_labels.accesses_._16_8_;
              local_340 = local_328;
              local_2f0 = local_328;
              if (*(char *)(lVar25 + 2 + lVar33) == '\0') {
                piVar3 = (int *)(local_328 * lVar41 + img_labels.accesses_._16_8_ + lVar37);
                *piVar3 = *piVar3 + 1;
                local_2e0 = *(long *)img_labels.img_._72_8_;
                uVar12 = *(undefined4 *)(lVar37 + lVar41 * local_2e0 + img_labels.img_._16_8_);
                piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                                lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)
                 (local_2e0 * uVar22 + img_labels.img_._16_8_ + lVar39 * 4 + 8 + lVar25 * 4) =
                     uVar12;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_1f8 = local_2e0;
                local_1f0 = local_2e0;
                goto LAB_00155baa;
              }
              piVar3 = (int *)(local_328 * local_308 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8
                              + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f0 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)(local_1f0 * local_308 + img_labels.img_._16_8_ + lVar39 * 4 + 8 +
                                lVar25 * 4);
              piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                              lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_2e8 = img_labels.img_._16_8_;
              local_2f8 = img_labels.accesses_._16_8_;
              local_2e0 = local_1f0;
              local_1f8 = local_1f0;
              goto LAB_0015760b;
            }
            piVar3 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar35 +
                            ((long)(local_360 + 0x400000000) >> 0x1e));
            *piVar3 = *piVar3 + 1;
            cVar28 = *(char *)(lVar18 * lVar35 + img.img_._16_8_ +
                              ((long)(local_360 + 0x400000000) >> 0x20));
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (long)local_350 + img.accesses_._16_8_
                             + lVar39 * 4 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            cVar5 = *(char *)(lVar25 + 2 + lVar33);
            if (cVar28 != '\0') {
              if (cVar5 != '\0') goto LAB_00153b9f;
              lVar32 = (long)(local_360 + 0x300000000) >> 0x20;
              goto LAB_0015c49d;
            }
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_328 = *(ulong *)img_labels.accesses_._72_8_;
            local_3a0 = img_labels.accesses_._16_8_;
            if (cVar5 == '\0') {
              piVar3 = (int *)(local_328 * lVar41 + img_labels.accesses_._16_8_ + lVar37);
              *piVar3 = *piVar3 + 1;
              local_2e0 = *(long *)img_labels.img_._72_8_;
              uVar12 = *(undefined4 *)(lVar37 + lVar41 * local_2e0 + img_labels.img_._16_8_);
              piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                              lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)
               (local_2e0 * uVar22 + img_labels.img_._16_8_ + lVar39 * 4 + 8 + lVar25 * 4) = uVar12;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_2e8 = img_labels.img_._16_8_;
              local_2f8 = img_labels.accesses_._16_8_;
              local_2f0 = local_328;
              local_1f8 = local_2e0;
              goto LAB_00157c21;
            }
            piVar3 = (int *)(local_328 * local_308 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_1f0 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(local_1f0 * local_308 + img_labels.img_._16_8_ + lVar39 * 4 + 8 +
                              lVar25 * 4);
            piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4 + 8 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            goto LAB_0015c1ec;
          }
          piVar3 = (int *)(lVar30 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar25 + 2 + lVar33) != '\0') goto code_r0x0015b816;
          uVar21 = (ulong)(iVar19 + (int)lVar25 + 2);
          uVar29 = (long)(local_360 + 0x200000000) >> 0x20;
LAB_0015bcab:
          lVar32 = uVar22 - 2;
          piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ +
                          uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(uVar29 + lVar18 * lVar32 + (long)local_3c8) == '\0') {
            lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar32 + img_labels.accesses_._16_8_;
            piVar3 = (int *)(lVar18 + -8 + (long)(int)uVar21 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = lVar32 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
            uVar10 = *(uint *)(lVar32 + -8 + (long)(int)uVar21 * 4);
            piVar3 = (int *)(lVar18 + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
            uVar14 = *(uint *)(lVar32 + uVar29 * 4);
LAB_0015bd57:
            uVar10 = RemSP::MemMerge(uVar10,uVar14);
            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_ + uVar29 * 4);
            *piVar3 = *piVar3 + 1;
LAB_0015b694:
            local_1f0 = *(long *)img_labels.img_._72_8_;
            local_2d8 = img_labels.img_._16_8_;
            goto LAB_0015b6b3;
          }
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * local_1f0 + img_labels.img_._16_8_ + uVar29 * 4);
        } while( true );
      }
      local_3c8 = (long *)img.img_._16_8_;
      if (iVar36 == 2) {
        uVar21 = 0;
        if (cVar28 == '\0') {
          lVar27 = lVar18 * (uVar22 | 1);
          uVar21 = 0;
LAB_00153555:
          lVar32 = *(long *)img.accesses_._72_8_;
          lVar25 = (long)(int)uVar21;
          piVar3 = (int *)((uVar22 | 1) * lVar32 + img.accesses_._16_8_ + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          uVar23 = uVar21;
          if (*(char *)(lVar25 + lVar27 + (long)local_3c8) == '\0') {
LAB_00153717:
            uVar10 = (uint)uVar23;
            lVar25 = (long)(int)uVar10;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_ + 4 +
                            lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            uVar21 = uVar23;
            if (*(char *)(lVar25 + 1 + lVar18 * uVar22 + (long)local_3c8) == '\0') {
LAB_00159510:
              lVar25 = lVar25 + 1;
LAB_00159513:
              piVar3 = (int *)((uVar22 | 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = (long)(int)uVar10;
              if (*(char *)(lVar25 + lVar18 * (uVar22 | 1) + (long)local_3c8) == '\0') {
                piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                 img_labels.accesses_._16_8_ + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)
                 (*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + lVar27 * 4) =
                     0;
                local_380 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
              }
              else {
                uVar10 = RemSP::MemNewLabel();
LAB_0015a7d7:
                piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                 img_labels.accesses_._16_8_ + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ +
                         lVar27 * 4) = uVar10;
                local_380 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
              }
              goto LAB_0015b9d6;
            }
          }
          else {
            piVar3 = (int *)(img.accesses_._16_8_ + lVar32 * uVar22 + 4 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_3c8 = local_3c8;
            if (*(char *)(lVar25 + 1 + lVar18 * uVar22 + (long)local_3c8) == '\0')
            goto LAB_00153690;
          }
        }
LAB_0015374c:
        lVar32 = (long)(int)uVar21;
        piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 +
                        lVar32 * 4);
        *piVar3 = *piVar3 + 1;
        uVar23 = uVar21;
        if (*(char *)(lVar32 + 1 + lVar18 * (uVar22 - 1) + (long)local_3c8) == '\0') {
LAB_0015a6a8:
          uVar23 = (ulong)(int)uVar23;
          piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                          uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(uVar23 + lVar18 * (uVar22 - 1) + (long)local_3c8) == '\0') {
LAB_0015a72f:
            uVar10 = RemSP::MemNewLabel();
LAB_0015a734:
            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_ + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + uVar23 * 4
                     ) = uVar10;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
          }
          else {
            lVar18 = *(long *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = *(long *)img_labels.img_._72_8_;
            uVar12 = *(undefined4 *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
            piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(lVar32 * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = uVar12;
            local_380 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
          }
        }
        else {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          lVar27 = *(long *)img_labels.img_._72_8_;
          uVar12 = *(undefined4 *)((uVar22 - 2) * lVar27 + img_labels.img_._16_8_ + lVar32 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar27 * uVar22 + img_labels.img_._16_8_ + lVar32 * 4) = uVar12;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
      }
      else {
        uVar23 = 0;
        if (cVar28 != '\0') goto LAB_0015a6a8;
        lVar27 = lVar18 * (uVar22 | 1);
        uVar21 = 0;
LAB_00153665:
        lVar25 = (long)(int)uVar21;
        piVar3 = (int *)((uVar22 | 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar25 + lVar27 + (long)local_3c8) == '\0') {
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + lVar25 * 4) = 0;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
        else {
LAB_00153690:
          uVar10 = RemSP::MemNewLabel();
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + lVar25 * 4)
               = uVar10;
          local_380 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
        }
      }
LAB_0015b9d6:
      local_308 = local_308 + 2;
      local_350 = (long *)((long)local_350 + 2);
      local_318 = local_318 + 2;
    }
    if (local_10c == 1) {
      lVar18 = (long)(iVar20 + -1);
      lVar27 = (long)(iVar20 + -2);
      lVar32 = (long)(iVar20 + -3);
      local_328 = 0xfffffffffffffffe;
      local_308 = local_2d8;
LAB_0015cd89:
      iVar20 = (int)local_328;
      lVar35 = (long)iVar20;
      local_328 = lVar35 + 2;
      if ((int)local_328 < local_2d0) {
        local_338 = *(long *)img.accesses_._72_8_;
        lVar40 = local_338 * lVar18 + img.accesses_._16_8_;
        piVar3 = (int *)(lVar40 + 8 + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        local_398 = (long *)img.img_._72_8_;
        local_360 = *(ulong *)img.img_._72_8_;
        lVar25 = local_360 * lVar18 + img.img_._16_8_;
        local_348 = img.accesses_._16_8_;
        plVar34 = (long *)img.img_._16_8_;
        lVar41 = img.accesses_._16_8_;
        if (*(char *)(lVar35 + 2 + lVar25) == '\0') {
          local_320 = (long *)img.img_._16_8_;
          local_328 = local_328 & 0xffffffff;
          goto LAB_0015cf99;
        }
        lVar39 = local_338 * lVar27;
        piVar3 = (int *)(img.accesses_._16_8_ + lVar39 + 0xc + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        lVar42 = local_360 * lVar27;
        if (*(char *)(lVar35 + 3 + img.img_._16_8_ + lVar42) != '\0') {
          lVar41 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar41 * lVar32 + local_380 + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          lVar40 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + 8 + lVar35 * 4);
          piVar3 = (int *)(lVar41 * lVar18 + local_380 + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          local_3a0 = local_308;
          uVar22 = local_328;
          goto LAB_0015e2c6;
        }
        piVar3 = (int *)(lVar40 + 0xc + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar25 + 3 + lVar35) != '\0') {
          local_320 = (long *)img.img_._16_8_;
LAB_0015d0e8:
          uVar10 = (uint)local_328;
          uVar22 = (ulong)(int)uVar10;
          piVar3 = (int *)(lVar39 + lVar41 + 8 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          cVar28 = *(char *)(uVar22 + 2 + lVar42 + (long)plVar34);
          piVar3 = (int *)(lVar39 + lVar41 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          cVar5 = *(char *)(uVar22 + lVar42 + (long)plVar34);
          if (cVar28 != '\0') {
            if (cVar5 != '\0') goto LAB_0015d127;
            goto LAB_0015d151;
          }
          if (cVar5 == '\0') {
            uVar14 = RemSP::MemNewLabel();
            local_3b8 = *(long *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
            *piVar3 = *piVar3 + 1;
            goto LAB_0015e692;
          }
          local_3c8 = (long *)img_labels.accesses_._72_8_;
          local_3b8 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_3b8 * lVar32 + img_labels.accesses_._16_8_ + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          local_350 = (long *)img_labels.img_._72_8_;
          lVar40 = *(long *)img_labels.img_._72_8_;
          local_330 = img_labels.img_._16_8_;
          local_318 = img_labels.accesses_._16_8_;
          local_370 = img_labels.img_._16_8_;
          local_340 = img_labels.accesses_._16_8_;
          local_388 = img_labels.img_._16_8_;
          local_380 = img_labels.accesses_._16_8_;
          local_3a0 = img_labels.img_._16_8_;
          local_390 = img_labels.accesses_._16_8_;
          local_378 = img_labels.accesses_._16_8_;
          local_368 = img_labels.accesses_._16_8_;
          local_308 = img_labels.img_._16_8_;
LAB_0015d243:
          lVar42 = lVar40 * lVar32;
          uVar12 = *(undefined4 *)(local_308 + lVar42 + uVar22 * 4);
          lVar35 = local_3b8 * lVar18 + local_368;
          piVar3 = (int *)(lVar35 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          lVar41 = lVar40 * lVar18 + local_308;
          *(undefined4 *)(lVar41 + uVar22 * 4) = uVar12;
          lVar25 = (long)(int)uVar10;
          uVar22 = lVar25 + 2;
          if ((int)uVar22 < local_2d0) {
            lVar40 = local_338 * lVar18 + local_348;
            piVar3 = (int *)(lVar40 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar39 = local_360 * lVar18 + (long)local_320;
            if (*(char *)(lVar25 + 2 + lVar39) == '\0') {
              local_328 = uVar22 & 0xffffffff;
              local_348 = local_348;
              local_320 = local_320;
              goto LAB_0015e45c;
            }
            lVar37 = local_338 * lVar27 + local_348;
            piVar3 = (int *)(lVar37 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar38 = local_360 * lVar27 + (long)local_320;
            if (*(char *)(lVar25 + 3 + lVar38) != '\0') {
              piVar3 = (int *)(local_348 + local_338 * lVar32 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = local_360 * lVar32;
              if (*(char *)(lVar25 + 2 + (long)local_320 + lVar40) != '\0') {
                local_328 = uVar22 & 0xffffffff;
                goto LAB_0015e977;
              }
              piVar3 = (int *)(local_368 + local_3b8 * lVar32 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)(local_308 + lVar42 + 8 + lVar25 * 4);
              piVar3 = (int *)(lVar35 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar41 + lVar25 * 4));
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                               img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = *(long *)img_labels.img_._72_8_;
              local_3a0 = img_labels.img_._16_8_;
              goto LAB_0015e2c6;
            }
            piVar3 = (int *)(lVar40 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar39 + 3 + lVar25) != '\0') {
              piVar3 = (int *)(lVar37 + 0x10 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar38 + 4 + lVar25) == '\0') {
                piVar3 = (int *)(lVar35 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar12 = *(undefined4 *)(lVar41 + lVar25 * 4);
                piVar3 = (int *)(lVar35 + 8 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar41 + 8 + lVar25 * 4) = uVar12;
                local_328 = uVar22;
                goto LAB_0015e6c7;
              }
              lVar39 = local_338 * lVar32;
              piVar3 = (int *)(local_348 + lVar39 + 0xc + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = local_360 * lVar32;
              if (*(char *)(lVar25 + 3 + (long)local_320 + lVar40) == '\0') {
                piVar3 = (int *)(local_368 + local_3b8 * lVar32 + 0x10 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)(local_308 + lVar42 + 0x10 + lVar25 * 4);
                piVar3 = (int *)(lVar35 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar41 + lVar25 * 4));
                local_3c8 = (long *)img_labels.accesses_._72_8_;
                local_3b8 = *(long *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                local_350 = (long *)img_labels.img_._72_8_;
                lVar40 = *(long *)img_labels.img_._72_8_;
                local_330 = img_labels.img_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_3a0 = img_labels.img_._16_8_;
                local_390 = img_labels.accesses_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_328 = uVar22 & 0xffffffff;
                local_368 = img_labels.accesses_._16_8_;
                local_340 = img_labels.accesses_._16_8_;
                local_308 = img_labels.img_._16_8_;
                local_310 = img_labels.accesses_._16_8_;
                goto LAB_0015d4ca;
              }
              piVar3 = (int *)(local_348 + lVar39 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)((long)local_320 + lVar40 + 2 + lVar25) == '\0') {
                piVar3 = (int *)(local_368 + local_3b8 * lVar32 + 0x10 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)(local_308 + lVar42 + 0x10 + lVar25 * 4);
                piVar3 = (int *)(lVar35 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar41 + lVar25 * 4));
                local_3b8 = *(long *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                lVar40 = *(long *)img_labels.img_._72_8_;
                goto LAB_0015e3f1;
              }
              local_328 = uVar22 & 0xffffffff;
LAB_0015eb15:
              iVar20 = (int)local_328;
              uVar22 = (ulong)iVar20;
              piVar3 = (int *)(lVar39 + local_348 + -4 + uVar22 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = (long)(iVar20 + 2);
              if (*(char *)((uVar22 - 1) + lVar40 + (long)local_320) != '\0') {
                piVar3 = (int *)(local_390 + *local_3c8 * lVar32 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)(local_3a0 + *local_350 * lVar32 + lVar35 * 4);
                local_3b8 = *local_3c8;
                piVar3 = (int *)(local_3b8 * lVar18 + local_380 + uVar22 * 4);
                *piVar3 = *piVar3 + 1;
                lVar40 = *local_350;
                local_368 = local_380;
                local_308 = local_388;
                local_310 = local_318;
                local_3a0 = local_388;
                local_390 = local_380;
                local_378 = local_380;
                goto LAB_0015d4ca;
              }
              lVar41 = *local_3c8;
              piVar3 = (int *)(lVar41 * lVar32 + local_380 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = *local_350;
              uVar10 = *(uint *)(lVar40 * lVar32 + local_388 + lVar35 * 4);
              uVar22 = (ulong)iVar20;
              piVar3 = (int *)(lVar41 * lVar18 + local_380 + -8 + uVar22 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar40 * lVar18 + local_388 + -8 +
                                                       uVar22 * 4));
              local_3b8 = *(long *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = *(long *)img_labels.img_._72_8_;
LAB_0015fc43:
              local_330 = img_labels.img_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_3a0 = img_labels.img_._16_8_;
              local_390 = img_labels.accesses_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_368 = img_labels.accesses_._16_8_;
              local_340 = img_labels.accesses_._16_8_;
              local_308 = img_labels.img_._16_8_;
              local_310 = img_labels.accesses_._16_8_;
              local_3c8 = (long *)img_labels.accesses_._72_8_;
              local_350 = (long *)img_labels.img_._72_8_;
LAB_0015d4ca:
              *(uint *)(lVar40 * lVar18 + local_308 + uVar22 * 4) = uVar10;
              iVar20 = (int)local_328;
              lVar39 = (long)iVar20;
              lVar25 = lVar39 << 0x20;
              lVar35 = lVar39 * 4;
              lVar42 = 0;
              local_318 = local_368;
              while( true ) {
                lVar37 = local_318;
                uVar21 = lVar39 + lVar42 + 2;
                lVar41 = lVar25 >> 0x1e;
                local_398 = (long *)img.img_._72_8_;
                local_320 = (long *)img.img_._16_8_;
                if (lVar15 <= (long)uVar21) {
                  uVar22 = (ulong)(iVar20 + 2) + lVar42;
                  if (local_2d0 < (int)uVar22) goto LAB_0015fcfa;
                  lVar15 = *(long *)img.accesses_._72_8_;
                  lVar39 = lVar15 * lVar18 + img.accesses_._16_8_;
                  piVar3 = (int *)((lVar25 + 0x200000000 >> 0x1e) + lVar39);
                  *piVar3 = *piVar3 + 1;
                  lVar42 = lVar25 + 0x200000000 >> 0x20;
                  lVar35 = *(long *)img.img_._72_8_;
                  lVar37 = lVar35 * lVar18 + img.img_._16_8_;
                  if (*(char *)(lVar42 + lVar37) == '\0') {
                    piVar3 = (int *)(lVar39 + (lVar25 + 0x300000000 >> 0x1e));
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar37 + (lVar25 + 0x300000000 >> 0x20)) == '\0') {
                      piVar3 = (int *)(local_318 + local_3b8 * lVar18 + lVar42 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)(local_308 + lVar40 * lVar18 + lVar42 * 4) = 0;
                      goto LAB_00161044;
                    }
                  }
                  else {
                    piVar3 = (int *)((lVar25 + 0x300000000 >> 0x1e) +
                                    img.accesses_._16_8_ + lVar15 * lVar27);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)((lVar25 + 0x300000000 >> 0x20) + img.img_._16_8_ + lVar35 * lVar27
                                 ) == '\0') {
                      local_318 = local_318 + local_3b8 * lVar18;
                      piVar3 = (int *)(lVar41 + local_318);
                      *piVar3 = *piVar3 + 1;
                      local_308 = local_308 + lVar40 * lVar18;
                      uVar12 = *(undefined4 *)(lVar41 + local_308);
                      piVar3 = (int *)(local_318 + lVar42 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)(local_308 + lVar42 * 4) = uVar12;
                      goto LAB_00161044;
                    }
                  }
                  piVar3 = (int *)(local_3b8 * lVar32 + local_318 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)(lVar32 * lVar40 + local_308 + lVar42 * 4);
                  piVar3 = (int *)(local_3b8 * lVar18 + local_318 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar40 * lVar18 + local_308 + lVar42 * 4) = uVar12;
                  goto LAB_00161044;
                }
                local_338 = *(long *)img.accesses_._72_8_;
                lVar33 = local_338 * lVar18 + img.accesses_._16_8_;
                lVar38 = lVar33 + lVar35;
                piVar3 = (int *)(lVar38 + 8 + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                local_360 = *(ulong *)img.img_._72_8_;
                lVar24 = local_360 * lVar18 + img.img_._16_8_;
                lVar30 = lVar24 + lVar39;
                if (*(char *)(lVar42 + 2 + lVar30) == '\0') {
                  local_348 = img.accesses_._16_8_;
                  local_328 = (ulong)(iVar20 + 2) + lVar42;
                  uVar10 = (uint)local_328;
                  piVar3 = (int *)(lVar33 + (lVar25 + 0x300000000 >> 0x1e));
                  *piVar3 = *piVar3 + 1;
                  lVar35 = lVar25 + 0x300000000 >> 0x20;
                  uVar22 = lVar39 + 2 + lVar42;
                  plVar34 = (long *)img.img_._16_8_;
                  lVar41 = img.accesses_._16_8_;
                  if (*(char *)(lVar24 + lVar35) == '\0') {
                    local_3b8 = *local_3c8;
                    piVar3 = (int *)(local_3b8 * lVar18 + local_340 + lVar39 * 4 + 8 + lVar42 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_318 = local_310;
                    local_368 = local_340;
                    local_3a0 = local_370;
                    goto LAB_0015dd31;
                  }
                  lVar38 = local_338 * lVar27 + img.accesses_._16_8_;
                  piVar3 = (int *)(lVar38 + lVar35 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar30 = local_360 * lVar27 + img.img_._16_8_;
                  if (*(char *)(lVar35 + lVar30) != '\0') {
                    piVar3 = (int *)(local_3b8 * lVar32 + local_318 + lVar39 * 4 + 8 + lVar42 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_318 = local_310;
                    goto LAB_0015e513;
                  }
                  piVar3 = (int *)(lVar38 + (lVar25 + 0x400000000 >> 0x1e));
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar30 + (lVar25 + 0x400000000 >> 0x20)) != '\0') goto LAB_0015d127;
                  piVar3 = (int *)(local_318 + local_3b8 * lVar32 + lVar39 * 4 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_318 = local_310;
                  local_368 = local_368;
                  goto LAB_0015d243;
                }
                lVar37 = local_338 * lVar27 + img.accesses_._16_8_ + lVar35;
                piVar3 = (int *)(lVar37 + 0xc + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                lVar33 = local_360 * lVar27 + img.img_._16_8_ + lVar39;
                iVar36 = (int)lVar42;
                if (*(char *)(lVar42 + 3 + lVar33) != '\0') {
                  piVar3 = (int *)(local_3b8 * lVar32 + local_318 + lVar39 * 4 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_328 = (ulong)(iVar20 + iVar36 + 2);
                  uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + lVar39 * 4 + 8 + lVar42 * 4);
                  piVar3 = (int *)(local_3b8 * lVar18 + local_318 + lVar39 * 4 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  goto LAB_0015f03d;
                }
                piVar3 = (int *)(lVar38 + 0xc + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar42 + 3 + lVar30) == '\0') {
                  lVar35 = local_3b8 * lVar18 + local_318;
                  piVar3 = (int *)(lVar41 + lVar35);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = lVar40 * lVar18 + local_308;
                  uVar12 = *(undefined4 *)(lVar41 + lVar40);
                  piVar3 = (int *)(lVar35 + lVar39 * 4 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_328 = (ulong)(iVar20 + iVar36 + 2);
                  *(undefined4 *)(lVar40 + lVar39 * 4 + 8 + lVar42 * 4) = uVar12;
                  local_380 = local_318;
                  goto LAB_0015cd89;
                }
                piVar3 = (int *)(lVar37 + 0x10 + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar42 + 4 + lVar33) == '\0') break;
                piVar3 = (int *)(img.accesses_._16_8_ + lVar35 + local_338 * lVar32 + 0xc +
                                lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                cVar28 = *(char *)(lVar42 + 3 + img.img_._16_8_ + lVar39 + local_360 * lVar32);
                piVar3 = (int *)(local_3b8 * lVar32 + local_318 + lVar35 + 0x10 + lVar42 * 4);
                *piVar3 = *piVar3 + 1;
                lVar37 = local_3b8 * lVar18 + local_318;
                lVar41 = lVar40 * lVar18 + local_308;
                uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + lVar35 + 0x10 + lVar42 * 4);
                if (cVar28 == '\0') {
                  piVar3 = (int *)(lVar37 + lVar35 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar41 + lVar35 + lVar42 * 4));
                  local_3c8 = (long *)img_labels.accesses_._72_8_;
                  local_3b8 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + lVar35 + 8 +
                                  lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_350 = (long *)img_labels.img_._72_8_;
                  lVar40 = *(long *)img_labels.img_._72_8_;
                  lVar41 = lVar40 * lVar18 + img_labels.img_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_340 = img_labels.accesses_._16_8_;
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_3a0 = img_labels.img_._16_8_;
                  local_390 = img_labels.accesses_._16_8_;
                  local_330 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_368 = img_labels.accesses_._16_8_;
                  local_310 = img_labels.accesses_._16_8_;
                  local_318 = img_labels.accesses_._16_8_;
                  local_308 = img_labels.img_._16_8_;
                }
                else {
                  piVar3 = (int *)(lVar37 + lVar35 + 8 + lVar42 * 4);
                  *piVar3 = *piVar3 + 1;
                }
                *(uint *)(lVar41 + lVar35 + 8 + lVar42 * 4) = uVar10;
                lVar25 = lVar25 + 0x200000000;
                lVar42 = lVar42 + 2;
              }
              local_318 = local_318 + local_3b8 * lVar18;
              piVar3 = (int *)(lVar41 + local_318);
              *piVar3 = *piVar3 + 1;
              local_308 = local_308 + lVar40 * lVar18;
              uVar12 = *(undefined4 *)(lVar41 + local_308);
              piVar3 = (int *)(local_318 + lVar39 * 4 + 8 + lVar42 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar39 * 4 + local_308 + 8 + lVar42 * 4) = uVar12;
              local_328 = (ulong)(iVar20 + iVar36 + 2);
LAB_0015e6c7:
              do {
                local_398 = (long *)img.img_._72_8_;
                local_3c8 = (long *)img_labels.accesses_._72_8_;
                local_330 = img_labels.img_._16_8_;
                local_350 = (long *)img_labels.img_._72_8_;
                iVar20 = (int)local_328;
                lVar37 = (long)iVar20;
                local_360 = lVar37 << 0x20;
                local_348 = img.accesses_._16_8_;
                lVar35 = img.accesses_._16_8_ + lVar37 * 4;
                local_320 = (long *)img.img_._16_8_;
                lVar41 = img.img_._16_8_ + lVar37;
                lVar25 = img_labels.img_._16_8_ + lVar37 * 4;
                lVar42 = img_labels.accesses_._16_8_ + lVar37 * 4;
                lVar38 = 0;
                while( true ) {
                  uVar21 = lVar37 + lVar38 + 2;
                  lVar33 = (long)local_360 >> 0x1e;
                  lVar30 = (long)local_360 >> 0x20;
                  local_368 = img_labels.accesses_._16_8_;
                  local_308 = img_labels.img_._16_8_;
                  if (lVar15 <= (long)uVar21) {
                    uVar22 = (ulong)(iVar20 + 2) + lVar38;
                    if (local_2d0 < (int)uVar22) goto LAB_0015fcfa;
                    lVar35 = (long)(local_360 + 0x200000000) >> 0x20;
                    piVar3 = (int *)(((long)(local_360 + 0x200000000) >> 0x1e) +
                                    *(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    uVar21 = *(ulong *)img.img_._72_8_;
                    lVar15 = uVar21 * lVar18;
                    if (*(char *)(lVar35 + img.img_._16_8_ + lVar15) == '\0') {
                      goto LAB_001603b4;
                    }
                    piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                                    *(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(((long)(local_360 + 0x300000000) >> 0x20) +
                                 img.img_._16_8_ + uVar21 * lVar27) == '\0') {
                      lVar32 = img_labels.accesses_._16_8_ +
                               *(long *)img_labels.accesses_._72_8_ * lVar18;
                      piVar3 = (int *)(lVar33 + lVar32);
                      *piVar3 = *piVar3 + 1;
                      lVar15 = img_labels.img_._16_8_ + lVar18 * *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar33 + lVar15);
                      piVar3 = (int *)(lVar32 + lVar35 * 4);
                      *piVar3 = *piVar3 + 1;
                      goto LAB_001604ce;
                    }
                    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ +
                                    lVar35 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar15 = *(long *)img.img_._72_8_;
                    if (*(char *)(lVar35 + lVar15 * lVar32 + img.img_._16_8_) == '\0') {
                      lVar15 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar15 * lVar32 + img_labels.accesses_._16_8_ + lVar35 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar27 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + lVar35 * 4);
                      piVar3 = (int *)(lVar33 + lVar15 * lVar18 + img_labels.accesses_._16_8_);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(lVar33 + lVar27 * lVar18 + img_labels.img_._16_8_);
                    }
                    else {
                      piVar3 = (int *)(lVar33 + lVar27 * *(long *)img.accesses_._72_8_ +
                                                img.accesses_._16_8_);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar30 + img.img_._16_8_ + lVar15 * lVar27) != '\0')
                      goto LAB_00160053;
                      lVar15 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar15 * lVar32 + img_labels.accesses_._16_8_ + lVar35 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar27 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + lVar35 * 4);
                      piVar3 = (int *)(lVar15 * lVar18 + img_labels.accesses_._16_8_ + lVar30 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(lVar27 * lVar18 + img_labels.img_._16_8_ + lVar30 * 4);
                    }
                    goto LAB_00160ef2;
                  }
                  local_338 = *(long *)img.accesses_._72_8_;
                  lVar39 = local_338 * lVar18 + lVar35;
                  piVar3 = (int *)(lVar39 + 8 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = *(long *)img.img_._72_8_;
                  lVar24 = lVar40 * lVar18 + lVar41;
                  local_318 = img_labels.accesses_._16_8_;
                  if (*(char *)(lVar38 + 2 + lVar24) == '\0') {
                    local_328 = (ulong)(iVar20 + (int)lVar38 + 2);
                    local_3a0 = img_labels.img_._16_8_;
                    local_390 = img_labels.accesses_._16_8_;
                    local_388 = local_3a0;
                    local_380 = local_390;
                    local_378 = local_390;
                    local_370 = local_3a0;
                    local_360 = lVar40;
                    local_340 = local_390;
                    local_308 = local_3a0;
                    goto LAB_0015e45c;
                  }
                  lVar1 = local_338 * lVar27 + lVar35;
                  piVar3 = (int *)(lVar1 + 0xc + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar2 = img.img_._16_8_ + lVar40 * lVar27;
                  lVar31 = lVar40 * lVar27 + lVar41;
                  if (*(char *)(lVar38 + 3 + lVar31) != '\0') break;
                  piVar3 = (int *)(lVar39 + 0xc + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_380 = img_labels.accesses_._16_8_;
                  if (*(char *)(lVar38 + 3 + lVar24) == '\0') {
                    lVar35 = *(long *)img_labels.accesses_._72_8_ * lVar18 +
                             img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar33 + lVar35);
                    *piVar3 = *piVar3 + 1;
                    lVar41 = *(long *)img_labels.img_._72_8_ * lVar18 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar33 + lVar41);
                    piVar3 = (int *)(lVar35 + lVar37 * 4 + 8 + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_328 = (ulong)(iVar20 + (int)lVar38 + 2);
                    *(undefined4 *)(lVar41 + lVar37 * 4 + 8 + lVar38 * 4) = uVar12;
                    goto LAB_0015cd89;
                  }
                  piVar3 = (int *)(lVar1 + 0x10 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar38 + 4 + lVar31) != '\0') {
                    local_328 = (ulong)(iVar20 + 2) + lVar38;
                    lVar39 = local_338 * lVar32;
                    piVar3 = (int *)(lVar35 + lVar39 + 0xc + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = lVar40 * lVar32;
                    uVar22 = lVar37 + 2 + lVar38;
                    if (*(char *)(lVar38 + 3 + lVar41 + lVar40) == '\0') {
                      lVar35 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 0x10 + lVar38 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar41 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 0x10 + lVar38 * 4);
                      piVar3 = (int *)(lVar33 + img_labels.accesses_._16_8_ + lVar35 * lVar18);
                      *piVar3 = *piVar3 + 1;
                      uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar33 + img_labels.img_._16_8_ +
                                                                         lVar41 * lVar18));
                      local_3b8 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + lVar37 * 4
                                       + 8 + lVar38 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar40 = *(long *)img_labels.img_._72_8_;
                      local_368 = img_labels.accesses_._16_8_;
                      local_340 = img_labels.accesses_._16_8_;
                      local_308 = img_labels.img_._16_8_;
                      local_310 = img_labels.accesses_._16_8_;
                      local_3c8 = (long *)img_labels.accesses_._72_8_;
                      local_3a0 = img_labels.img_._16_8_;
                      local_390 = img_labels.accesses_._16_8_;
                      local_388 = img_labels.img_._16_8_;
                      local_380 = img_labels.accesses_._16_8_;
                      local_378 = img_labels.accesses_._16_8_;
                      local_370 = img_labels.img_._16_8_;
                      local_350 = (long *)img_labels.img_._72_8_;
                      local_330 = img_labels.img_._16_8_;
                      goto LAB_0015d4ca;
                    }
                    piVar3 = (int *)(lVar35 + lVar39 + 8 + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar38 + 2 + lVar41 + lVar40) == '\0') {
                      lVar35 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 0x10 + lVar38 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar41 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 0x10 + lVar38 * 4);
                      piVar3 = (int *)(lVar33 + img_labels.accesses_._16_8_ + lVar35 * lVar18);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(lVar33 + img_labels.img_._16_8_ + lVar41 * lVar18);
                    }
                    else {
                      piVar3 = (int *)(local_338 * lVar27 + img.accesses_._16_8_ + lVar33);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar2 + lVar30) != '\0') {
                        local_370 = img_labels.img_._16_8_;
                        local_3a0 = img_labels.img_._16_8_;
                        local_390 = img_labels.accesses_._16_8_;
                        local_388 = img_labels.img_._16_8_;
                        local_340 = img_labels.accesses_._16_8_;
                        goto LAB_0015eb15;
                      }
                      lVar35 = *(long *)img_labels.accesses_._72_8_;
                      piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 0x10 + lVar38 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar41 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 0x10 + lVar38 * 4);
                      piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar35 * lVar18 + lVar30 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(img_labels.img_._16_8_ + lVar41 * lVar18 + lVar30 * 4);
                    }
                    uVar10 = RemSP::MemMerge(uVar10,uVar14);
                    local_3b8 = *(long *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + lVar37 * 4 +
                                     8 + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *(long *)img_labels.img_._72_8_;
                    local_368 = img_labels.accesses_._16_8_;
                    local_340 = img_labels.accesses_._16_8_;
                    local_308 = img_labels.img_._16_8_;
                    local_310 = img_labels.accesses_._16_8_;
                    local_3c8 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.img_._16_8_;
                    local_390 = img_labels.accesses_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_350 = (long *)img_labels.img_._72_8_;
                    local_330 = img_labels.img_._16_8_;
                    goto LAB_0015d4ca;
                  }
                  lVar40 = *(long *)img_labels.accesses_._72_8_ * lVar18 + lVar42;
                  piVar3 = (int *)(lVar40 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar39 = *(long *)img_labels.img_._72_8_ * lVar18 + lVar25;
                  uVar12 = *(undefined4 *)(lVar39 + lVar38 * 4);
                  piVar3 = (int *)(lVar40 + 8 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar39 + 8 + lVar38 * 4) = uVar12;
                  local_360 = local_360 + 0x200000000;
                  lVar38 = lVar38 + 2;
                }
                local_328 = (ulong)(iVar20 + 2) + lVar38;
                piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ +
                                 lVar37 * 4 + 8 + lVar38 * 4);
                *piVar3 = *piVar3 + 1;
                lVar40 = lVar40 * lVar32;
                if (*(char *)(lVar38 + 2 + lVar41 + lVar40) == '\0') {
                  lVar35 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 8 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar41 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 8 + lVar38 * 4);
                  piVar3 = (int *)(lVar33 + img_labels.accesses_._16_8_ + lVar35 * lVar18);
                  *piVar3 = *piVar3 + 1;
                  uVar14 = *(uint *)(lVar33 + img_labels.img_._16_8_ + lVar41 * lVar18);
LAB_0015eded:
                  uVar10 = RemSP::MemMerge(uVar10,uVar14);
                  piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                                   img_labels.accesses_._16_8_ + lVar37 * 4 + 8 + lVar38 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = *(long *)img_labels.img_._72_8_;
                  local_328 = local_328 & 0xffffffff;
                  local_308 = img_labels.img_._16_8_;
                }
                else {
                  piVar3 = (int *)(lVar33 + *(long *)img.accesses_._72_8_ * lVar27 +
                                            img.accesses_._16_8_);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar2 + lVar30) == '\0') {
                    lVar35 = *(long *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(lVar42 + lVar35 * lVar32 + 8 + lVar38 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar41 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(uint *)(lVar25 + lVar41 * lVar32 + 8 + lVar38 * 4);
                    piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar35 * lVar18 + lVar30 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar14 = *(uint *)(img_labels.img_._16_8_ + lVar41 * lVar18 + lVar30 * 4);
                    goto LAB_0015eded;
                  }
LAB_0015e977:
                  uVar21 = (ulong)(int)local_328;
                  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ +
                                   -4 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)((uVar21 - 1) + lVar40 + (long)local_320) == '\0') {
                    lVar35 = local_368 + *local_3c8 * lVar32;
                    uVar21 = (ulong)(int)local_328;
                    piVar3 = (int *)(lVar35 + -8 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_308 = local_308 + *local_350 * lVar32;
                    uVar10 = *(uint *)(local_308 + -8 + uVar21 * 4);
                    piVar3 = (int *)(lVar35 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_308 + uVar21 * 4));
                    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                                     img_labels.accesses_._16_8_ + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *(long *)img_labels.img_._72_8_;
                    local_308 = img_labels.img_._16_8_;
                  }
                  else {
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + uVar21 * 4);
                    piVar3 = (int *)(lVar35 * lVar18 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                  }
                }
LAB_0015f03d:
                *(uint *)(lVar40 * lVar18 + local_308 + uVar21 * 4) = uVar10;
                local_320 = (long *)img.img_._16_8_;
                local_398 = (long *)img.img_._72_8_;
                local_3c8 = (long *)img_labels.accesses_._72_8_;
                local_350 = (long *)img_labels.img_._72_8_;
                iVar20 = (int)local_328;
                lVar41 = (long)iVar20;
                lVar35 = lVar41 << 0x20;
                local_348 = img.accesses_._16_8_;
                lVar39 = img.accesses_._16_8_ + lVar41 * 4 + 8;
                local_318 = img_labels.accesses_._16_8_;
                lVar40 = img_labels.accesses_._16_8_ + lVar41 * 4 + 8;
                lVar42 = img_labels.img_._16_8_ + lVar41 * 4 + 8;
                lVar25 = 0;
LAB_0015f0eb:
                uVar22 = lVar41 + lVar25 + 2;
                lVar37 = lVar35 >> 0x1e;
                local_368 = img_labels.accesses_._16_8_;
                local_308 = img_labels.img_._16_8_;
                local_3a0 = img_labels.img_._16_8_;
                if (lVar15 <= (long)uVar22) {
                  local_328 = (ulong)(iVar20 + 2) + lVar25;
                  uVar10 = (uint)local_328;
                  if (local_2d0 < (int)uVar10) {
                    lVar15 = *(long *)img.accesses_._72_8_;
                    lVar40 = lVar15 * lVar18 + img.accesses_._16_8_;
                    piVar3 = (int *)((lVar35 + 0x200000000 >> 0x1e) + lVar40);
                    *piVar3 = *piVar3 + 1;
                    uVar22 = lVar35 + 0x200000000 >> 0x20;
                    lVar41 = *(long *)img.img_._72_8_;
                    lVar25 = lVar41 * lVar18 + img.img_._16_8_;
                    if (*(char *)(uVar22 + lVar25) == '\0') {
                      piVar3 = (int *)(img_labels.accesses_._16_8_ +
                                       *(long *)img_labels.accesses_._72_8_ * lVar18 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)
                       (img_labels.img_._16_8_ + lVar18 * *(long *)img_labels.img_._72_8_ +
                       uVar22 * 4) = 0;
                      goto LAB_00161044;
                    }
                    piVar3 = (int *)(lVar40 + (lVar35 + 0x100000000 >> 0x1e));
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar25 + (lVar35 + 0x100000000 >> 0x20)) != '\0') {
                      lVar32 = img_labels.accesses_._16_8_ +
                               *(long *)img_labels.accesses_._72_8_ * lVar18;
                      piVar3 = (int *)(lVar37 + lVar32);
                      *piVar3 = *piVar3 + 1;
                      lVar15 = img_labels.img_._16_8_ + lVar18 * *(long *)img_labels.img_._72_8_;
                      uVar12 = *(undefined4 *)(lVar37 + lVar15);
                      piVar3 = (int *)(lVar32 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      *(undefined4 *)(lVar15 + uVar22 * 4) = uVar12;
                      goto LAB_00161044;
                    }
                    lVar15 = lVar15 * lVar27;
                    lVar41 = lVar41 * lVar27;
                  }
                  else {
                    local_338 = *(long *)img.accesses_._72_8_;
                    uVar22 = lVar35 + 0x200000000 >> 0x20;
                    piVar3 = (int *)((lVar35 + 0x200000000 >> 0x1e) +
                                    local_338 * lVar18 + img.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    local_360 = *(ulong *)img.img_._72_8_;
                    lVar15 = local_360 * lVar18 + img.img_._16_8_;
                    if (*(char *)(uVar22 + lVar15) == '\0') {
                      local_348 = img.accesses_._16_8_;
                      goto LAB_00160d1b;
                    }
                    piVar3 = (int *)((lVar35 + 0x100000000 >> 0x1e) +
                                    *(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar15 + (lVar35 + 0x100000000 >> 0x20)) != '\0')
                    goto LAB_001601aa;
                    lVar15 = *(long *)img.accesses_._72_8_ * lVar27;
                    piVar3 = (int *)((lVar35 + 0x300000000 >> 0x1e) + img.accesses_._16_8_ + lVar15)
                    ;
                    *piVar3 = *piVar3 + 1;
                    lVar41 = *(long *)img.img_._72_8_ * lVar27;
                    if (*(char *)((lVar35 + 0x300000000 >> 0x20) + img.img_._16_8_ + lVar41) != '\0'
                       ) {
                      piVar3 = (int *)(lVar27 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_
                                      + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(img.img_._16_8_ + lVar41 + uVar22) != '\0') goto LAB_001606f0;
LAB_001606b3:
                      piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_
                                      + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(uVar22 + *(long *)img.img_._72_8_ * lVar32 + img.img_._16_8_) ==
                          '\0') {
                        lVar15 = local_368 + *local_3c8 * lVar32;
                        piVar3 = (int *)(lVar15 + -8 + (long)(int)uVar10 * 4);
                        *piVar3 = *piVar3 + 1;
                        local_3a0 = local_3a0 + lVar32 * *local_350;
                        uVar10 = *(uint *)(local_3a0 + -8 + (long)(int)uVar10 * 4);
                        piVar3 = (int *)(lVar15 + uVar22 * 4);
                        *piVar3 = *piVar3 + 1;
                        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_3a0 + uVar22 * 4));
                        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                                         img_labels.accesses_._16_8_ + uVar22 * 4);
                        *piVar3 = *piVar3 + 1;
                        *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_
                                 + uVar22 * 4) = uVar10;
                      }
                      else {
LAB_001606f0:
                        lVar15 = *local_3c8;
                        piVar3 = (int *)(lVar15 * lVar32 + local_368 + uVar22 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar27 = *local_350;
                        uVar12 = *(undefined4 *)(lVar32 * lVar27 + local_3a0 + uVar22 * 4);
                        piVar3 = (int *)(lVar15 * lVar18 + local_368 + uVar22 * 4);
                        *piVar3 = *piVar3 + 1;
LAB_00160c66:
                        *(undefined4 *)(lVar27 * lVar18 + local_3a0 + uVar22 * 4) = uVar12;
                      }
                      goto LAB_00161044;
                    }
                  }
                  piVar3 = (int *)(lVar15 + img.accesses_._16_8_ + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar15 = *(long *)img_labels.accesses_._72_8_;
                  lVar27 = lVar15 * lVar32 + img_labels.accesses_._16_8_;
                  if (*(char *)(uVar22 + lVar41 + img.img_._16_8_) == '\0') {
                    piVar3 = (int *)(lVar27 + lVar37);
                    *piVar3 = *piVar3 + 1;
                    lVar27 = *(long *)img_labels.img_._72_8_;
                    uVar12 = *(undefined4 *)(lVar37 + lVar32 * lVar27 + img_labels.img_._16_8_);
                  }
                  else {
                    piVar3 = (int *)(lVar27 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar27 = *(long *)img_labels.img_._72_8_;
                    uVar12 = *(undefined4 *)(lVar32 * lVar27 + img_labels.img_._16_8_ + uVar22 * 4);
                  }
                  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar15 * lVar18 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  goto LAB_00160c66;
                }
                local_338 = *(long *)img.accesses_._72_8_;
                lVar38 = lVar39 + local_338 * lVar18;
                piVar3 = (int *)(lVar38 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                local_360 = *(ulong *)img.img_._72_8_;
                lVar30 = local_360 * lVar18 + img.img_._16_8_ + lVar41;
                iVar36 = (int)lVar25;
                if (*(char *)(lVar25 + 2 + lVar30) == '\0') {
                  local_328 = (ulong)(iVar20 + iVar36 + 2);
                  plVar34 = (long *)img.img_._16_8_;
                  lVar41 = img.accesses_._16_8_;
                  goto LAB_0015cf99;
                }
                piVar3 = (int *)(lVar38 + -4 + lVar25 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar25 + 1 + lVar30) == '\0') {
                  lVar24 = local_338 * lVar27;
                  lVar38 = lVar39 + lVar24;
                  piVar3 = (int *)(lVar38 + 4 + lVar25 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar33 = img.img_._16_8_ + lVar41 + local_360 * lVar27;
                  if (*(char *)(lVar25 + 3 + lVar33) == '\0') {
                    lVar40 = img.accesses_._16_8_ + lVar41 * 4;
                    piVar3 = (int *)(local_338 * lVar18 + lVar40 + 0xc + lVar25 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_328 = (ulong)(iVar20 + 2) + lVar25;
                    uVar10 = (uint)local_328;
                    if (*(char *)(lVar25 + 3 + lVar30) == '\0') {
                      piVar3 = (int *)(lVar40 + lVar24 + 8 + lVar25 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar35 = *(long *)img_labels.accesses_._72_8_;
                      local_380 = img_labels.accesses_._16_8_;
                      if (*(char *)(lVar25 + 2 + lVar33) == '\0') {
                        piVar3 = (int *)(lVar35 * lVar32 + img_labels.accesses_._16_8_ + lVar37);
                        *piVar3 = *piVar3 + 1;
                        lVar40 = *(long *)img_labels.img_._72_8_;
                        uVar12 = *(undefined4 *)(lVar37 + lVar40 * lVar32 + img_labels.img_._16_8_);
                        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 + lVar35 * lVar18
                                         + 8 + lVar25 * 4);
                        *piVar3 = *piVar3 + 1;
                        *(undefined4 *)
                         (img_labels.img_._16_8_ + lVar41 * 4 + lVar40 * lVar18 + 8 + lVar25 * 4) =
                             uVar12;
                      }
                      else {
                        lVar40 = img_labels.accesses_._16_8_ + lVar41 * 4;
                        piVar3 = (int *)(lVar35 * lVar32 + lVar40 + 8 + lVar25 * 4);
                        *piVar3 = *piVar3 + 1;
                        lVar42 = *(long *)img_labels.img_._72_8_;
                        lVar41 = img_labels.img_._16_8_ + lVar41 * 4;
                        uVar12 = *(undefined4 *)(lVar42 * lVar32 + lVar41 + 8 + lVar25 * 4);
                        piVar3 = (int *)(lVar35 * lVar18 + lVar40 + 8 + lVar25 * 4);
                        *piVar3 = *piVar3 + 1;
                        *(undefined4 *)(lVar42 * lVar18 + lVar41 + 8 + lVar25 * 4) = uVar12;
                      }
                      goto LAB_0015cd89;
                    }
                    piVar3 = (int *)(img.accesses_._16_8_ + lVar24 + (lVar35 + 0x400000000 >> 0x1e))
                    ;
                    *piVar3 = *piVar3 + 1;
                    cVar28 = *(char *)(local_360 * lVar27 + img.img_._16_8_ +
                                      (lVar35 + 0x400000000 >> 0x20));
                    piVar3 = (int *)(lVar40 + lVar24 + 8 + lVar25 * 4);
                    *piVar3 = *piVar3 + 1;
                    cVar5 = *(char *)(lVar25 + 2 + lVar33);
                    if (cVar28 == '\0') {
                      local_3b8 = *(long *)img_labels.accesses_._72_8_;
                      local_330 = img_labels.img_._16_8_;
                      if (cVar5 == '\0') {
                        piVar3 = (int *)(local_3b8 * lVar32 + img_labels.accesses_._16_8_ + lVar37);
                        *piVar3 = *piVar3 + 1;
                        lVar40 = *(long *)img_labels.img_._72_8_;
                        uVar14 = *(uint *)(lVar37 + lVar40 * lVar32 + img_labels.img_._16_8_);
                        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 +
                                         local_3b8 * lVar18 + 8 + lVar25 * 4);
                        *piVar3 = *piVar3 + 1;
                        goto LAB_0015e1b0;
                      }
                      piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar41 * 4 + local_3b8 * lVar32
                                       + 8 + lVar25 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar40 = *(long *)img_labels.img_._72_8_;
                      local_370 = img_labels.img_._16_8_;
                      local_340 = img_labels.accesses_._16_8_;
                      local_388 = img_labels.img_._16_8_;
                      local_380 = img_labels.accesses_._16_8_;
                      local_390 = img_labels.accesses_._16_8_;
                      local_378 = img_labels.accesses_._16_8_;
                      goto LAB_0015d243;
                    }
                    if (cVar5 != '\0') goto LAB_0015d127;
                    local_330 = img_labels.img_._16_8_;
                    local_388 = img_labels.img_._16_8_;
LAB_0015f932:
                    uVar22 = (ulong)(int)local_328;
                    local_348 = local_338 * lVar32 + local_348;
                    piVar3 = (int *)(local_348 + 4 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar35 = local_360 * lVar32 + (long)local_320;
                    if (*(char *)(uVar22 + 1 + lVar35) == '\0') {
                      lVar35 = local_368 + *local_3c8 * lVar32;
                      uVar22 = (ulong)(int)local_328;
                      piVar3 = (int *)(lVar35 + -8 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_388 = local_388 + *local_350 * lVar32;
                      uVar10 = *(uint *)(local_388 + -8 + uVar22 * 4);
                      piVar3 = (int *)(lVar35 + 8 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(local_388 + 8 + uVar22 * 4);
                      goto LAB_0015d44c;
                    }
                    piVar3 = (int *)(local_348 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_3b8 = *local_3c8;
                    lVar41 = local_3b8 * lVar32 + local_368;
                    if (*(char *)(lVar35 + uVar22) == '\0') {
                      piVar3 = (int *)(lVar41 + -8 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_388 = local_388 + *local_350 * lVar32;
                      uVar10 = *(uint *)(local_388 + -8 + uVar22 * 4);
                      piVar3 = (int *)(lVar41 + 8 + uVar22 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(local_388 + 8 + uVar22 * 4);
                      goto LAB_0015d44c;
                    }
                    piVar3 = (int *)(lVar41 + 8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_388 + 8 + uVar22 * 4);
                    piVar3 = (int *)(local_3b8 * lVar18 + local_368 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_340 = local_368;
                    local_308 = local_388;
                    local_310 = local_318;
                    local_3a0 = local_388;
                    local_390 = local_368;
                    local_380 = local_368;
                    local_378 = local_368;
                    local_370 = local_388;
                    goto LAB_0015d4ca;
                  }
                  piVar3 = (int *)(lVar38 + lVar25 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar25 + 2 + lVar33) != '\0') goto code_r0x0015f18d;
                  local_328 = (ulong)(iVar20 + iVar36 + 2);
                  uVar22 = lVar35 + 0x200000000 >> 0x20;
LAB_0015f510:
                  piVar3 = (int *)(local_338 * lVar32 + local_348 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar21 = uVar22;
                  if (*(char *)(uVar22 + local_360 * lVar32 + (long)local_320) == '\0') {
                    lVar35 = local_368 + *local_3c8 * lVar32;
                    piVar3 = (int *)(lVar35 + -8 + (long)(int)local_328 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_3a0 = local_3a0 + *local_350 * lVar32;
                    uVar10 = *(uint *)(local_3a0 + -8 + (long)(int)local_328 * 4);
                    piVar3 = (int *)(lVar35 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar14 = *(uint *)(local_3a0 + uVar22 * 4);
LAB_0015f796:
                    uVar10 = RemSP::MemMerge(uVar10,uVar14);
                    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                                     img_labels.accesses_._16_8_ + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *(long *)img_labels.img_._72_8_;
                    local_308 = img_labels.img_._16_8_;
                  }
                  else {
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_368 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_3a0 + uVar22 * 4);
                    piVar3 = (int *)(lVar35 * lVar18 + local_368 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_308 = local_3a0;
                  }
                  goto LAB_0015f03d;
                }
                local_328 = (ulong)(iVar20 + iVar36 + 2);
                local_330 = img_labels.img_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_340 = img_labels.accesses_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_390 = img_labels.accesses_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
LAB_0015f28d:
                iVar20 = (int)local_328;
                uVar21 = (ulong)iVar20;
                lVar35 = local_338 * lVar27 + local_348;
                piVar3 = (int *)(lVar35 + 4 + uVar21 * 4);
                *piVar3 = *piVar3 + 1;
                lVar41 = local_360 * lVar27 + (long)local_320;
                if (*(char *)(uVar21 + 1 + lVar41) != '\0') {
                  piVar3 = (int *)(lVar35 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar41 + uVar21) == '\0') {
                    piVar3 = (int *)(local_348 + local_338 * lVar32 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    cVar28 = *(char *)(uVar21 + (long)local_320 + local_360 * lVar32);
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + uVar21 * 4);
                    if (cVar28 == '\0') {
                      piVar3 = (int *)(local_368 + lVar35 * lVar18 + -8 + uVar21 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar14 = *(uint *)(local_308 + lVar40 * lVar18 + -8 + uVar21 * 4);
                      goto LAB_0015f796;
                    }
                    piVar3 = (int *)(local_368 + lVar35 * lVar18 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                  }
                  else {
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + uVar21 * 4);
                    piVar3 = (int *)(lVar35 * lVar18 + local_368 + uVar21 * 4);
                    *piVar3 = *piVar3 + 1;
                  }
                  goto LAB_0015f03d;
                }
                piVar3 = (int *)(local_338 * lVar18 + local_348 + 4 + uVar21 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(uVar21 + 1 + local_360 * lVar18 + (long)local_320) == '\0') {
                  lVar35 = *local_3c8 * lVar18 + local_390;
                  lVar41 = (long)iVar20;
                  piVar3 = (int *)(lVar35 + -8 + lVar41 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = *local_350 * lVar18 + local_3a0;
                  uVar12 = *(undefined4 *)(lVar40 + -8 + lVar41 * 4);
                  piVar3 = (int *)(lVar35 + lVar41 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar40 + lVar41 * 4) = uVar12;
                  local_380 = local_390;
                  local_308 = local_3a0;
                  goto LAB_0015cd89;
                }
                uVar22 = (ulong)iVar20;
                piVar3 = (int *)(lVar35 + 8 + uVar22 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar41 + 2 + uVar22) != '\0') {
                  local_348 = local_348 + local_338 * lVar32;
                  piVar3 = (int *)(local_348 + 4 + uVar21 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = (long)local_320 + local_360 * lVar32;
                  if (*(char *)(uVar21 + 1 + lVar40) == '\0') {
                    lVar35 = *local_3c8;
                    piVar3 = (int *)(lVar35 * lVar32 + local_390 + 8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar41 = *local_350;
                    uVar10 = *(uint *)(lVar41 * lVar32 + local_3a0 + 8 + uVar22 * 4);
                    piVar3 = (int *)(lVar35 * lVar18 + local_390 + -8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar41 * lVar18 + local_3a0 + -8 +
                                                             uVar22 * 4));
                    local_3b8 = *(long *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *(long *)img_labels.img_._72_8_;
                    local_368 = img_labels.accesses_._16_8_;
                    local_340 = img_labels.accesses_._16_8_;
                    local_308 = img_labels.img_._16_8_;
                    local_310 = img_labels.accesses_._16_8_;
                    local_3c8 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.img_._16_8_;
                    local_390 = img_labels.accesses_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_350 = (long *)img_labels.img_._72_8_;
                    local_330 = img_labels.img_._16_8_;
                    goto LAB_0015d4ca;
                  }
                  piVar3 = (int *)(lVar35 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar41 + uVar22) != '\0') {
                    piVar3 = (int *)(local_368 + *local_3c8 * lVar32 + 8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = *(uint *)(local_308 + *local_350 * lVar32 + 8 + uVar22 * 4);
                    local_3b8 = *local_3c8;
                    piVar3 = (int *)(local_3b8 * lVar18 + local_378 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    local_368 = local_378;
                    local_340 = local_340;
                    local_310 = local_318;
                    goto LAB_0015d4ca;
                  }
                  piVar3 = (int *)(local_348 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar40 + uVar22) != '\0') {
                    piVar3 = (int *)(local_378 + *local_3c8 * lVar32 + 8 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = *(uint *)(local_308 + *local_350 * lVar32 + 8 + uVar22 * 4);
                    local_3b8 = *local_3c8;
                    piVar3 = (int *)(local_3b8 * lVar18 + local_390 + uVar22 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar40 = *local_350;
                    local_378 = local_390;
                    local_368 = local_390;
                    local_340 = local_340;
                    local_308 = local_3a0;
                    local_310 = local_318;
                    goto LAB_0015d4ca;
                  }
                  lVar35 = *local_3c8;
                  piVar3 = (int *)(lVar35 * lVar32 + local_390 + 8 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar41 = *local_350;
                  uVar10 = *(uint *)(lVar41 * lVar32 + local_3a0 + 8 + uVar22 * 4);
                  piVar3 = (int *)(lVar35 * lVar18 + local_390 + -8 + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar41 * lVar18 + local_3a0 + -8 +
                                                           uVar22 * 4));
                  local_3b8 = *(long *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar40 = *(long *)img_labels.img_._72_8_;
                  goto LAB_0015fc43;
                }
                local_390 = local_390 + *local_3c8 * lVar18;
                lVar35 = (long)iVar20;
                piVar3 = (int *)(local_390 + -8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                local_3a0 = local_3a0 + *local_350 * lVar18;
                uVar12 = *(undefined4 *)(local_3a0 + -8 + lVar35 * 4);
                piVar3 = (int *)(local_390 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(local_3a0 + lVar35 * 4) = uVar12;
              } while( true );
            }
            lVar35 = *local_3c8 * lVar18 + local_380;
            piVar3 = (int *)(lVar35 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = *local_350 * lVar18 + local_388;
            uVar12 = *(undefined4 *)(lVar41 + lVar25 * 4);
            piVar3 = (int *)(lVar35 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(lVar41 + 8 + lVar25 * 4) = uVar12;
            local_328 = uVar22 & 0xffffffff;
            local_308 = local_388;
            goto LAB_0015cd89;
          }
          if (local_2d0 < (int)uVar22) {
LAB_0015fcfa:
            lVar15 = (long)(int)uVar22;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_ +
                            lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar15 + *local_398 * lVar18 + (long)local_320) == '\0') {
              piVar3 = (int *)(local_368 + *local_3c8 * lVar18 + lVar15 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(local_308 + lVar18 * *local_350 + lVar15 * 4) = 0;
            }
            else {
              lVar32 = local_368 + *local_3c8 * lVar18;
              piVar3 = (int *)(lVar32 + -8 + lVar15 * 4);
              *piVar3 = *piVar3 + 1;
              local_308 = local_308 + lVar18 * *local_350;
              uVar12 = *(undefined4 *)(local_308 + -8 + lVar15 * 4);
              piVar3 = (int *)(lVar32 + lVar15 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(local_308 + lVar15 * 4) = uVar12;
            }
            goto LAB_00161044;
          }
          piVar3 = (int *)(local_338 * lVar18 + local_348 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar25 + 2 + local_360 * lVar18 + (long)local_320) == '\0') {
            lVar15 = local_360 * lVar18;
            uVar21 = local_360;
LAB_001603b4:
            lVar35 = (long)(int)uVar22;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_ + 4 +
                            lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + 1 + lVar15 + (long)local_320) == '\0') {
              piVar3 = (int *)(local_368 + *local_3c8 * lVar18 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(local_308 + lVar18 * *local_350 + lVar35 * 4) = 0;
              goto LAB_00161044;
            }
            piVar3 = (int *)(lVar27 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 +
                            lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + 1 + (long)local_320 + uVar21 * lVar27) != '\0') {
              lVar15 = *local_3c8;
              piVar3 = (int *)(lVar15 * lVar32 + local_368 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = *local_350;
              uVar12 = *(undefined4 *)(lVar32 * lVar27 + local_308 + lVar35 * 4);
              piVar3 = (int *)(lVar15 * lVar18 + local_368 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
LAB_0016044a:
              local_330 = lVar27 * lVar18 + local_308;
              goto LAB_0016044d;
            }
            uVar10 = RemSP::MemNewLabel();
          }
          else {
            piVar3 = (int *)(local_338 * lVar27 + local_348 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar25 + 3 + lVar27 * local_360 + (long)local_320) == '\0') {
              piVar3 = (int *)(lVar35 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(lVar41 + lVar25 * 4);
              piVar3 = (int *)(lVar35 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar41 + 8 + lVar25 * 4) = uVar12;
              goto LAB_00161044;
            }
            piVar3 = (int *)(local_348 + local_338 * lVar32 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            local_330 = local_308;
            if (*(char *)(lVar25 + 2 + (long)local_320 + local_360 * lVar32) == '\0') {
              piVar3 = (int *)(local_368 + local_3b8 * lVar32 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar14 = *(uint *)(local_308 + lVar42 + 8 + lVar25 * 4);
              piVar3 = (int *)(lVar35 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)(lVar41 + lVar25 * 4);
LAB_00161003:
              uVar10 = RemSP::MemMerge(uVar14,uVar10);
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                               img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + 8 +
                       lVar25 * 4) = uVar10;
              goto LAB_00161044;
            }
LAB_00160053:
            lVar35 = (long)(int)uVar22;
            piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + -4 +
                            lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + -1 + *(long *)img.img_._72_8_ * lVar32 + img.img_._16_8_) != '\0'
               ) {
              lVar15 = *local_3c8;
              piVar3 = (int *)(lVar15 * lVar32 + local_368 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              lVar27 = *local_350;
              uVar12 = *(undefined4 *)(lVar32 * lVar27 + local_330 + lVar35 * 4);
              piVar3 = (int *)(lVar15 * lVar18 + local_368 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              local_330 = lVar27 * lVar18 + local_330;
LAB_0016044d:
              *(undefined4 *)(local_330 + lVar35 * 4) = uVar12;
              goto LAB_00161044;
            }
            lVar15 = local_368 + *local_3c8 * lVar32;
            piVar3 = (int *)(lVar15 + -8 + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            local_330 = local_330 + lVar32 * *local_350;
            uVar10 = *(uint *)(local_330 + -8 + lVar35 * 4);
            piVar3 = (int *)(lVar15 + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            uVar14 = *(uint *)(local_330 + lVar35 * 4);
LAB_00160ef2:
            uVar10 = RemSP::MemMerge(uVar10,uVar14);
          }
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                           img_labels.accesses_._16_8_ + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + lVar35 * 4)
               = uVar10;
          goto LAB_00161044;
        }
        piVar3 = (int *)(img.accesses_._16_8_ + lVar39 + 8 + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(img.img_._16_8_ + lVar42 + 2 + lVar35) == '\0') {
          uVar10 = RemSP::MemNewLabel();
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                           img_labels.accesses_._16_8_ + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * lVar18 + img_labels.img_._16_8_ + 8 +
                   lVar35 * 4) = uVar10;
          local_328 = local_328 & 0xffffffff;
          local_380 = img_labels.accesses_._16_8_;
          local_308 = img_labels.img_._16_8_;
        }
        else {
          lVar41 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar41 * lVar32 + local_380 + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          lVar40 = *(long *)img_labels.img_._72_8_;
          uVar12 = *(undefined4 *)(lVar40 * lVar32 + local_308 + 8 + lVar35 * 4);
          piVar3 = (int *)(lVar41 * lVar18 + local_380 + 8 + lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar40 * lVar18 + local_308 + 8 + lVar35 * 4) = uVar12;
          local_328 = local_328 & 0xffffffff;
        }
        goto LAB_0015cd89;
      }
      local_338 = *(long *)img.accesses_._72_8_;
      local_348 = img.accesses_._16_8_;
      piVar3 = (int *)(local_338 * lVar18 + img.accesses_._16_8_ + 8 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      local_360 = *(ulong *)img.img_._72_8_;
      cVar28 = *(char *)(lVar35 + 2 + local_360 * lVar18 + img.img_._16_8_);
      local_320 = (long *)img.img_._16_8_;
      if (local_2d0 < (int)local_328) {
        if (cVar28 == '\0') {
          piVar3 = (int *)(local_380 + *(long *)img_labels.accesses_._72_8_ * lVar18 + 8 +
                          lVar35 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(local_308 + lVar18 * *(long *)img_labels.img_._72_8_ + 8 + lVar35 * 4) = 0
          ;
          goto LAB_00161044;
        }
        local_338 = local_338 * lVar27;
        lVar27 = local_360 * lVar27;
LAB_00160d74:
        piVar3 = (int *)(local_338 + local_348 + local_328 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(local_328 + lVar27 + (long)local_320) == '\0') {
          uVar10 = RemSP::MemNewLabel();
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                           img_labels.accesses_._16_8_ + local_328 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ +
                   local_328 * 4) = uVar10;
          goto LAB_00161044;
        }
      }
      else {
        if (cVar28 == '\0') {
          local_328 = local_328 & 0xffffffff;
LAB_00160d1b:
          lVar15 = (long)(int)local_328;
          piVar3 = (int *)(local_338 * lVar18 + local_348 + 4 + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar15 + 1 + local_360 * lVar18 + (long)local_320) == '\0') {
            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                             img_labels.accesses_._16_8_ + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)
             (lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + lVar15 * 4) = 0;
            goto LAB_00161044;
          }
          lVar15 = lVar15 + 1;
          local_328 = local_328 & 0xffffffff;
        }
        else {
          lVar15 = (long)(iVar20 + 3);
        }
        local_338 = local_338 * lVar27;
        piVar3 = (int *)(local_348 + local_338 + lVar15 * 4);
        *piVar3 = *piVar3 + 1;
        lVar27 = local_360 * lVar27;
        local_328 = (ulong)(int)local_328;
        if (*(char *)(lVar15 + (long)local_320 + lVar27) == '\0') goto LAB_00160d74;
      }
      lVar15 = *(long *)img_labels.accesses_._72_8_;
      piVar3 = (int *)(lVar15 * lVar32 + img_labels.accesses_._16_8_ + local_328 * 4);
      *piVar3 = *piVar3 + 1;
      lVar27 = *(long *)img_labels.img_._72_8_;
      uVar12 = *(undefined4 *)(lVar32 * lVar27 + img_labels.img_._16_8_ + local_328 * 4);
      piVar3 = (int *)(lVar15 * lVar18 + img_labels.accesses_._16_8_ + local_328 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(lVar27 * lVar18 + img_labels.img_._16_8_ + local_328 * 4) = uVar12;
    }
    goto LAB_00161044;
  }
  uVar22 = 0xfffffffffffffffe;
LAB_00152bcb:
  lVar15 = (long)(int)uVar22;
  uVar22 = lVar15 + 2;
  if ((int)uVar22 < local_2d0) {
    piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar15 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(img.img_._16_8_ + 2 + lVar15) == '\0') goto LAB_00152c2c;
    piVar3 = (int *)(img.accesses_._16_8_ + 0xc + lVar15 * 4);
    *piVar3 = *piVar3 + 1;
    cVar28 = *(char *)(img.img_._16_8_ + 3 + lVar15);
    uVar10 = RemSP::MemNewLabel();
    piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar15 * 4);
    *piVar3 = *piVar3 + 1;
    *(uint *)(img_labels.img_._16_8_ + 8 + lVar15 * 4) = uVar10;
    if (cVar28 != '\0') {
      while( true ) {
        lVar15 = uVar22 << 0x20;
        while( true ) {
          uVar22 = uVar22 + 2;
          lVar18 = lVar15 >> 0x1e;
          if ((long)local_2d0 <= (long)uVar22) {
            if (local_2d0 < (int)uVar22) {
              piVar3 = (int *)(img.accesses_._16_8_ + (lVar15 + 0x200000000 >> 0x1e));
              *piVar3 = *piVar3 + 1;
              lVar32 = lVar15 + 0x200000000 >> 0x20;
              if (*(char *)(img.img_._16_8_ + lVar32) == '\0') {
                piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(img_labels.img_._16_8_ + lVar32 * 4) = 0;
                goto LAB_00161044;
              }
            }
            else {
              piVar3 = (int *)(img.accesses_._16_8_ + (lVar15 + 0x200000000 >> 0x1e));
              *piVar3 = *piVar3 + 1;
              lVar32 = lVar15 + 0x200000000 >> 0x20;
              if (*(char *)(img.img_._16_8_ + lVar32) == '\0') goto LAB_001604a8;
              piVar3 = (int *)(img.accesses_._16_8_ + (lVar15 + 0x300000000 >> 0x1e));
              *piVar3 = *piVar3 + 1;
            }
            *(int *)(img_labels.accesses_._16_8_ + lVar18) =
                 *(int *)(img_labels.accesses_._16_8_ + lVar18) + 1;
            uVar12 = *(undefined4 *)(img_labels.img_._16_8_ + lVar18);
            piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar32 * 4) = uVar12;
            goto LAB_00161044;
          }
          piVar3 = (int *)(img.accesses_._16_8_ + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(img.img_._16_8_ + uVar22) == '\0') break;
          piVar3 = (int *)(img.accesses_._16_8_ + 4 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(img.img_._16_8_ + 1 + uVar22) == '\0') {
            *(int *)(img_labels.accesses_._16_8_ + lVar18) =
                 *(int *)(img_labels.accesses_._16_8_ + lVar18) + 1;
            uVar12 = *(undefined4 *)(img_labels.img_._16_8_ + lVar18);
            piVar3 = (int *)(img_labels.accesses_._16_8_ + uVar22 * 4);
            *piVar3 = *piVar3 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + uVar22 * 4) = uVar12;
            goto LAB_00152bcb;
          }
          piVar3 = (int *)(img_labels.accesses_._16_8_ + -8 + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          uVar12 = *(undefined4 *)(img_labels.img_._16_8_ + -8 + uVar22 * 4);
          piVar3 = (int *)(img_labels.accesses_._16_8_ + uVar22 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(img_labels.img_._16_8_ + uVar22 * 4) = uVar12;
          lVar15 = lVar15 + 0x200000000;
        }
LAB_00152c2c:
        iVar20 = (int)uVar22;
        uVar21 = (ulong)iVar20;
        piVar3 = (int *)(img.accesses_._16_8_ + 4 + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(img.img_._16_8_ + 1 + uVar21) == '\0') break;
        uVar10 = RemSP::MemNewLabel();
        piVar3 = (int *)(img_labels.accesses_._16_8_ + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(img_labels.img_._16_8_ + uVar21 * 4) = uVar10;
        uVar22 = uVar21;
      }
      piVar3 = (int *)(img_labels.accesses_._16_8_ + (long)iVar20 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + (long)iVar20 * 4) = 0;
      uVar22 = uVar22 & 0xffffffff;
    }
    goto LAB_00152bcb;
  }
  piVar3 = (int *)(img.accesses_._16_8_ + 8 + lVar15 * 4);
  *piVar3 = *piVar3 + 1;
  cVar28 = *(char *)(img.img_._16_8_ + 2 + lVar15);
  if (local_2d0 < (int)uVar22) {
    if (cVar28 == '\0') {
      piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar15 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar15 * 4) = 0;
      goto LAB_00161044;
    }
  }
  else {
    if (cVar28 == '\0') {
LAB_001604a8:
      lVar35 = (long)(int)uVar22;
      piVar3 = (int *)(img.accesses_._16_8_ + 4 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(img.img_._16_8_ + 1 + lVar35) == '\0') {
        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        *(undefined4 *)(img_labels.img_._16_8_ + lVar35 * 4) = 0;
      }
      else {
        uVar10 = RemSP::MemNewLabel();
        piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar35 * 4);
        *piVar3 = *piVar3 + 1;
        lVar15 = img_labels.img_._16_8_;
LAB_001604ce:
        *(uint *)(lVar15 + lVar35 * 4) = uVar10;
      }
      goto LAB_00161044;
    }
    piVar3 = (int *)(img.accesses_._16_8_ + 0xc + lVar15 * 4);
    *piVar3 = *piVar3 + 1;
  }
  uVar10 = RemSP::MemNewLabel();
  piVar3 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar15 * 4);
  *piVar3 = *piVar3 + 1;
  *(uint *)(img_labels.img_._16_8_ + 8 + lVar15 * 4) = uVar10;
LAB_00161044:
  uVar10 = RemSP::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  local_398 = (long *)0x1;
  __arg = (void *)0x0;
  do {
    piVar8 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (lVar17 <= (long)__arg) {
      local_100 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,4,&local_100,
                 &local_10d);
      pvVar9 = local_108;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (local_108,&local_f0);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0);
      dVar43 = MemMat<unsigned_char>::GetTotalAccesses(&img);
      *(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start =
           (long)(dVar43 - 9.223372036854776e+18) & (long)dVar43 >> 0x3f | (long)dVar43;
      dVar43 = MemMat<int>::GetTotalAccesses(&img_labels);
      (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[1] =
           (long)dVar43 >> 0x3f & (long)(dVar43 - 9.223372036854776e+18) | (long)dVar43;
      dVar43 = RemSP::MemTotalAccesses();
      __child_stack =
           (void *)((long)dVar43 >> 0x3f & (long)(dVar43 - 9.223372036854776e+18) | (long)dVar43);
      (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
      cv::Mat_<int>::clone
                (&local_f0,(__fn *)&img_labels.img_,__child_stack,
                 (int)(long)(dVar43 - 9.223372036854776e+18),__arg);
      cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,&local_f0.super_Mat);
      cv::Mat::~Mat(&local_f0.super_Mat);
      MemMat<int>::~MemMat(&img_labels);
      MemMat<unsigned_char>::~MemMat(&img);
      return;
    }
    uVar22 = (ulong)__arg | 1;
    for (lVar15 = 0; lVar15 < lVar26; lVar15 = lVar15 + 2) {
      lVar18 = *(long *)img_labels.accesses_._72_8_;
      lVar27 = (long)__arg * lVar18 + img_labels.accesses_._16_8_;
      iVar20 = *(int *)(lVar27 + lVar15 * 4);
      *(int *)(lVar27 + lVar15 * 4) = iVar20 + 1;
      lVar32 = *(long *)img_labels.img_._72_8_;
      lVar35 = (long)__arg * lVar32 + img_labels.img_._16_8_;
      lVar41 = (long)*(int *)(lVar35 + lVar15 * 4);
      if (lVar41 < 1) {
        *(int *)(lVar27 + lVar15 * 4) = iVar20 + 2;
        *(undefined4 *)(lVar35 + lVar15 * 4) = 0;
        if (lVar15 + 1 < lVar26) {
          piVar3 = (int *)(lVar27 + 4 + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar35 + 4 + lVar15 * 4) = 0;
          if ((long)uVar22 < lVar17) {
            lVar27 = lVar18 * (long)local_398 + img_labels.accesses_._16_8_;
            piVar3 = (int *)(lVar27 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = lVar32 * (long)local_398 + img_labels.img_._16_8_;
            *(undefined4 *)(lVar18 + lVar15 * 4) = 0;
            piVar3 = (int *)(lVar27 + 4 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
LAB_001612a4:
            *(undefined4 *)(lVar18 + 4 + lVar15 * 4) = 0;
          }
        }
        else if ((long)uVar22 < lVar17) {
          piVar3 = (int *)(lVar18 * (long)local_398 + img_labels.accesses_._16_8_ + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = lVar32 * (long)local_398 + img_labels.img_._16_8_;
LAB_0016132e:
          *(undefined4 *)(lVar18 + lVar15 * 4) = 0;
        }
      }
      else {
        piVar8[lVar41] = piVar8[lVar41] + 1;
        uVar10 = puVar7[lVar41];
        lVar41 = *(long *)img.accesses_._72_8_;
        lVar42 = (long)__arg * lVar41 + img.accesses_._16_8_;
        piVar3 = (int *)(lVar42 + lVar15 * 4);
        *piVar3 = *piVar3 + 1;
        lVar40 = *(long *)img.img_._72_8_;
        lVar25 = (long)__arg * lVar40 + img.img_._16_8_;
        uVar14 = uVar10;
        if (*(char *)(lVar15 + lVar25) == '\0') {
          uVar14 = 0;
        }
        piVar3 = (int *)(lVar27 + lVar15 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(lVar35 + lVar15 * 4) = uVar14;
        if (lVar15 + 1 < lVar26) {
          piVar3 = (int *)(lVar42 + 4 + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          uVar14 = uVar10;
          if (*(char *)(lVar15 + 1 + lVar25) == '\0') {
            uVar14 = 0;
          }
          piVar3 = (int *)(lVar27 + 4 + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          *(uint *)(lVar35 + 4 + lVar15 * 4) = uVar14;
          if ((long)uVar22 < lVar17) {
            lVar35 = lVar41 * (long)local_398 + img.accesses_._16_8_;
            piVar3 = (int *)(lVar35 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = lVar40 * (long)local_398 + img.img_._16_8_;
            lVar27 = lVar18 * (long)local_398 + img_labels.accesses_._16_8_;
            uVar14 = uVar10;
            if (*(char *)(lVar15 + lVar41) == '\0') {
              uVar14 = 0;
            }
            piVar3 = (int *)(lVar27 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = lVar32 * (long)local_398 + img_labels.img_._16_8_;
            *(uint *)(lVar18 + lVar15 * 4) = uVar14;
            piVar3 = (int *)(lVar35 + 4 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            cVar28 = *(char *)(lVar15 + 1 + lVar41);
            piVar3 = (int *)(lVar27 + 4 + lVar15 * 4);
            *piVar3 = *piVar3 + 1;
            if (cVar28 == '\0') goto LAB_001612a4;
            *(uint *)(lVar18 + 4 + lVar15 * 4) = uVar10;
          }
        }
        else if ((long)uVar22 < lVar17) {
          piVar3 = (int *)(lVar41 * (long)local_398 + img.accesses_._16_8_ + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          cVar28 = *(char *)(lVar15 + lVar40 * (long)local_398 + img.img_._16_8_);
          piVar3 = (int *)(lVar18 * (long)local_398 + img_labels.accesses_._16_8_ + lVar15 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = lVar32 * (long)local_398 + img_labels.img_._16_8_;
          if (cVar28 == '\0') goto LAB_0016132e;
          *(uint *)(lVar18 + lVar15 * 4) = uVar10;
        }
      }
    }
    __arg = (void *)((long)__arg + 2);
    local_398 = (long *)((long)local_398 + 2);
  } while( true );
LAB_0015e1b0:
  lVar35 = lVar40 * lVar18 + local_308;
  *(uint *)(lVar35 + uVar22 * 4) = uVar14;
  lVar25 = (long)(int)uVar10;
  uVar22 = lVar25 + 2;
  local_320 = (long *)img.img_._16_8_;
  if (local_2d0 <= (int)uVar22) {
    local_398 = (long *)img.img_._72_8_;
    if (local_2d0 < (int)uVar22) goto LAB_0015fcfa;
    lVar41 = *(long *)img.accesses_._72_8_;
    piVar3 = (int *)(lVar41 * lVar18 + img.accesses_._16_8_ + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar21 = *(ulong *)img.img_._72_8_;
    lVar15 = uVar21 * lVar18;
    if (*(char *)(lVar25 + 2 + img.img_._16_8_ + lVar15) == '\0') goto LAB_001603b4;
    piVar3 = (int *)(img.accesses_._16_8_ + lVar41 * lVar27 + 0xc + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar25 + 3 + img.img_._16_8_ + uVar21 * lVar27) != '\0') {
      piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      uVar14 = *(uint *)(local_308 + lVar40 * lVar32 + 8 + lVar25 * 4);
      piVar3 = (int *)(local_3b8 * lVar18 + local_368 + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      uVar10 = *(uint *)(lVar35 + lVar25 * 4);
      goto LAB_00161003;
    }
    lVar15 = local_368 + local_3b8 * lVar18;
    piVar3 = (int *)(lVar15 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar12 = *(undefined4 *)(lVar35 + lVar25 * 4);
    piVar3 = (int *)(lVar15 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
LAB_00160ecc:
    *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = uVar12;
    goto LAB_00161044;
  }
  local_338 = *(long *)img.accesses_._72_8_;
  lVar41 = local_338 * lVar18 + img.accesses_._16_8_;
  piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  local_360 = *(ulong *)img.img_._72_8_;
  lVar42 = local_360 * lVar18 + img.img_._16_8_;
  if (*(char *)(lVar25 + 2 + lVar42) == '\0') {
    local_398 = (long *)img.img_._72_8_;
    local_340 = local_368;
    local_380 = local_368;
    local_390 = local_368;
    local_378 = local_368;
    local_328 = uVar22 & 0xffffffff;
    local_348 = img.accesses_._16_8_;
    local_3a0 = local_308;
    local_388 = local_308;
    local_370 = local_308;
LAB_0015e45c:
    uVar10 = (uint)local_328;
    uVar22 = (ulong)(int)uVar10;
    piVar3 = (int *)(local_338 * lVar18 + local_348 + 4 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    plVar34 = local_320;
    lVar41 = local_348;
    if (*(char *)(uVar22 + 1 + local_360 * lVar18 + (long)local_320) == '\0') {
      local_3b8 = *local_3c8;
      uVar22 = (ulong)(int)uVar10;
      piVar3 = (int *)(local_3b8 * lVar18 + local_318 + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      local_3a0 = local_330;
      local_368 = local_318;
      goto LAB_0015dd31;
    }
    lVar40 = local_338 * lVar27 + local_348;
    piVar3 = (int *)(lVar40 + 4 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar35 = local_360 * lVar27 + (long)local_320;
    if (*(char *)(uVar22 + 1 + lVar35) == '\0') {
      uVar22 = (ulong)(int)uVar10;
      piVar3 = (int *)(lVar40 + 8 + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar35 + 2 + uVar22) != '\0') {
        local_3b8 = *local_3c8;
        piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + uVar22 * 4);
        *piVar3 = *piVar3 + 1;
        lVar40 = *local_350;
        uVar10 = *(uint *)(lVar40 * lVar32 + local_308 + 8 + uVar22 * 4);
        piVar3 = (int *)(local_3b8 * lVar18 + local_368 + uVar22 * 4);
        *piVar3 = *piVar3 + 1;
        local_340 = local_340;
        local_308 = local_308;
        local_310 = local_318;
        goto LAB_0015d4ca;
      }
      uVar14 = RemSP::MemNewLabel();
      local_3b8 = *(long *)img_labels.accesses_._72_8_;
      uVar22 = (ulong)(int)uVar10;
      piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
LAB_0015e692:
      local_330 = img_labels.img_._16_8_;
      local_350 = (long *)img_labels.img_._72_8_;
      lVar40 = *(long *)img_labels.img_._72_8_;
      local_308 = img_labels.img_._16_8_;
      local_3c8 = (long *)img_labels.accesses_._72_8_;
      local_368 = img_labels.accesses_._16_8_;
      local_318 = img_labels.accesses_._16_8_;
      goto LAB_0015e1b0;
    }
    local_3b8 = *local_3c8;
    piVar3 = (int *)(local_3b8 * lVar32 + local_368 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar40 = *local_350;
    lVar37 = local_368;
LAB_0015e513:
    while( true ) {
      uVar12 = *(undefined4 *)(lVar40 * lVar32 + local_308 + uVar22 * 4);
      piVar3 = (int *)(local_3b8 * lVar18 + lVar37 + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(lVar40 * lVar18 + local_308 + uVar22 * 4) = uVar12;
      lVar35 = (long)(int)local_328;
      uVar10 = (int)local_328 + 2;
      local_328 = (ulong)uVar10;
      if (local_2d0 <= (int)uVar10) break;
      piVar3 = (int *)(local_338 * lVar18 + local_348 + 8 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      plVar34 = local_320;
      lVar41 = local_348;
      if (*(char *)(lVar35 + 2 + local_360 * lVar18 + (long)local_320) != '\0') goto LAB_0015f28d;
LAB_0015cf99:
      while( true ) {
        uVar10 = (uint)local_328;
        uVar22 = (ulong)(int)uVar10;
        piVar3 = (int *)(local_338 * lVar18 + lVar41 + 4 + uVar22 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(uVar22 + 1 + local_360 * lVar18 + (long)plVar34) != '\0') break;
        local_3c8 = (long *)img_labels.accesses_._72_8_;
        local_3b8 = *(long *)img_labels.accesses_._72_8_;
        uVar22 = (ulong)(int)uVar10;
        piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
        *piVar3 = *piVar3 + 1;
        local_330 = img_labels.img_._16_8_;
        local_318 = img_labels.accesses_._16_8_;
        local_368 = img_labels.accesses_._16_8_;
        local_350 = (long *)img_labels.img_._72_8_;
        local_3a0 = img_labels.img_._16_8_;
LAB_0015dd31:
        lVar40 = *local_350;
        lVar35 = lVar40 * lVar18 + local_3a0;
        *(undefined4 *)(lVar35 + uVar22 * 4) = 0;
        lVar25 = (long)(int)uVar10;
        uVar22 = lVar25 + 2;
        uVar10 = (uint)uVar22;
        if (local_2d0 <= (int)uVar10) {
          piVar3 = (int *)(local_338 * lVar18 + lVar41 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          cVar28 = *(char *)(lVar25 + 2 + local_360 * lVar18 + (long)plVar34);
          if (local_2d0 < (int)uVar10) {
            if (cVar28 == '\0') {
              piVar3 = (int *)(local_368 + local_3b8 * lVar18 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = 0;
              goto LAB_00161044;
            }
LAB_00160a85:
            lVar41 = lVar41 + local_338 * lVar27;
            piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar15 = (long)plVar34 + local_360 * lVar27;
            if (*(char *)(lVar25 + 2 + lVar15) != '\0') goto LAB_00160a9c;
            piVar3 = (int *)(lVar41 + 4 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar15 + 1 + lVar25) == '\0') {
              uVar10 = RemSP::MemNewLabel();
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                               img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + 8 +
                       lVar25 * 4) = uVar10;
              goto LAB_00161044;
            }
            piVar3 = (int *)(local_3b8 * lVar32 + local_368 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            uVar12 = *(undefined4 *)(local_3a0 + lVar40 * lVar32 + lVar25 * 4);
          }
          else {
            if (cVar28 == '\0') {
              local_328 = uVar22 & 0xffffffff;
              goto LAB_00160d1b;
            }
            lVar15 = lVar41 + local_338 * lVar27;
            piVar3 = (int *)(lVar15 + 0xc + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar42 = (long)plVar34 + local_360 * lVar27;
            if (*(char *)(lVar25 + 3 + lVar42) == '\0') goto LAB_00160a85;
            piVar3 = (int *)(lVar15 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar42 + 2 + lVar25) == '\0') {
              piVar3 = (int *)(lVar15 + 4 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar42 + 1 + lVar25) != '\0') goto LAB_001606b3;
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(local_3a0 + lVar40 * lVar32 + 8 + lVar25 * 4);
              piVar3 = (int *)(lVar18 * local_3b8 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = uVar12;
              goto LAB_00161044;
            }
LAB_00160a9c:
            piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            uVar12 = *(undefined4 *)(local_3a0 + lVar40 * lVar32 + 8 + lVar25 * 4);
          }
          piVar3 = (int *)(lVar18 * local_3b8 + local_368 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          goto LAB_00160ecc;
        }
        lVar35 = local_338 * lVar18 + lVar41;
        piVar3 = (int *)(lVar35 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar42 = local_360 * lVar18 + (long)plVar34;
        if (*(char *)(lVar25 + 2 + lVar42) != '\0') {
          lVar41 = lVar41 + local_338 * lVar27;
          piVar3 = (int *)(lVar41 + 0xc + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar39 = (long)plVar34 + local_360 * lVar27;
          if (*(char *)(lVar25 + 3 + lVar39) != '\0') {
            piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if ((*(char *)(lVar39 + 2 + lVar25) != '\0') ||
               (piVar3 = (int *)(lVar41 + 4 + lVar25 * 4), *piVar3 = *piVar3 + 1,
               *(char *)(lVar39 + 1 + lVar25) == '\0')) {
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)(lVar40 * lVar32 + local_3a0 + 8 + lVar25 * 4);
              piVar3 = (int *)(local_3b8 * lVar18 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              goto LAB_0015e2c6;
            }
            local_328 = uVar22 & 0xffffffff;
            goto LAB_0015f510;
          }
          piVar3 = (int *)(lVar35 + 0xc + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar42 + 3 + lVar25) != '\0') {
            piVar3 = (int *)(lVar41 + 0x10 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            cVar28 = *(char *)(lVar39 + 4 + lVar25);
            piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            cVar5 = *(char *)(lVar39 + 2 + lVar25);
            local_388 = local_3a0;
            local_308 = local_3a0;
            local_370 = local_3a0;
            if (cVar28 != '\0') {
              if (cVar5 != '\0') {
                local_328 = uVar22 & 0xffffffff;
                goto LAB_0015d127;
              }
              piVar3 = (int *)(lVar41 + 4 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar39 + 1 + lVar25) != '\0') {
                local_328 = uVar22 & 0xffffffff;
                goto LAB_0015f932;
              }
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 0x10 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)(lVar40 * lVar32 + local_3a0 + 0x10 + lVar25 * 4);
              piVar3 = (int *)(local_3b8 * lVar18 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_380 = local_368;
              local_390 = local_368;
              local_378 = local_368;
              local_328 = uVar22 & 0xffffffff;
              local_368 = local_368;
              local_340 = local_368;
              local_310 = local_318;
              goto LAB_0015d4ca;
            }
            if (cVar5 != '\0') {
              local_390 = local_368;
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_368 = local_368;
              local_380 = local_390;
              local_378 = local_390;
              local_340 = local_390;
              goto LAB_0015d243;
            }
            piVar3 = (int *)(lVar41 + 4 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar39 + 1 + lVar25) == '\0') {
              uVar14 = RemSP::MemNewLabel();
              local_3c8 = (long *)img_labels.accesses_._72_8_;
              local_3b8 = *(long *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              local_350 = (long *)img_labels.img_._72_8_;
              lVar40 = *(long *)img_labels.img_._72_8_;
              local_330 = img_labels.img_._16_8_;
              local_318 = img_labels.accesses_._16_8_;
              local_368 = img_labels.accesses_._16_8_;
              local_308 = img_labels.img_._16_8_;
            }
            else {
              piVar3 = (int *)(local_3b8 * lVar32 + local_368 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              uVar14 = *(uint *)(lVar40 * lVar32 + local_3a0 + lVar25 * 4);
              piVar3 = (int *)(local_3b8 * lVar18 + local_368 + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
            }
            goto LAB_0015e1b0;
          }
          local_348 = local_348 + local_338 * lVar27;
          piVar3 = (int *)(local_348 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar35 = (long)local_320 + local_360 * lVar27;
          if (*(char *)(lVar25 + 2 + lVar35) == '\0') {
            piVar3 = (int *)(local_348 + 4 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + 1 + lVar25) == '\0') {
              uVar10 = RemSP::MemNewLabel();
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                               img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * lVar18 + img_labels.img_._16_8_ + 8 +
                       lVar25 * 4) = uVar10;
              local_328 = uVar22 & 0xffffffff;
              local_380 = img_labels.accesses_._16_8_;
              local_308 = img_labels.img_._16_8_;
              goto LAB_0015cd89;
            }
            lVar35 = *local_3c8;
            piVar3 = (int *)(lVar35 * lVar32 + local_318 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = *local_350;
            uVar12 = *(undefined4 *)(lVar41 * lVar32 + local_330 + lVar25 * 4);
          }
          else {
            lVar35 = *local_3c8;
            piVar3 = (int *)(lVar35 * lVar32 + local_318 + 8 + lVar25 * 4);
            *piVar3 = *piVar3 + 1;
            lVar41 = *local_350;
            uVar12 = *(undefined4 *)(lVar41 * lVar32 + local_330 + 8 + lVar25 * 4);
          }
          piVar3 = (int *)(lVar35 * lVar18 + local_318 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar41 * lVar18 + local_330 + 8 + lVar25 * 4) = uVar12;
          local_328 = uVar22 & 0xffffffff;
          local_380 = local_318;
          local_308 = local_330;
          goto LAB_0015cd89;
        }
        local_328 = uVar22 & 0xffffffff;
      }
      lVar39 = local_338 * lVar27;
      piVar3 = (int *)(lVar41 + lVar39 + 4 + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      lVar42 = local_360 * lVar27;
      if (*(char *)(uVar22 + 1 + (long)plVar34 + lVar42) == '\0') goto LAB_0015d0e8;
      local_3c8 = (long *)img_labels.accesses_._72_8_;
      local_3b8 = *(long *)img_labels.accesses_._72_8_;
      piVar3 = (int *)(local_3b8 * lVar32 + img_labels.accesses_._16_8_ + uVar22 * 4);
      *piVar3 = *piVar3 + 1;
      local_350 = (long *)img_labels.img_._72_8_;
      lVar40 = *(long *)img_labels.img_._72_8_;
      local_330 = img_labels.img_._16_8_;
      local_318 = img_labels.accesses_._16_8_;
      local_370 = img_labels.img_._16_8_;
      local_340 = img_labels.accesses_._16_8_;
      local_388 = img_labels.img_._16_8_;
      local_380 = img_labels.accesses_._16_8_;
      local_3a0 = img_labels.img_._16_8_;
      local_390 = img_labels.accesses_._16_8_;
      local_378 = img_labels.accesses_._16_8_;
      local_368 = img_labels.accesses_._16_8_;
      lVar37 = img_labels.accesses_._16_8_;
      local_308 = img_labels.img_._16_8_;
    }
    if (local_2d0 < (int)uVar10) {
      uVar22 = (ulong)uVar10;
      goto LAB_0015fcfa;
    }
    piVar3 = (int *)(lVar41 + local_338 * lVar18 + 8 + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar35 + 2 + (long)plVar34 + local_360 * lVar18) == '\0') goto LAB_00160d1b;
LAB_001601aa:
    lVar35 = (long)(int)uVar10;
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + 4 + lVar35 * 4)
    ;
    *piVar3 = *piVar3 + 1;
    lVar15 = *(long *)img.img_._72_8_ * lVar27 + img.img_._16_8_;
    if (*(char *)(lVar35 + 1 + lVar15) == '\0') {
      lVar15 = local_368 + *local_3c8 * lVar18;
      piVar3 = (int *)(lVar15 + -8 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      local_308 = local_308 + lVar18 * *local_350;
      uVar12 = *(undefined4 *)(local_308 + -8 + lVar35 * 4);
      piVar3 = (int *)(lVar15 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      *(undefined4 *)(local_308 + lVar35 * 4) = uVar12;
      goto LAB_00161044;
    }
    piVar3 = (int *)(lVar27 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar15 + lVar35) != '\0') {
      lVar15 = *local_3c8;
      piVar3 = (int *)(lVar15 * lVar32 + local_368 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      lVar27 = *local_350;
      uVar12 = *(undefined4 *)(lVar32 * lVar27 + local_308 + lVar35 * 4);
      piVar3 = (int *)(lVar15 * lVar18 + local_368 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      goto LAB_0016044a;
    }
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    cVar28 = *(char *)(lVar35 + *(long *)img.img_._72_8_ * lVar32 + img.img_._16_8_);
    lVar15 = *local_3c8;
    piVar3 = (int *)(lVar15 * lVar32 + local_368 + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    lVar27 = *local_350;
    uVar10 = *(uint *)(lVar32 * lVar27 + local_308 + lVar35 * 4);
    if (cVar28 != '\0') {
      piVar3 = (int *)(local_368 + lVar15 * lVar18 + lVar35 * 4);
      *piVar3 = *piVar3 + 1;
      *(uint *)(local_308 + lVar27 * lVar18 + lVar35 * 4) = uVar10;
      goto LAB_00161044;
    }
    piVar3 = (int *)(local_368 + lVar15 * lVar18 + -8 + lVar35 * 4);
    *piVar3 = *piVar3 + 1;
    uVar14 = *(uint *)(local_308 + lVar27 * lVar18 + -8 + lVar35 * 4);
    goto LAB_00160ef2;
  }
  lVar39 = img.accesses_._16_8_ + local_338 * lVar27;
  piVar3 = (int *)(lVar39 + 0xc + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  lVar37 = img.img_._16_8_ + local_360 * lVar27;
  if (*(char *)(lVar25 + 3 + lVar37) != '\0') {
    piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = *(uint *)(local_308 + lVar40 * lVar32 + 8 + lVar25 * 4);
    piVar3 = (int *)(local_3b8 * lVar18 + local_368 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar35 + lVar25 * 4));
    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 + img_labels.accesses_._16_8_ + 8
                    + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    lVar40 = *(long *)img_labels.img_._72_8_;
    local_3a0 = img_labels.img_._16_8_;
LAB_0015e2c6:
    local_328 = uVar22 & 0xffffffff;
    local_308 = local_3a0;
    uVar21 = uVar22;
    goto LAB_0015f03d;
  }
  piVar3 = (int *)(lVar41 + 0xc + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar42 + 3 + lVar25) == '\0') {
    lVar41 = local_3b8 * lVar18 + local_368;
    piVar3 = (int *)(lVar41 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar12 = *(undefined4 *)(lVar35 + lVar25 * 4);
    piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = uVar12;
    local_328 = uVar22 & 0xffffffff;
    local_380 = local_368;
    goto LAB_0015cd89;
  }
  piVar3 = (int *)(lVar39 + 0x10 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar37 + 4 + lVar25) == '\0') {
    lVar41 = local_368 + local_3b8 * lVar18;
    piVar3 = (int *)(lVar41 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    uVar12 = *(undefined4 *)(lVar35 + lVar25 * 4);
    piVar3 = (int *)(lVar41 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(lVar35 + 8 + lVar25 * 4) = uVar12;
    local_328 = uVar22;
    goto LAB_0015e6c7;
  }
  piVar3 = (int *)(local_3b8 * lVar32 + local_368 + 0x10 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  uVar10 = *(uint *)(local_308 + lVar40 * lVar32 + 0x10 + lVar25 * 4);
  piVar3 = (int *)(local_3b8 * lVar18 + local_368 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar35 + lVar25 * 4));
  local_3b8 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + 8 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  lVar40 = *(long *)img_labels.img_._72_8_;
LAB_0015e3f1:
  local_328 = uVar22 & 0xffffffff;
  local_368 = img_labels.accesses_._16_8_;
  local_340 = img_labels.accesses_._16_8_;
  local_308 = img_labels.img_._16_8_;
  local_310 = img_labels.accesses_._16_8_;
  local_3c8 = (long *)img_labels.accesses_._72_8_;
  local_3a0 = img_labels.img_._16_8_;
  local_390 = img_labels.accesses_._16_8_;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_350 = (long *)img_labels.img_._72_8_;
  local_330 = img_labels.img_._16_8_;
  goto LAB_0015d4ca;
LAB_0015d127:
  uVar22 = (ulong)(int)local_328;
  piVar3 = (int *)(local_338 * lVar32 + local_348 + 4 + uVar22 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar22 + 1 + local_360 * lVar32 + (long)local_320) == '\0') {
    lVar35 = *(long *)img_labels.accesses_._72_8_ * lVar32 + img_labels.accesses_._16_8_;
    uVar22 = (ulong)(int)local_328;
    piVar3 = (int *)(lVar35 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar41 = *(long *)img_labels.img_._72_8_ * lVar32 + img_labels.img_._16_8_;
    uVar10 = *(uint *)(lVar41 + uVar22 * 4);
    piVar3 = (int *)(lVar35 + 8 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    uVar14 = *(uint *)(lVar41 + 8 + uVar22 * 4);
LAB_0015d44c:
    uVar10 = RemSP::MemMerge(uVar10,uVar14);
    local_3b8 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar40 = *(long *)img_labels.img_._72_8_;
    local_368 = img_labels.accesses_._16_8_;
    local_340 = img_labels.accesses_._16_8_;
    local_308 = img_labels.img_._16_8_;
    local_310 = img_labels.accesses_._16_8_;
    local_3c8 = (long *)img_labels.accesses_._72_8_;
    local_3a0 = img_labels.img_._16_8_;
    local_390 = img_labels.accesses_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_350 = (long *)img_labels.img_._72_8_;
    local_330 = img_labels.img_._16_8_;
  }
  else {
LAB_0015d151:
    local_3b8 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_3b8 * lVar32 + img_labels.accesses_._16_8_ + 8 + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    lVar40 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)(lVar40 * lVar32 + img_labels.img_._16_8_ + 8 + uVar22 * 4);
    piVar3 = (int *)(local_3b8 * lVar18 + img_labels.accesses_._16_8_ + uVar22 * 4);
    *piVar3 = *piVar3 + 1;
    local_368 = img_labels.accesses_._16_8_;
    local_340 = img_labels.accesses_._16_8_;
    local_308 = img_labels.img_._16_8_;
    local_310 = img_labels.accesses_._16_8_;
    local_3c8 = (long *)img_labels.accesses_._72_8_;
    local_3a0 = img_labels.img_._16_8_;
    local_390 = img_labels.accesses_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_350 = (long *)img_labels.img_._72_8_;
    local_330 = img_labels.img_._16_8_;
  }
  goto LAB_0015d4ca;
code_r0x0015f18d:
  lVar37 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(lVar37 * lVar32 + lVar40 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  lVar38 = *(long *)img_labels.img_._72_8_;
  uVar12 = *(undefined4 *)(lVar38 * lVar32 + lVar42 + lVar25 * 4);
  piVar3 = (int *)(lVar37 * lVar18 + lVar40 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(lVar38 * lVar18 + lVar42 + lVar25 * 4) = uVar12;
  lVar35 = lVar35 + 0x200000000;
  lVar25 = lVar25 + 2;
  goto LAB_0015f0eb;
LAB_001543ed:
  local_3c0 = local_3c0 + *local_3b0 * uVar22;
  piVar3 = (int *)(lVar39 + local_3c0);
  *piVar3 = *piVar3 + 1;
  lVar18 = (long)local_398 + *local_320 * uVar22;
  uVar12 = *(undefined4 *)(lVar39 + lVar18);
  piVar3 = (int *)(local_3c0 + lVar40 * 4 + 8 + lVar42 * 4);
  *piVar3 = *piVar3 + 1;
  uVar21 = (ulong)(iVar19 + iVar13 + 2);
  *(undefined4 *)(lVar18 + lVar40 * 4 + 8 + lVar42 * 4) = uVar12;
LAB_0015847a:
  lVar41 = uVar22 - 1;
  local_3a0 = img_labels.accesses_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  iVar19 = (int)uVar21;
  lVar40 = (long)iVar19;
  local_360 = lVar40 << 0x20;
  lVar32 = img.accesses_._16_8_ + lVar40 * 4;
  lVar27 = img.img_._16_8_ + lVar40;
  lVar25 = 0;
  do {
    uVar29 = lVar40 + lVar25 + 2;
    lVar42 = (long)local_360 >> 0x1e;
    if (lVar15 <= (long)uVar29) {
      uVar21 = (ulong)(iVar19 + 2) + lVar25;
      uVar10 = (uint)uVar21;
      if (local_2d0 < (int)uVar10) goto LAB_0015968d;
      piVar3 = (int *)(((long)(local_360 + 0x200000000) >> 0x1e) +
                      img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar22);
      *piVar3 = *piVar3 + 1;
      uVar23 = (long)(local_360 + 0x200000000) >> 0x20;
      lVar18 = *(long *)img.img_._72_8_;
      if (*(char *)(uVar23 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
        piVar3 = (int *)((uVar22 | 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                        uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(uVar23 + img.img_._16_8_ + lVar18 * (uVar22 | 1)) == '\0') goto LAB_00159435;
        lVar32 = (long)(local_360 + 0x300000000) >> 0x20;
        piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * uVar22 + img.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        lVar18 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar32 + lVar18 * uVar22 + img.img_._16_8_) != '\0') goto LAB_00158ab3;
      }
      else {
        lVar32 = (long)(local_360 + 0x300000000) >> 0x20;
LAB_00158ab3:
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar41 + img.accesses_._16_8_ + lVar32 * 4)
        ;
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar32 + lVar18 * lVar41 + img.img_._16_8_) != '\0') {
          lVar32 = uVar22 - 2;
          local_338 = *(long *)img.accesses_._72_8_;
          piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          if (*(char *)(uVar23 + lVar18 * lVar32 + img.img_._16_8_) == '\0') {
            lVar18 = *(long *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + uVar23 * 4);
            piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
            *piVar3 = *piVar3 + 1;
            uVar14 = *(uint *)(lVar42 + lVar27 * uVar22 + img_labels.img_._16_8_);
            goto LAB_00156d6e;
          }
          lVar32 = local_338 * lVar41;
          lVar41 = lVar41 * lVar18;
          uVar21 = uVar21 & 0xffffffff;
          goto LAB_0015a26b;
        }
      }
      lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_;
      piVar3 = (int *)(lVar42 + lVar18);
      *piVar3 = *piVar3 + 1;
      lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
      uVar12 = *(undefined4 *)(lVar42 + lVar32);
      piVar3 = (int *)(lVar18 + uVar23 * 4);
      *piVar3 = *piVar3 + 1;
      goto LAB_0015a038;
    }
    local_338 = *(long *)img.accesses_._72_8_;
    lVar37 = uVar22 * local_338 + lVar32;
    piVar3 = (int *)(lVar37 + 8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    lVar18 = *(long *)img.img_._72_8_;
    lVar35 = uVar22 * lVar18 + lVar27;
    iVar13 = (int)lVar25;
    lVar39 = (long)local_360 >> 0x20;
    local_398 = (long *)img_labels.img_._16_8_;
    local_320 = (long *)img_labels.img_._72_8_;
    local_390 = img_labels.img_._16_8_;
    if (*(char *)(lVar25 + 2 + lVar35) == '\0') {
      piVar3 = (int *)(local_318 * local_338 + lVar32 + 8 + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 2 + local_318 * lVar18 + lVar27) == '\0') {
        local_3c0 = img_labels.accesses_._16_8_;
        uVar21 = (ulong)(iVar19 + iVar13 + 2);
        local_2d8 = img_labels.img_._16_8_;
        local_3b8 = local_3c0;
        local_388 = (long)local_398;
        local_380 = local_3c0;
        local_378 = local_3c0;
        local_370 = (long)local_398;
        local_358 = (long)local_398;
        local_348 = local_3c0;
        goto LAB_001582be;
      }
      piVar3 = (int *)(lVar37 + 0xc + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 3 + lVar35) == '\0') {
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
        piVar3 = (int *)(lVar42 + lVar18);
        *piVar3 = *piVar3 + 1;
        iVar19 = iVar19 + iVar13;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
        uVar12 = *(undefined4 *)(lVar42 + lVar32);
        piVar3 = (int *)(lVar18 + lVar40 * 4 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        *(undefined4 *)(lVar32 + lVar40 * 4 + 8 + lVar25 * 4) = uVar12;
        local_388 = img_labels.img_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        goto LAB_00158ca2;
      }
      piVar3 = (int *)((long)local_350 * local_338 + lVar32 + 0xc + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 3 + (long)local_350 * lVar18 + lVar27) != '\0') {
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_ +
                         lVar40 * 4 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        uVar21 = (ulong)(iVar19 + 2) + lVar25;
        lVar18 = *(long *)img.img_._72_8_;
        uVar23 = lVar40 + 2 + lVar25;
        local_368 = uVar21;
        if (*(char *)(lVar40 + lVar25 + 2 + lVar18 * local_308 + img.img_._16_8_) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                          lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 8 +
                            lVar25 * 4);
          piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
          *piVar3 = *piVar3 + 1;
          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar42 + lVar32 * uVar22 +
                                                             img_labels.img_._16_8_));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar40 * 4 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img_labels.img_._72_8_;
          uVar21 = uVar23;
          local_358 = img_labels.img_._16_8_;
        }
        else {
          piVar3 = (int *)(lVar42 + lVar41 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar39 + img.img_._16_8_ + lVar18 * lVar41) != '\0') goto LAB_00158d6a;
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                          lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 8 +
                            lVar25 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                   lVar39 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar40 * 4 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img_labels.img_._72_8_;
          uVar21 = uVar23;
          local_358 = img_labels.img_._16_8_;
        }
        goto LAB_00159593;
      }
    }
    else {
      piVar3 = (int *)((long)local_350 * local_338 + lVar32 + 0xc + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 3 + (long)local_350 * lVar18 + lVar27) != '\0') {
        uVar21 = (ulong)(iVar19 + 2) + lVar25;
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_ +
                         lVar40 * 4 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar40 + lVar25 + 2 + lVar18 * local_308 + img.img_._16_8_) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                          lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 8 +
                            lVar25 * 4);
          piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
          *piVar3 = *piVar3 + 1;
          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar42 + lVar32 * uVar22 +
                                                             img_labels.img_._16_8_));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + lVar40 * 4 + 8 + lVar25 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          local_2d8 = img_labels.img_._16_8_;
          goto LAB_0015b6b3;
        }
        piVar3 = (int *)(lVar42 + lVar41 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar39 + img.img_._16_8_ + lVar18 * lVar41) != '\0') goto LAB_0015892c;
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 8 + lVar25 * 4
                          );
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                 lVar39 * 4));
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                         + lVar40 * 4 + 8 + lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        goto LAB_0015b694;
      }
      piVar3 = (int *)(lVar37 + 0xc + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 3 + lVar35) == '\0') goto LAB_0015896c;
    }
    piVar3 = (int *)(local_338 * lVar41 + lVar32 + 0x10 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar25 + 4 + lVar18 * lVar41 + lVar27) != '\0') {
      piVar3 = (int *)(((long)(local_360 + 0x300000000) >> 0x1e) +
                      *(long *)img.accesses_._72_8_ * (uVar22 - 2) + img.accesses_._16_8_);
      *piVar3 = *piVar3 + 1;
      uVar21 = (ulong)(iVar19 + 2) + lVar25;
      lVar35 = lVar18 * (uVar22 - 2);
      uVar23 = lVar40 + 2 + lVar25;
      if (*(char *)(((long)(local_360 + 0x300000000) >> 0x20) + img.img_._16_8_ + lVar35) == '\0') {
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 0x10 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 0x10 +
                          lVar25 * 4);
        piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar42 + lVar32 * uVar22 + img_labels.img_._16_8_)
                                );
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        lVar32 = img_labels.accesses_._16_8_;
        local_1f0 = local_1f8;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
        goto LAB_00153fc1;
      }
      piVar3 = (int *)(*(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_ + lVar40 * 4
                       + 8 + lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 2 + lVar27 + lVar18 * local_308) == '\0') {
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 0x10 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 0x10 +
                          lVar25 * 4);
        piVar3 = (int *)(lVar42 + lVar18 * uVar22 + img_labels.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        uVar14 = *(uint *)(lVar42 + lVar32 * uVar22 + img_labels.img_._16_8_);
      }
      else {
        piVar3 = (int *)(lVar42 + lVar41 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar18 * lVar41 + img.img_._16_8_ + lVar39) != '\0') break;
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * local_308 + img_labels.accesses_._16_8_ + lVar40 * 4 + 0x10 +
                        lVar25 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_308 + img_labels.img_._16_8_ + lVar40 * 4 + 0x10 +
                          lVar25 * 4);
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar39 * 4);
        *piVar3 = *piVar3 + 1;
        uVar14 = *(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ + lVar39 * 4);
      }
      uVar10 = RemSP::MemMerge(uVar10,uVar14);
      local_328 = *(ulong *)img_labels.accesses_._72_8_;
      piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar40 * 4 + 8 +
                      lVar25 * 4);
      *piVar3 = *piVar3 + 1;
      local_1f8 = *(long *)img_labels.img_._72_8_;
      lVar32 = img_labels.accesses_._16_8_;
      local_1f0 = local_1f8;
      local_320 = (long *)img_labels.img_._72_8_;
      local_1e8 = img_labels.img_._16_8_;
      local_2d8 = img_labels.img_._16_8_;
      local_3c0 = img_labels.accesses_._16_8_;
      local_3b8 = img_labels.accesses_._16_8_;
      local_3b0 = (long *)img_labels.accesses_._72_8_;
      local_3a0 = img_labels.accesses_._16_8_;
      local_398 = (long *)img_labels.img_._16_8_;
      local_390 = img_labels.img_._16_8_;
      local_388 = img_labels.img_._16_8_;
      local_380 = img_labels.accesses_._16_8_;
      local_378 = img_labels.accesses_._16_8_;
      local_370 = img_labels.img_._16_8_;
      local_358 = img_labels.img_._16_8_;
      goto LAB_00153fc1;
    }
    lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 +
             img_labels.accesses_._16_8_ + lVar40 * 4 + 8;
    piVar3 = (int *)(lVar18 + -8 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    lVar35 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + lVar40 * 4 + 8;
    uVar12 = *(undefined4 *)(lVar35 + -8 + lVar25 * 4);
    piVar3 = (int *)(lVar18 + lVar25 * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(lVar35 + lVar25 * 4) = uVar12;
    local_360 = local_360 + 0x200000000;
    lVar25 = lVar25 + 2;
  } while( true );
LAB_001587bc:
  lVar18 = uVar22 - 2;
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_ + -4 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  cVar28 = *(char *)((uVar23 - 1) + lVar35 + img.img_._16_8_);
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * lVar18 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)(lVar18 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
  if (cVar28 != '\0') {
    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_398 = (long *)img_labels.img_._16_8_;
    local_3c0 = img_labels.accesses_._16_8_;
    local_358 = img_labels.img_._16_8_;
    local_3b8 = img_labels.accesses_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    lVar32 = img_labels.accesses_._16_8_;
    local_1f0 = local_1f8;
    local_320 = (long *)img_labels.img_._72_8_;
    local_1e8 = img_labels.img_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_00153fc1;
  }
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(img_labels.accesses_._16_8_ + local_328 * uVar22 + -8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
LAB_0015a970:
  uVar14 = *(uint *)(img_labels.img_._16_8_ + local_1f8 * uVar22 + -8 + uVar23 * 4);
LAB_0015a984:
  uVar10 = RemSP::MemMerge(uVar10,uVar14);
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  lVar32 = img_labels.accesses_._16_8_;
  local_1f0 = local_1f8;
  local_320 = (long *)img_labels.img_._72_8_;
  local_1e8 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_3a0 = img_labels.accesses_._16_8_;
  local_398 = (long *)img_labels.img_._16_8_;
  local_390 = img_labels.img_._16_8_;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_358 = img_labels.img_._16_8_;
  goto LAB_00153fc1;
LAB_0015896c:
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
  piVar3 = (int *)(lVar42 + lVar18);
  *piVar3 = *piVar3 + 1;
  uVar21 = (ulong)(iVar19 + iVar13 + 2);
  local_1f8 = *(long *)img_labels.img_._72_8_;
  lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
  uVar12 = *(undefined4 *)(lVar42 + lVar32);
  piVar3 = (int *)(lVar18 + lVar40 * 4 + 8 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(lVar32 + lVar40 * 4 + 8 + lVar25 * 4) = uVar12;
  local_388 = img_labels.img_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_358 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_2e8 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_2f8 = img_labels.accesses_._16_8_;
  local_348 = img_labels.accesses_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_2f0 = local_328;
  local_2e0 = local_1f8;
LAB_00159d37:
  lVar27 = (long)(int)uVar21;
  uVar21 = lVar27 + 2;
  uVar23 = uVar21;
  local_3c8 = (long *)img.img_._16_8_;
  if ((int)uVar21 < local_2d0) {
    local_338 = *(long *)img.accesses_._72_8_;
    lVar32 = local_338 * uVar22 + img.accesses_._16_8_;
    piVar3 = (int *)(lVar32 + 8 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar18 = *(long *)img.img_._72_8_;
    lVar35 = lVar18 * uVar22 + img.img_._16_8_;
    uVar29 = uVar22 | 1;
    uVar16 = uVar21;
    if (*(char *)(lVar27 + 2 + lVar35) == '\0') {
      local_338 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(local_338 * uVar29 + img.accesses_._16_8_ + 8 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar41 = lVar18 * uVar29 + img.img_._16_8_;
      lVar32 = img.accesses_._16_8_;
      if (*(char *)(lVar27 + 2 + lVar41) == '\0') goto LAB_00153acd;
      local_338 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 0xc + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar35 + 3 + lVar27) == '\0') {
        local_340 = local_2f0;
        local_300 = local_2f8;
        local_1f0 = local_2e0;
        local_1e8 = local_2e8;
LAB_0015607a:
        lVar32 = (long)(int)uVar21;
        piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + -4 + lVar32 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar32 + -1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0') {
          uVar10 = RemSP::MemNewLabel();
          local_3b0 = (long *)img_labels.accesses_._72_8_;
          local_328 = *(ulong *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f8 = *(long *)img_labels.img_._72_8_;
          *(uint *)(local_1f8 * uVar22 + img_labels.img_._16_8_ + lVar32 * 4) = uVar10;
          local_3a0 = img_labels.accesses_._16_8_;
          local_388 = img_labels.img_._16_8_;
          local_370 = img_labels.img_._16_8_;
          local_378 = img_labels.accesses_._16_8_;
          local_398 = (long *)img_labels.img_._16_8_;
          local_3c0 = img_labels.accesses_._16_8_;
          local_358 = img_labels.img_._16_8_;
          local_3b8 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
          local_348 = img_labels.accesses_._16_8_;
          local_2e8 = img_labels.img_._16_8_;
          local_2f8 = img_labels.accesses_._16_8_;
          local_390 = img_labels.img_._16_8_;
          local_380 = img_labels.accesses_._16_8_;
          local_300 = img_labels.accesses_._16_8_;
          local_1f0 = local_1f8;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1e8 = img_labels.img_._16_8_;
          local_340 = local_328;
          local_2f0 = local_328;
          local_2e0 = local_1f8;
        }
        else {
          lVar18 = local_340 * uVar22 + local_300;
          piVar3 = (int *)(lVar18 + -8 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          lVar27 = local_1f0 * uVar22 + local_1e8;
          uVar12 = *(undefined4 *)(lVar27 + -8 + lVar32 * 4);
          piVar3 = (int *)(lVar18 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          *(undefined4 *)(lVar27 + lVar32 * 4) = uVar12;
        }
        goto LAB_001561a1;
      }
      local_338 = *(long *)img.accesses_._72_8_;
      piVar3 = (int *)(uVar29 * local_338 + img.accesses_._16_8_ + 4 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar41 + 1 + lVar27) == '\0') goto LAB_00153af5;
      lVar32 = uVar22 - 1;
      piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 0xc +
                      lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar25 = lVar18 * lVar32;
      if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar25) != '\0') {
        piVar3 = (int *)(lVar32 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar27 * 4)
        ;
        *piVar3 = *piVar3 + 1;
        if (*(char *)(img.img_._16_8_ + lVar25 + lVar27) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                   lVar27 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
        }
        else {
LAB_0015a17d:
          uVar21 = uVar23 & 0xffffffff;
          lVar32 = uVar22 - 2;
          uVar23 = (ulong)(int)uVar23;
          piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + -4 +
                          uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)((uVar23 - 1) + lVar18 * lVar32 + img.img_._16_8_) != '\0') {
            lVar32 = lVar18 * (uVar22 - 1);
            goto LAB_0015bb2b;
          }
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          lVar27 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + uVar23 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar27 * uVar22 + img_labels.img_._16_8_ + -8 +
                                                   uVar23 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
        }
        lVar18 = *(long *)img_labels.img_._72_8_;
        local_368 = uVar21;
        uVar21 = uVar23;
        local_358 = img_labels.img_._16_8_;
        goto LAB_00159593;
      }
    }
    else {
      piVar3 = (int *)(local_338 * uVar29 + img.accesses_._16_8_ + 4 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar27 + 1 + uVar29 * lVar18 + img.img_._16_8_) == '\0') goto LAB_001535cc;
      lVar40 = local_338 * (uVar22 - 1) + img.accesses_._16_8_;
      piVar3 = (int *)(lVar40 + 0xc + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar25 = lVar18 * (uVar22 - 1);
      lVar41 = img.img_._16_8_ + lVar25;
      if (*(char *)(lVar27 + 3 + lVar41) != '\0') {
        piVar3 = (int *)(lVar40 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar41 + lVar27) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                   lVar27 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          uVar29 = uVar21;
          goto LAB_0015b694;
        }
LAB_00159e33:
        lVar32 = uVar22 - 2;
        uVar29 = (ulong)(int)uVar21;
        piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + -4 + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)((uVar29 - 1) + lVar18 * lVar32 + img.img_._16_8_) == '\0') {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          lVar27 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)(lVar32 * lVar27 + img_labels.img_._16_8_ + uVar29 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + -8 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          uVar14 = *(uint *)(lVar27 * uVar22 + img_labels.img_._16_8_ + -8 + uVar29 * 4);
          goto LAB_0015bd57;
        }
        lVar35 = local_338 * (uVar22 - 1);
        lVar32 = (uVar22 - 1) * lVar18;
        goto LAB_00159a18;
      }
      piVar3 = (int *)(lVar32 + 0xc + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar35 + 3 + lVar27) == '\0') {
        piVar3 = (int *)(lVar40 + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)(lVar41 + 2 + lVar27) != '\0') {
          piVar3 = (int *)(lVar40 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar41 + lVar27) != '\0') goto LAB_0015aadf;
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          lVar32 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                   lVar27 * 4));
          local_3c0 = img_labels.accesses_._16_8_;
          local_3b0 = (long *)img_labels.accesses_._72_8_;
          local_328 = *(ulong *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
          *piVar3 = *piVar3 + 1;
          local_398 = (long *)img_labels.img_._16_8_;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          local_300 = img_labels.accesses_._16_8_;
          uVar21 = uVar21 & 0xffffffff;
          local_1e8 = img_labels.img_._16_8_;
          local_3b8 = local_3c0;
          local_3a0 = local_3c0;
          local_390 = (long)local_398;
          local_388 = (long)local_398;
          local_380 = local_3c0;
          local_378 = local_3c0;
          local_370 = (long)local_398;
          local_358 = (long)local_398;
          local_348 = local_3c0;
          local_340 = local_328;
          local_2f8 = local_3c0;
          local_2f0 = local_328;
          local_2e8 = (long)local_398;
          local_2e0 = local_1f0;
          local_2d8 = (long)local_398;
          local_1f8 = local_1f0;
          goto LAB_0015760b;
        }
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
        piVar3 = (int *)(lVar18 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        lVar32 = local_1f8 * uVar22 + img_labels.img_._16_8_;
        uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
        piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
        uVar21 = uVar21 & 0xffffffff;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
        local_348 = img_labels.accesses_._16_8_;
        local_320 = (long *)img_labels.img_._72_8_;
        local_2f8 = img_labels.accesses_._16_8_;
        local_2f0 = local_328;
        local_2d8 = img_labels.img_._16_8_;
        local_1f0 = local_1f8;
        local_1e8 = img_labels.img_._16_8_;
        goto LAB_0015b29d;
      }
    }
    lVar32 = uVar22 - 1;
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 0x10 +
                    lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar25 = lVar25 + img.img_._16_8_;
    if (*(char *)(lVar27 + 4 + lVar25) == '\0') {
      piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 8 +
                      lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 2 + lVar27) == '\0') {
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        lVar18 = local_328 * uVar22 + img_labels.accesses_._16_8_;
        piVar3 = (int *)(lVar18 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        local_2e0 = *(long *)img_labels.img_._72_8_;
        lVar32 = local_2e0 * uVar22 + img_labels.img_._16_8_;
        uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
        piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
        local_3a0 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_358 = img_labels.img_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_348 = img_labels.accesses_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_2e8 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_2f8 = img_labels.accesses_._16_8_;
        local_320 = (long *)img_labels.img_._72_8_;
        local_390 = img_labels.img_._16_8_;
        local_2f0 = local_328;
        local_1f8 = local_2e0;
LAB_00157c21:
        do {
          iVar19 = (int)uVar21;
          lVar32 = (long)iVar19;
          uVar21 = lVar32 + 2;
          uVar10 = (uint)uVar21;
          local_360 = uVar21;
          if (local_2d0 <= (int)uVar10) {
            if (local_2d0 < (int)uVar10) goto LAB_00157d5e;
            lVar18 = *(long *)img.accesses_._72_8_;
            lVar35 = lVar18 * uVar22 + img.accesses_._16_8_;
            piVar3 = (int *)(lVar35 + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = *(long *)img.img_._72_8_;
            lVar41 = lVar27 * uVar22 + img.img_._16_8_;
            if (*(char *)(lVar32 + 2 + lVar41) == '\0') {
              piVar3 = (int *)(lVar18 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar32 + 2 + (uVar22 | 1) * lVar27 + img.img_._16_8_) == '\0')
              goto LAB_00159435;
              piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar41 + 3 + lVar32) == '\0') {
                lVar27 = local_2f0 * uVar22 + local_2f8;
                piVar3 = (int *)(lVar27 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = local_2e0 * uVar22 + local_2e8;
                uVar12 = *(undefined4 *)(lVar18 + lVar32 * 4);
                piVar3 = (int *)(lVar27 + 8 + lVar32 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar18 + 8 + lVar32 * 4) = uVar12;
                local_380 = local_2f8;
                local_2d8 = local_2e8;
                goto LAB_0015b9d6;
              }
              lVar35 = lVar32 + 3;
            }
            else {
              lVar35 = (long)(iVar19 + 3);
            }
            piVar3 = (int *)(img.accesses_._16_8_ + lVar18 * (uVar22 - 1) + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar35 + img.img_._16_8_ + lVar27 * (uVar22 - 1)) == '\0') {
              lVar27 = local_2f0 * uVar22 + local_2f8;
              piVar3 = (int *)(lVar27 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              lVar18 = local_2e0 * uVar22 + local_2e8;
              uVar12 = *(undefined4 *)(lVar18 + lVar32 * 4);
              piVar3 = (int *)(lVar27 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar18 + 8 + lVar32 * 4) = uVar12;
              local_380 = local_2f8;
              local_2d8 = local_2e8;
            }
            else {
              piVar3 = (int *)(local_2f0 * (uVar22 - 2) + local_2f8 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)((uVar22 - 2) * local_2e0 + local_2e8 + 8 + lVar32 * 4);
              piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar32 * 4)
                                      );
              piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                               img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + 8 +
                       lVar32 * 4) = uVar10;
              local_380 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
            }
            goto LAB_0015b9d6;
          }
          local_338 = *(long *)img.accesses_._72_8_;
          lVar35 = local_338 * uVar22 + img.accesses_._16_8_;
          piVar3 = (int *)(lVar35 + 8 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          lVar27 = lVar18 * uVar22 + img.img_._16_8_;
          if (*(char *)(lVar32 + 2 + lVar27) != '\0') goto code_r0x00157c87;
          piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 8 + lVar32 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar32 + 2 + (uVar22 | 1) * lVar18 + img.img_._16_8_) != '\0') {
            piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            if (*(char *)(lVar27 + 3 + lVar32) == '\0') {
              piVar3 = (int *)(local_2f8 + local_2f0 * uVar22 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(local_2e8 + local_2e0 * uVar22 + lVar32 * 4);
              local_340 = local_328;
              local_2f8 = local_348;
              piVar3 = (int *)(local_328 * uVar22 + local_348 + 8 + lVar32 * 4);
              *piVar3 = *piVar3 + 1;
              local_2e0 = local_1f8;
              *(undefined4 *)(local_1f8 * uVar22 + local_2d8 + 8 + lVar32 * 4) = uVar12;
              local_300 = local_348;
              local_1f0 = local_1f8;
              local_1e8 = local_2d8;
              local_2f0 = local_340;
              local_2e8 = local_2d8;
              goto LAB_001561a1;
            }
            local_338 = local_338 * (uVar22 - 1);
            piVar3 = (int *)(local_338 + img.accesses_._16_8_ + 0xc + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = lVar18 * (uVar22 - 1);
            if (*(char *)(lVar32 + 3 + img.img_._16_8_ + lVar18) == '\0') goto LAB_00157f7b;
            piVar3 = (int *)(local_2f0 * (uVar22 - 2) + local_2f8 + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            uVar10 = *(uint *)((uVar22 - 2) * local_2e0 + local_2e8 + 8 + lVar32 * 4);
            piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar32 * 4));
            piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                             img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = *(long *)img_labels.img_._72_8_;
            local_368 = uVar21 & 0xffffffff;
            local_358 = img_labels.img_._16_8_;
            goto LAB_00159593;
          }
LAB_001582be:
          iVar19 = (int)uVar21;
          uVar23 = (ulong)iVar19;
          piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(uVar23 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0') {
            uVar23 = uVar21 & 0xffffffff;
            local_3c8 = (long *)img.img_._16_8_;
            lVar32 = img.accesses_._16_8_;
LAB_0015509b:
            uVar29 = uVar22 | 1;
            iVar19 = (int)uVar23;
            lVar35 = (long)iVar19;
            piVar3 = (int *)(local_338 * uVar29 + lVar32 + 4 + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            lVar27 = lVar18 * uVar29;
            if (*(char *)(lVar35 + 1 + (long)local_3c8 + lVar27) != '\0') {
              uVar10 = RemSP::MemNewLabel();
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              lVar27 = local_328 * uVar22 + img_labels.accesses_._16_8_;
              piVar3 = (int *)(lVar27 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f8 = *(long *)img_labels.img_._72_8_;
              lVar41 = local_1f8 * uVar22 + img_labels.img_._16_8_;
              *(uint *)(lVar41 + lVar35 * 4) = uVar10;
              uVar21 = lVar35 + 2;
              iVar13 = (int)uVar21;
              local_300 = img_labels.accesses_._16_8_;
              local_1e8 = img_labels.img_._16_8_;
              local_340 = local_328;
              local_1f0 = local_1f8;
              local_3c8 = (long *)img.img_._16_8_;
              if (iVar13 < local_2d0) {
                local_320 = (long *)img_labels.img_._72_8_;
                local_338 = *(long *)img.accesses_._72_8_;
                lVar40 = local_338 * uVar22 + img.accesses_._16_8_;
                piVar3 = (int *)(lVar40 + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                lVar25 = lVar18 * uVar22 + img.img_._16_8_;
                local_2f0 = local_328;
                local_2e0 = local_1f8;
                if (*(char *)(lVar35 + 2 + lVar25) != '\0') {
                  local_390 = img_labels.img_._16_8_;
                  local_3a0 = img_labels.accesses_._16_8_;
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_398 = (long *)img_labels.img_._16_8_;
                  local_3c0 = img_labels.accesses_._16_8_;
                  local_358 = img_labels.img_._16_8_;
                  local_3b8 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  local_348 = img_labels.accesses_._16_8_;
                  local_2e8 = img_labels.img_._16_8_;
                  local_2f8 = img_labels.accesses_._16_8_;
                  goto LAB_00156269;
                }
                piVar3 = (int *)(local_338 * uVar29 + img.accesses_._16_8_ + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                lVar32 = img.accesses_._16_8_;
                if (*(char *)(lVar35 + 2 + uVar29 * lVar18 + img.img_._16_8_) == '\0')
                goto LAB_00153acd;
                piVar3 = (int *)(lVar40 + 0xc + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar25 + 3 + lVar35) != '\0') {
                  lVar40 = (long)(iVar19 + 3);
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_398 = (long *)img_labels.img_._16_8_;
                  local_3c0 = img_labels.accesses_._16_8_;
                  local_358 = img_labels.img_._16_8_;
                  local_3b8 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  local_348 = img_labels.accesses_._16_8_;
                  local_2e8 = img_labels.img_._16_8_;
                  local_2f8 = img_labels.accesses_._16_8_;
                  local_3a0 = img_labels.accesses_._16_8_;
                  local_390 = img_labels.img_._16_8_;
                  local_368 = uVar21;
                  goto LAB_00155f66;
                }
                piVar3 = (int *)(lVar27 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                uVar12 = *(undefined4 *)(lVar41 + lVar35 * 4);
                piVar3 = (int *)(lVar27 + 8 + lVar35 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar41 + 8 + lVar35 * 4) = uVar12;
                local_390 = img_labels.img_._16_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                goto LAB_001561a1;
              }
              local_338 = *(long *)img.accesses_._72_8_;
              lVar32 = local_338 * uVar22 + img.accesses_._16_8_;
              piVar3 = (int *)(lVar32 + 8 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              lVar18 = *(long *)img.img_._72_8_;
              lVar40 = lVar18 * uVar22 + img.img_._16_8_;
              cVar28 = *(char *)(lVar35 + 2 + lVar40);
              if (local_2d0 < iVar13) {
                if (cVar28 == '\0') goto LAB_00159720;
                goto LAB_00156998;
              }
              if (cVar28 != '\0') goto LAB_00156461;
              piVar3 = (int *)(local_338 * uVar29 + img.accesses_._16_8_ + 8 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar35 + 2 + uVar29 * lVar18 + img.img_._16_8_) == '\0') {
                uVar23 = uVar21 & 0xffffffff;
                goto LAB_00153717;
              }
              piVar3 = (int *)(lVar32 + 0xc + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar40 + 3 + lVar35) != '\0') goto LAB_0015689a;
              piVar3 = (int *)(lVar27 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              uVar12 = *(undefined4 *)(lVar41 + lVar35 * 4);
              piVar3 = (int *)(lVar27 + 8 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              *(undefined4 *)(lVar41 + 8 + lVar35 * 4) = uVar12;
              local_380 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              goto LAB_0015b9d6;
            }
            local_3b0 = (long *)img_labels.accesses_._72_8_;
            local_328 = *(ulong *)img_labels.accesses_._72_8_;
            piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            local_320 = (long *)img_labels.img_._72_8_;
            local_1f0 = *(long *)img_labels.img_._72_8_;
            *(undefined4 *)(local_1f0 * uVar22 + img_labels.img_._16_8_ + lVar35 * 4) = 0;
            uVar21 = lVar35 + 2;
            uVar10 = (uint)uVar21;
            local_3a0 = img_labels.accesses_._16_8_;
            local_1e8 = img_labels.img_._16_8_;
            local_1f8 = local_1f0;
            if (local_2d0 <= (int)uVar10) {
              piVar3 = (int *)(local_338 * uVar22 + lVar32 + 8 + lVar35 * 4);
              *piVar3 = *piVar3 + 1;
              cVar28 = *(char *)(lVar35 + 2 + lVar18 * uVar22 + (long)local_3c8);
              if ((int)uVar10 <= local_2d0) {
                if (cVar28 == '\0') goto LAB_00153555;
                goto LAB_001565fe;
              }
              uVar23 = uVar21;
              if (cVar28 == '\0') goto LAB_00153665;
              goto LAB_00156d83;
            }
            piVar3 = (int *)(local_338 * uVar22 + lVar32 + 8 + lVar35 * 4);
            *piVar3 = *piVar3 + 1;
            local_388 = img_labels.img_._16_8_;
            local_380 = img_labels.accesses_._16_8_;
            local_370 = img_labels.img_._16_8_;
            local_378 = img_labels.accesses_._16_8_;
            local_398 = (long *)img_labels.img_._16_8_;
            local_3c0 = img_labels.accesses_._16_8_;
            local_358 = img_labels.img_._16_8_;
            local_3b8 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
            local_348 = img_labels.accesses_._16_8_;
            local_2e8 = img_labels.img_._16_8_;
            local_2f8 = img_labels.accesses_._16_8_;
            local_390 = img_labels.img_._16_8_;
            local_300 = img_labels.accesses_._16_8_;
            local_340 = local_328;
            local_2f0 = local_328;
            local_2e0 = local_1f0;
            if (*(char *)(lVar35 + 2 + lVar18 * uVar22 + (long)local_3c8) != '\0') {
LAB_001556ba:
              iVar19 = (int)uVar21;
              uVar29 = (ulong)iVar19;
              lVar27 = local_338 * (uVar22 - 1) + lVar32;
              piVar3 = (int *)(lVar27 + 4 + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              lVar35 = (uVar22 - 1) * lVar18 + (long)local_3c8;
              if (*(char *)(uVar29 + 1 + lVar35) != '\0') {
                piVar3 = (int *)(lVar27 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                local_2d8 = local_1e8;
                if (*(char *)(lVar35 + uVar29) != '\0') {
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar29 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar29 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar29 * 4);
                  *piVar3 = *piVar3 + 1;
                  goto LAB_0015b6b3;
                }
                piVar3 = (int *)(lVar27 + -4 + (long)iVar19 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + -1 + (long)iVar19) != '\0') goto LAB_0015bcab;
                piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar29 * 4);
                piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar29 * 4);
                *piVar3 = *piVar3 + 1;
                goto LAB_0015b6b3;
              }
              piVar3 = (int *)(lVar32 + local_338 * uVar22 + 4 + uVar29 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(uVar29 + 1 + lVar18 * uVar22 + (long)local_3c8) != '\0') {
                uVar16 = (ulong)iVar19;
                piVar3 = (int *)(lVar27 + 8 + uVar16 * 4);
                *piVar3 = *piVar3 + 1;
                cVar28 = *(char *)(lVar35 + 2 + uVar16);
                piVar3 = (int *)(lVar27 + uVar16 * 4);
                *piVar3 = *piVar3 + 1;
                if (cVar28 != '\0') {
                  if (*(char *)(lVar35 + uVar16) != '\0') goto LAB_00153b9f;
                  piVar3 = (int *)(lVar27 + -4 + (long)iVar19 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = uVar29 + 1;
                  if (*(char *)(lVar35 + -1 + (long)iVar19) != '\0') goto LAB_0015c49d;
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + 8 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + 8 + uVar16 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar32 = local_348;
                  uVar23 = uVar16;
                  local_320 = local_320;
                  local_2d8 = local_2d8;
                  goto LAB_00153fc1;
                }
                if (*(char *)(lVar35 + uVar16) != '\0') {
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar16 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_320 = local_320;
                  goto LAB_00153cbb;
                }
                lVar18 = (long)iVar19;
                piVar3 = (int *)(lVar27 + -4 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + -1 + lVar18) == '\0') {
                  uVar10 = RemSP::MemNewLabel();
                  local_3b0 = (long *)img_labels.accesses_._72_8_;
                  local_328 = *(ulong *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_2e0 = *(long *)img_labels.img_._72_8_;
                  *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + uVar16 * 4) = uVar10;
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_398 = (long *)img_labels.img_._16_8_;
                  local_3c0 = img_labels.accesses_._16_8_;
                  local_358 = img_labels.img_._16_8_;
                  local_3b8 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  local_348 = img_labels.accesses_._16_8_;
                  local_2e8 = img_labels.img_._16_8_;
                  local_3a0 = img_labels.accesses_._16_8_;
                  local_2f8 = img_labels.accesses_._16_8_;
                  local_320 = (long *)img_labels.img_._72_8_;
                  local_390 = img_labels.img_._16_8_;
                  local_2f0 = local_328;
                  local_1f8 = local_2e0;
                }
                else {
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)((uVar22 - 2) * local_1f0 + local_1e8 + -8 + lVar18 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_1f0 * uVar22 + local_1e8 + uVar16 * 4) = uVar12;
                }
                goto LAB_00157c21;
              }
              uVar16 = (ulong)iVar19;
              piVar3 = (int *)(lVar27 + uVar16 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar35 + uVar16) == '\0') {
                lVar18 = (long)iVar19;
                piVar3 = (int *)(lVar27 + -4 + lVar18 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar35 + -1 + lVar18) != '\0') {
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + -8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)((uVar22 - 2) * local_1f0 + local_1e8 + -8 + lVar18 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_1f0 * uVar22 + local_1e8 + uVar16 * 4) = uVar12;
                  goto LAB_00155baa;
                }
                uVar10 = RemSP::MemNewLabel();
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                *piVar3 = *piVar3 + 1;
                local_320 = (long *)img_labels.img_._72_8_;
                local_2e0 = *(long *)img_labels.img_._72_8_;
                *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + uVar16 * 4) = uVar10;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_358 = img_labels.img_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_348 = img_labels.accesses_._16_8_;
                local_2e8 = img_labels.img_._16_8_;
                local_2f8 = img_labels.accesses_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_1e8 = img_labels.img_._16_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_300 = img_labels.accesses_._16_8_;
                local_340 = local_328;
                local_2f0 = local_328;
                local_1f8 = local_2e0;
                local_1f0 = local_2e0;
                goto LAB_00155baa;
              }
              piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar16 * 4);
              *piVar3 = *piVar3 + 1;
              uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar16 * 4);
              piVar3 = (int *)(local_340 * uVar22 + local_300 + uVar16 * 4);
              *piVar3 = *piVar3 + 1;
LAB_0015760b:
              while( true ) {
                lVar32 = local_1f0 * uVar22 + local_1e8;
                *(uint *)(lVar32 + uVar16 * 4) = uVar10;
                lVar27 = (long)(int)uVar21;
                uVar23 = lVar27 + 2;
                uVar10 = (uint)uVar23;
                local_3c8 = (long *)img.img_._16_8_;
                if (local_2d0 <= (int)uVar10) {
                  local_338 = *(long *)img.accesses_._72_8_;
                  lVar35 = local_338 * uVar22 + img.accesses_._16_8_;
                  piVar3 = (int *)(lVar35 + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  lVar18 = *(long *)img.img_._72_8_;
                  lVar25 = lVar18 * uVar22 + img.img_._16_8_;
                  cVar28 = *(char *)(lVar27 + 2 + lVar25);
                  uVar21 = uVar23;
                  if (local_2d0 < (int)uVar10) {
                    if (cVar28 == '\0') goto LAB_0015a3ef;
                    piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                    lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                    goto LAB_0015a6a8;
                    lVar41 = local_338 * (uVar22 - 1);
                    lVar35 = (uVar22 - 1) * lVar18;
                  }
                  else {
                    uVar29 = uVar22 | 1;
                    lVar41 = local_338 * uVar29;
                    if (cVar28 == '\0') {
                      piVar3 = (int *)(img.accesses_._16_8_ + lVar41 + 8 + lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar40 = uVar29 * lVar18;
                      if (*(char *)(lVar27 + 2 + img.img_._16_8_ + lVar40) == '\0')
                      goto LAB_00153717;
                      piVar3 = (int *)(lVar35 + 0xc + lVar27 * 4);
                      *piVar3 = *piVar3 + 1;
                      if (*(char *)(lVar25 + 3 + lVar27) == '\0') goto LAB_0015a4a8;
                    }
                    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 4 + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar27 + 1 + uVar29 * lVar18 + img.img_._16_8_) == '\0')
                    goto LAB_0015374c;
                    lVar41 = local_338 * (uVar22 - 1);
                    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 0xc + lVar27 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar35 = (uVar22 - 1) * lVar18;
                    if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar35) != '\0') goto LAB_00159f84;
                  }
                  piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  if (*(char *)(lVar27 + 2 + lVar35 + img.img_._16_8_) != '\0') goto LAB_0015a283;
                  lVar18 = local_340 * uVar22 + local_300;
                  piVar3 = (int *)(lVar18 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                  piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
                  local_380 = local_300;
                  local_2d8 = local_1e8;
                  goto LAB_0015b9d6;
                }
                local_338 = *(long *)img.accesses_._72_8_;
                lVar35 = local_338 * uVar22 + img.accesses_._16_8_;
                piVar3 = (int *)(lVar35 + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar18 = *(long *)img.img_._72_8_;
                lVar41 = lVar18 * uVar22 + img.img_._16_8_;
                uVar21 = uVar22 | 1;
                if (*(char *)(lVar27 + 2 + lVar41) == '\0') break;
                piVar3 = (int *)(local_338 * uVar21 + img.accesses_._16_8_ + 4 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar27 + 1 + uVar21 * lVar18 + img.img_._16_8_) == '\0') {
                  uVar23 = uVar23 & 0xffffffff;
                  goto LAB_001535cc;
                }
                lVar25 = local_338 * (uVar22 - 1);
                piVar3 = (int *)(lVar25 + img.accesses_._16_8_ + 0xc + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar40 = (uVar22 - 1) * lVar18;
                if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar40) != '\0') {
                  uVar21 = uVar23 & 0xffffffff;
                  goto LAB_00159e33;
                }
                piVar3 = (int *)(lVar35 + 0xc + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar41 + 3 + lVar27) != '\0') goto LAB_00157976;
                piVar3 = (int *)(lVar25 + img.accesses_._16_8_ + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(img.img_._16_8_ + lVar40 + 2 + lVar27) == '\0') {
                  piVar3 = (int *)(local_300 + local_340 * uVar22 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                  piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + 8 + lVar27 * 4);
                  *piVar3 = *piVar3 + 1;
                  *(undefined4 *)(local_2e0 * uVar22 + local_2e8 + 8 + lVar27 * 4) = uVar12;
                  local_1f0 = local_2e0;
                  local_1e8 = local_2e8;
                  uVar21 = uVar23 & 0xffffffff;
LAB_0015b29d:
                  while( true ) {
                    iVar19 = (int)uVar21;
                    local_300 = local_2f8;
                    local_340 = local_2f0;
                    local_2e8 = local_1e8;
                    local_2e0 = local_1f0;
LAB_00155baa:
                    lVar32 = (long)iVar19;
                    uVar23 = lVar32 + 2;
                    iVar13 = (int)uVar23;
                    uVar21 = uVar23;
                    if (local_2d0 <= iVar13) {
                      local_338 = *(long *)img.accesses_._72_8_;
                      piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 8 + lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      lVar18 = *(long *)img.img_._72_8_;
                      cVar28 = *(char *)(lVar32 + 2 + lVar18 * uVar22 + img.img_._16_8_);
                      if (iVar13 <= local_2d0) {
                        if (cVar28 == '\0') goto LAB_00156815;
                        lVar41 = local_338 * (uVar22 | 1);
                        lVar40 = (uVar22 | 1) * lVar18;
                        goto LAB_0015686c;
                      }
                      if (cVar28 == '\0') goto LAB_0015a3ef;
                      piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                      lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_3c8 = (long *)img.img_._16_8_;
                      if (*(char *)(lVar32 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                      goto LAB_0015a6a8;
                      local_338 = local_338 * (uVar22 - 1);
                      lVar18 = lVar18 * (uVar22 - 1);
                      goto LAB_00156a3f;
                    }
                    local_338 = *(long *)img.accesses_._72_8_;
                    lVar40 = local_338 * uVar22 + img.accesses_._16_8_;
                    piVar3 = (int *)(lVar40 + 8 + lVar32 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = *(long *)img.img_._72_8_;
                    lVar27 = lVar18 * uVar22 + img.img_._16_8_;
                    if (*(char *)(lVar32 + 2 + lVar27) == '\0') goto LAB_00155ec3;
                    piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 +
                                    lVar32 * 4);
                    *piVar3 = *piVar3 + 1;
                    if (*(char *)(lVar32 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0')
                    goto LAB_001535cc;
                    lVar41 = local_338 * (uVar22 - 1);
                    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 0xc + lVar32 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar35 = (uVar22 - 1) * lVar18;
                    if (*(char *)(lVar32 + 3 + lVar35 + img.img_._16_8_) != '\0') {
                      piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + 8 + lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + 8 + lVar32 * 4);
                      piVar3 = (int *)(local_340 * uVar22 + local_300 + lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 +
                                                               lVar32 * 4));
                      piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                                       img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
                      *piVar3 = *piVar3 + 1;
                      local_360 = uVar23;
                      goto LAB_00157d1d;
                    }
                    piVar3 = (int *)(lVar40 + 0xc + lVar32 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar21 = uVar23 & 0xffffffff;
                    uVar16 = uVar23;
                    if (*(char *)(lVar27 + 3 + lVar32) != '\0') goto LAB_001566fe;
LAB_00157113:
                    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    lVar18 = (long)(int)uVar21;
                    if (*(char *)(uVar16 + lVar35 + img.img_._16_8_) != '\0') break;
                    local_328 = *(ulong *)img_labels.accesses_._72_8_;
                    lVar32 = local_328 * uVar22 + img_labels.accesses_._16_8_;
                    piVar3 = (int *)(lVar32 + -8 + lVar18 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_1f8 = *(long *)img_labels.img_._72_8_;
                    lVar27 = local_1f8 * uVar22 + img_labels.img_._16_8_;
                    uVar12 = *(undefined4 *)(lVar27 + -8 + lVar18 * 4);
                    piVar3 = (int *)(lVar32 + uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    *(undefined4 *)(lVar27 + uVar16 * 4) = uVar12;
                    local_3c0 = img_labels.accesses_._16_8_;
                    local_3b8 = img_labels.accesses_._16_8_;
                    local_3b0 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.accesses_._16_8_;
                    local_398 = (long *)img_labels.img_._16_8_;
                    local_390 = img_labels.img_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_358 = img_labels.img_._16_8_;
                    local_348 = img_labels.accesses_._16_8_;
                    local_320 = (long *)img_labels.img_._72_8_;
                    local_2f8 = img_labels.accesses_._16_8_;
                    local_2f0 = local_328;
                    local_2d8 = img_labels.img_._16_8_;
                    local_1f0 = local_1f8;
                    local_1e8 = img_labels.img_._16_8_;
                  }
                  piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar16 * 4);
                  piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + lVar18 * 4);
                  *piVar3 = *piVar3 + 1;
                  uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8 +
                                                           lVar18 * 4));
                  local_328 = *(ulong *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_1f0 = *(long *)img_labels.img_._72_8_;
                  uVar23 = uVar21;
LAB_001571bc:
                  local_390 = img_labels.img_._16_8_;
                  local_388 = img_labels.img_._16_8_;
                  local_380 = img_labels.accesses_._16_8_;
                  local_370 = img_labels.img_._16_8_;
                  local_378 = img_labels.accesses_._16_8_;
                  local_398 = (long *)img_labels.img_._16_8_;
                  local_3c0 = img_labels.accesses_._16_8_;
                  local_358 = img_labels.img_._16_8_;
                  local_3b8 = img_labels.accesses_._16_8_;
                  local_2d8 = img_labels.img_._16_8_;
                  local_348 = img_labels.accesses_._16_8_;
                  local_2e8 = img_labels.img_._16_8_;
                  local_2f8 = img_labels.accesses_._16_8_;
                  local_3a0 = img_labels.accesses_._16_8_;
                  local_300 = img_labels.accesses_._16_8_;
                  uVar21 = uVar23;
                  local_1e8 = img_labels.img_._16_8_;
                  local_3b0 = (long *)img_labels.accesses_._72_8_;
                  local_340 = local_328;
                  local_320 = (long *)img_labels.img_._72_8_;
                  local_2f0 = local_328;
                  local_2e0 = local_1f0;
                  local_1f8 = local_1f0;
                }
                else {
LAB_0015aadf:
                  uVar21 = uVar23 & 0xffffffff;
                  lVar32 = uVar22 - 2;
                  uVar16 = (ulong)(int)uVar23;
                  piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + -4 + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  cVar28 = *(char *)((uVar16 - 1) + lVar18 * lVar32 + img.img_._16_8_);
                  local_328 = *(ulong *)img_labels.accesses_._72_8_;
                  piVar3 = (int *)(local_328 * lVar32 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar3 = *piVar3 + 1;
                  local_1f0 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(uint *)(lVar32 * local_1f0 + img_labels.img_._16_8_ + uVar16 * 4);
                  if (cVar28 == '\0') {
                    piVar3 = (int *)(img_labels.accesses_._16_8_ + local_328 * uVar22 + -8 +
                                    uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    uVar10 = RemSP::MemMerge(uVar10,*(uint *)(img_labels.img_._16_8_ +
                                                              local_1f0 * uVar22 + -8 + uVar16 * 4))
                    ;
                    local_328 = *(ulong *)img_labels.accesses_._72_8_;
                    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_1f0 = *(long *)img_labels.img_._72_8_;
                    local_1e8 = img_labels.img_._16_8_;
                    local_3c0 = img_labels.accesses_._16_8_;
                    local_3b8 = img_labels.accesses_._16_8_;
                    local_3b0 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.accesses_._16_8_;
                    local_398 = (long *)img_labels.img_._16_8_;
                    local_390 = img_labels.img_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_358 = img_labels.img_._16_8_;
                    local_348 = img_labels.accesses_._16_8_;
                    local_340 = local_328;
                    local_320 = (long *)img_labels.img_._72_8_;
                    local_300 = img_labels.accesses_._16_8_;
                    local_2f8 = img_labels.accesses_._16_8_;
                    local_2f0 = local_328;
                    local_2e8 = img_labels.img_._16_8_;
                    local_2e0 = local_1f0;
                    local_2d8 = img_labels.img_._16_8_;
                    local_1f8 = local_1f0;
                  }
                  else {
                    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
                    *piVar3 = *piVar3 + 1;
                    local_1e8 = img_labels.img_._16_8_;
                    local_3c0 = img_labels.accesses_._16_8_;
                    local_3b8 = img_labels.accesses_._16_8_;
                    local_3b0 = (long *)img_labels.accesses_._72_8_;
                    local_3a0 = img_labels.accesses_._16_8_;
                    local_398 = (long *)img_labels.img_._16_8_;
                    local_390 = img_labels.img_._16_8_;
                    local_388 = img_labels.img_._16_8_;
                    local_380 = img_labels.accesses_._16_8_;
                    local_378 = img_labels.accesses_._16_8_;
                    local_370 = img_labels.img_._16_8_;
                    local_358 = img_labels.img_._16_8_;
                    local_348 = img_labels.accesses_._16_8_;
                    local_340 = local_328;
                    local_320 = (long *)img_labels.img_._72_8_;
                    local_300 = img_labels.accesses_._16_8_;
                    local_2f8 = img_labels.accesses_._16_8_;
                    local_2f0 = local_328;
                    local_2e8 = img_labels.img_._16_8_;
                    local_2e0 = local_1f0;
                    local_2d8 = img_labels.img_._16_8_;
                    local_1f8 = local_1f0;
                  }
                }
              }
              lVar25 = local_338 * uVar21 + img.accesses_._16_8_;
              piVar3 = (int *)(lVar25 + 8 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = uVar21 * lVar18 + img.img_._16_8_;
              lVar32 = img.accesses_._16_8_;
              if (*(char *)(lVar27 + 2 + lVar40) == '\0') {
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_00153acd;
              }
              piVar3 = (int *)(lVar35 + 0xc + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar41 + 3 + lVar27) == '\0') {
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_0015607a;
              }
              piVar3 = (int *)(lVar25 + 4 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar40 + 1 + lVar27) == '\0') {
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_00153af5;
              }
              lVar25 = local_338 * (uVar22 - 1);
              piVar3 = (int *)(img.accesses_._16_8_ + lVar25 + 0xc + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = (uVar22 - 1) * lVar18;
              if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar40) != '\0') goto LAB_0015a17d;
LAB_00157976:
              lVar25 = lVar25 + img.accesses_._16_8_;
              piVar3 = (int *)(lVar25 + 0x10 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              lVar40 = lVar40 + img.img_._16_8_;
              if (*(char *)(lVar27 + 4 + lVar40) == '\0') {
                piVar3 = (int *)(lVar25 + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                if (*(char *)(lVar40 + 2 + lVar27) != '\0') goto LAB_0015acab;
                lVar18 = local_2f0 * uVar22 + local_2f8;
                piVar3 = (int *)(lVar18 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                lVar32 = local_2e0 * uVar22 + local_2e8;
                uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
                piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_00157c21;
              }
              lVar32 = uVar22 - 2;
              piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 + 0xc + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              lVar41 = lVar18 * lVar32;
              if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar41) != '\0') {
                uVar21 = uVar23 & 0xffffffff;
                goto LAB_0015a614;
              }
              piVar3 = (int *)(lVar25 + 8 + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              if (*(char *)(lVar40 + 2 + lVar27) == '\0') {
                piVar3 = (int *)(local_2f0 * lVar32 + local_2f8 + 0x10 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = *(uint *)(lVar32 * local_2e0 + local_2e8 + 0x10 + lVar27 * 4);
                piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 +
                                                         lVar27 * 4));
                local_328 = *(ulong *)img_labels.accesses_._72_8_;
                piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
                *piVar3 = *piVar3 + 1;
                local_1f8 = *(long *)img_labels.img_._72_8_;
                uVar21 = uVar23 & 0xffffffff;
                lVar32 = img_labels.accesses_._16_8_;
                local_1f0 = local_1f8;
                local_320 = (long *)img_labels.img_._72_8_;
                local_1e8 = img_labels.img_._16_8_;
                local_2d8 = img_labels.img_._16_8_;
                local_3c0 = img_labels.accesses_._16_8_;
                local_3b8 = img_labels.accesses_._16_8_;
                local_3b0 = (long *)img_labels.accesses_._72_8_;
                local_3a0 = img_labels.accesses_._16_8_;
                local_398 = (long *)img_labels.img_._16_8_;
                local_390 = img_labels.img_._16_8_;
                local_388 = img_labels.img_._16_8_;
                local_380 = img_labels.accesses_._16_8_;
                local_378 = img_labels.accesses_._16_8_;
                local_370 = img_labels.img_._16_8_;
                local_358 = img_labels.img_._16_8_;
                goto LAB_00153fc1;
              }
              uVar21 = uVar23 & 0xffffffff;
              goto LAB_0015ae9e;
            }
LAB_0015398a:
            lVar27 = (long)(int)uVar21;
            piVar3 = (int *)(local_338 * (uVar22 | 1) + lVar32 + lVar27 * 4);
            *piVar3 = *piVar3 + 1;
            local_3c8 = local_3c8;
            if (*(char *)(lVar27 + (uVar22 | 1) * lVar18 + (long)local_3c8) == '\0')
            goto LAB_00153acd;
            piVar3 = (int *)(local_338 * uVar22 + lVar32 + 4 + lVar27 * 4);
            *piVar3 = *piVar3 + 1;
            local_3c8 = local_3c8;
            if (*(char *)(lVar27 + 1 + lVar18 * uVar22 + (long)local_3c8) == '\0') {
              uVar10 = RemSP::MemNewLabel();
              local_328 = *(ulong *)img_labels.accesses_._72_8_;
              piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
              *piVar3 = *piVar3 + 1;
              local_1f8 = *(long *)img_labels.img_._72_8_;
              *(uint *)(local_1f8 * uVar22 + img_labels.img_._16_8_ + lVar27 * 4) = uVar10;
              local_300 = img_labels.accesses_._16_8_;
              local_1f0 = local_1f8;
              local_320 = (long *)img_labels.img_._72_8_;
              local_1e8 = img_labels.img_._16_8_;
              local_3c0 = img_labels.accesses_._16_8_;
              local_3b8 = img_labels.accesses_._16_8_;
              local_3b0 = (long *)img_labels.accesses_._72_8_;
              local_3a0 = img_labels.accesses_._16_8_;
              local_398 = (long *)img_labels.img_._16_8_;
              local_390 = img_labels.img_._16_8_;
              local_388 = img_labels.img_._16_8_;
              local_380 = img_labels.accesses_._16_8_;
              local_378 = img_labels.accesses_._16_8_;
              local_370 = img_labels.img_._16_8_;
              local_358 = img_labels.img_._16_8_;
              local_348 = img_labels.accesses_._16_8_;
              local_340 = local_328;
              local_2f8 = img_labels.accesses_._16_8_;
              local_2f0 = local_328;
              local_2e8 = img_labels.img_._16_8_;
              local_2e0 = local_1f8;
              local_2d8 = img_labels.img_._16_8_;
              goto LAB_001561a1;
            }
            goto LAB_00153af5;
          }
          lVar32 = img.accesses_._16_8_ + local_338 * (uVar22 - 1);
          piVar3 = (int *)(lVar32 + 4 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          lVar18 = img.img_._16_8_ + lVar18 * (uVar22 - 1);
          if (*(char *)(uVar23 + 1 + lVar18) != '\0') {
            lVar32 = *local_3b0;
            piVar3 = (int *)(lVar32 * (uVar22 - 2) + local_348 + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            lVar18 = *local_320;
            uVar10 = *(uint *)((uVar22 - 2) * lVar18 + local_2d8 + uVar23 * 4);
            piVar3 = (int *)(lVar32 * uVar22 + local_348 + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            local_368 = uVar21;
            uVar21 = uVar23;
            local_358 = local_2d8;
            goto LAB_00159593;
          }
          uVar23 = (ulong)iVar19;
          piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          if (*(char *)(lVar18 + 2 + uVar23) != '\0') {
            local_328 = *local_3b0;
            piVar3 = (int *)(local_328 * (uVar22 - 2) + local_348 + 8 + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            local_1f8 = *local_320;
            uVar10 = *(uint *)((uVar22 - 2) * local_1f8 + local_2d8 + 8 + uVar23 * 4);
            piVar3 = (int *)(local_328 * uVar22 + local_348 + uVar23 * 4);
            *piVar3 = *piVar3 + 1;
            lVar32 = local_348;
            local_1f0 = local_1f8;
            local_1e8 = local_2d8;
            goto LAB_00153fc1;
          }
          uVar10 = RemSP::MemNewLabel();
          local_3c0 = img_labels.accesses_._16_8_;
          local_3b0 = (long *)img_labels.accesses_._72_8_;
          local_328 = *(ulong *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + (long)iVar19 * 4);
          *piVar3 = *piVar3 + 1;
          local_398 = (long *)img_labels.img_._16_8_;
          local_2e0 = *(long *)img_labels.img_._72_8_;
          *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + (long)iVar19 * 4) = uVar10;
          local_320 = (long *)img_labels.img_._72_8_;
          local_390 = img_labels.img_._16_8_;
          local_3b8 = local_3c0;
          local_3a0 = local_3c0;
          local_388 = (long)local_398;
          local_380 = local_3c0;
          local_378 = local_3c0;
          local_370 = (long)local_398;
          local_358 = (long)local_398;
          local_348 = local_3c0;
          local_2f8 = local_3c0;
          local_2f0 = local_328;
          local_2e8 = (long)local_398;
          local_2d8 = (long)local_398;
          local_1f8 = local_2e0;
        } while( true );
      }
      piVar3 = (int *)(lVar32 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + lVar27) == '\0') {
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                 lVar27 * 4));
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                         + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f0 = *(long *)img_labels.img_._72_8_;
        local_390 = img_labels.img_._16_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_358 = img_labels.img_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_348 = img_labels.accesses_._16_8_;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
      }
      else {
LAB_0015acab:
        uVar21 = uVar23 & 0xffffffff;
        lVar32 = uVar22 - 2;
        uVar16 = (ulong)(int)uVar23;
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + -4 +
                        uVar16 * 4);
        *piVar3 = *piVar3 + 1;
        cVar28 = *(char *)((uVar16 - 1) + lVar18 * lVar32 + img.img_._16_8_);
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * lVar32 + img_labels.accesses_._16_8_ + uVar16 * 4);
        *piVar3 = *piVar3 + 1;
        local_398 = (long *)img_labels.img_._16_8_;
        local_1f0 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * local_1f0 + img_labels.img_._16_8_ + uVar16 * 4);
        if (cVar28 == '\0') {
          piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 * uVar22 + -8 + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = RemSP::MemMerge(uVar10,*(uint *)(img_labels.img_._16_8_ + local_1f0 * uVar22 + -8
                                                   + uVar16 * 4));
          local_3b0 = (long *)img_labels.accesses_._72_8_;
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          local_1f0 = *(long *)img_labels.img_._72_8_;
          local_3a0 = img_labels.accesses_._16_8_;
          local_388 = img_labels.img_._16_8_;
          local_370 = img_labels.img_._16_8_;
          local_378 = img_labels.accesses_._16_8_;
          local_398 = (long *)img_labels.img_._16_8_;
          local_3c0 = img_labels.accesses_._16_8_;
          local_358 = img_labels.img_._16_8_;
          local_3b8 = img_labels.accesses_._16_8_;
          local_390 = img_labels.img_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
          local_380 = img_labels.accesses_._16_8_;
          local_348 = img_labels.accesses_._16_8_;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1e8 = img_labels.img_._16_8_;
        }
        else {
          piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar3 = *piVar3 + 1;
          local_320 = (long *)img_labels.img_._72_8_;
          local_1e8 = img_labels.img_._16_8_;
          local_3b8 = local_3c0;
          local_3a0 = local_3c0;
          local_390 = (long)local_398;
          local_388 = (long)local_398;
          local_380 = local_3c0;
          local_378 = local_3c0;
          local_370 = (long)local_398;
          local_358 = (long)local_398;
          local_348 = local_3c0;
          local_2d8 = (long)local_398;
        }
      }
      goto LAB_00153cbb;
    }
    lVar35 = uVar22 - 2;
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar35 + img.accesses_._16_8_ + 0xc +
                    lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar41 = lVar18 * lVar35;
    lVar40 = *(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_;
    if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar41) == '\0') {
      piVar3 = (int *)(lVar40 + 8 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + 2 + lVar27) == '\0') goto LAB_0015af98;
      piVar3 = (int *)(lVar32 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + lVar27) != '\0') {
LAB_0015ae9e:
        lVar18 = uVar22 - 2;
        uVar23 = (ulong)(int)uVar21;
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar18 + img.accesses_._16_8_ + -4 +
                        uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)((uVar23 - 1) + lVar41 + img.img_._16_8_) != '\0') goto LAB_0015aeca;
        lVar32 = *(long *)img_labels.accesses_._72_8_ * lVar18 + img_labels.accesses_._16_8_;
        uVar23 = (ulong)(int)uVar21;
        piVar3 = (int *)(lVar32 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = lVar18 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
        uVar10 = *(uint *)(lVar18 + uVar23 * 4);
        piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar18 + 8 + uVar23 * 4));
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                         + -8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + -8 +
                          uVar23 * 4);
        goto LAB_0015af20;
      }
      lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar35 + img_labels.accesses_._16_8_;
      piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar32 = lVar35 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
      uVar10 = *(uint *)(lVar32 + 8 + lVar27 * 4);
      piVar3 = (int *)(lVar18 + 0x10 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 + 0x10 + lVar27 * 4));
      piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_ +
                      lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      uVar14 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ +
                        lVar27 * 4);
    }
    else {
      piVar3 = (int *)(lVar40 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar25 + lVar27) != '\0') {
LAB_0015a614:
        uVar23 = (ulong)(int)uVar21;
        piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 2) + img.accesses_._16_8_ + -4 +
                        uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        if (*(char *)((uVar23 - 1) + lVar41 + img.img_._16_8_) != '\0') goto LAB_00159b0c;
LAB_0015aeca:
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + -8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar14 = *(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ + -8 + uVar23 * 4);
LAB_0015af20:
        uVar10 = RemSP::MemMerge(uVar10,uVar14);
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        lVar32 = img_labels.accesses_._16_8_;
        local_1f0 = local_1f8;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
        goto LAB_00153fc1;
      }
LAB_0015af98:
      lVar18 = *(long *)img_labels.accesses_._72_8_;
      piVar3 = (int *)(lVar18 * lVar35 + img_labels.accesses_._16_8_ + 0x10 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar32 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(uint *)(lVar35 * lVar32 + img_labels.img_._16_8_ + 0x10 + lVar27 * 4);
      piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      uVar14 = *(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ + lVar27 * 4);
    }
    uVar10 = RemSP::MemMerge(uVar10,uVar14);
    local_328 = *(ulong *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f8 = *(long *)img_labels.img_._72_8_;
    lVar32 = img_labels.accesses_._16_8_;
    local_1f0 = local_1f8;
    local_320 = (long *)img_labels.img_._72_8_;
    local_1e8 = img_labels.img_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    local_3c0 = img_labels.accesses_._16_8_;
    local_3b8 = img_labels.accesses_._16_8_;
    local_3b0 = (long *)img_labels.accesses_._72_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_398 = (long *)img_labels.img_._16_8_;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_358 = img_labels.img_._16_8_;
    goto LAB_00153fc1;
  }
  local_338 = *(long *)img.accesses_._72_8_;
  lVar32 = local_338 * uVar22 + img.accesses_._16_8_;
  piVar3 = (int *)(lVar32 + 8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  lVar18 = *(long *)img.img_._72_8_;
  lVar35 = lVar18 * uVar22 + img.img_._16_8_;
  cVar28 = *(char *)(lVar27 + 2 + lVar35);
  if (local_2d0 < (int)uVar21) {
    if (cVar28 == '\0') goto LAB_0015a3ef;
    piVar3 = (int *)(local_338 * (uVar22 | 1) + img.accesses_._16_8_ + 4 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar27 + 1 + (uVar22 | 1) * lVar18 + img.img_._16_8_) == '\0') goto LAB_0015a6a8;
    lVar32 = local_338 * (uVar22 - 1);
    lVar41 = (uVar22 - 1) * lVar18;
  }
  else {
    uVar29 = uVar22 | 1;
    lVar41 = local_338 * uVar29;
    if (cVar28 == '\0') {
      piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 8 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      lVar40 = uVar29 * lVar18;
      if (*(char *)(lVar27 + 2 + img.img_._16_8_ + lVar40) == '\0') goto LAB_00153717;
      piVar3 = (int *)(lVar32 + 0xc + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar35 + 3 + lVar27) == '\0') {
LAB_0015a4a8:
        iVar19 = (int)uVar23;
        goto LAB_0015a419;
      }
    }
    piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + 4 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar27 + 1 + uVar29 * lVar18 + img.img_._16_8_) == '\0') goto LAB_0015374c;
    lVar32 = local_338 * (uVar22 - 1);
    piVar3 = (int *)(lVar32 + img.accesses_._16_8_ + 0xc + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar41 = (uVar22 - 1) * lVar18;
    if (*(char *)(lVar27 + 3 + img.img_._16_8_ + lVar41) != '\0') {
      piVar3 = (int *)(lVar32 + img.accesses_._16_8_ + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(img.img_._16_8_ + lVar41 + lVar27) == '\0') {
        lVar18 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        lVar32 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + 8 + lVar27 * 4);
        piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ +
                                                 lVar27 * 4));
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                         + 8 + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + 8 + lVar27 * 4
                 ) = uVar10;
        local_380 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        goto LAB_0015b9d6;
      }
LAB_00159f84:
      lVar32 = uVar22 - 2;
      uVar10 = (uint)uVar23;
      lVar27 = (long)(int)uVar10;
      piVar3 = (int *)(local_338 * lVar32 + img.accesses_._16_8_ + -4 + lVar27 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(lVar27 + -1 + lVar18 * lVar32 + img.img_._16_8_) == '\0') {
        lVar35 = *(long *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(lVar35 * lVar32 + img_labels.accesses_._16_8_ + lVar27 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar32 * lVar18 + img_labels.img_._16_8_ + lVar27 * 4);
        lVar32 = lVar35 * uVar22 + img_labels.accesses_._16_8_;
        goto LAB_0015a7c2;
      }
      lVar32 = lVar18 * (uVar22 - 1);
      goto LAB_00159fbd;
    }
  }
  piVar3 = (int *)(lVar32 + img.accesses_._16_8_ + 8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar27 + 2 + img.img_._16_8_ + lVar41) != '\0') goto LAB_0015a26b;
  lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_;
  piVar3 = (int *)(lVar18 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
  uVar12 = *(undefined4 *)(lVar32 + lVar27 * 4);
  piVar3 = (int *)(lVar18 + 8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(lVar32 + 8 + lVar27 * 4) = uVar12;
  local_380 = img_labels.accesses_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  goto LAB_0015b9d6;
LAB_0015a26b:
  uVar10 = (uint)uVar21;
  lVar27 = (long)(int)uVar10;
  piVar3 = (int *)(lVar32 + img.accesses_._16_8_ + -8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar27 + -2 + lVar41 + img.img_._16_8_) != '\0') goto LAB_0015a283;
  lVar32 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(lVar32 * (uVar22 - 2) + img_labels.accesses_._16_8_ + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  lVar18 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)((uVar22 - 2) * lVar18 + img_labels.img_._16_8_ + lVar27 * 4);
  lVar32 = lVar32 * uVar22 + img_labels.accesses_._16_8_;
LAB_0015a7c2:
  piVar3 = (int *)(lVar32 + -8 + lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  uVar14 = *(uint *)(lVar18 * uVar22 + img_labels.img_._16_8_ + -8 + lVar27 * 4);
  goto LAB_0015a7d2;
code_r0x00157c87:
  local_338 = local_338 * (uVar22 - 1);
  piVar3 = (int *)(img.accesses_._16_8_ + local_338 + 0xc + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  lVar18 = lVar18 * (uVar22 - 1);
  if (*(char *)(lVar32 + 3 + lVar18 + img.img_._16_8_) != '\0') {
    piVar3 = (int *)(local_2f0 * (uVar22 - 2) + local_2f8 + 8 + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = *(uint *)((uVar22 - 2) * local_2e0 + local_2e8 + 8 + lVar32 * 4);
    piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar32 * 4));
    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_ + 8
                    + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
LAB_00157d1d:
    local_1f0 = *(long *)img_labels.img_._72_8_;
    uVar29 = local_360;
    goto LAB_00157d35;
  }
  piVar3 = (int *)(lVar35 + 0xc + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar27 + 3 + lVar32) != '\0') goto LAB_00157f7b;
  piVar3 = (int *)(local_2f8 + local_2f0 * uVar22 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  uVar12 = *(undefined4 *)(local_2e8 + local_2e0 * uVar22 + lVar32 * 4);
  piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + 8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(local_2e0 * uVar22 + local_2e8 + 8 + lVar32 * 4) = uVar12;
  local_398 = local_398;
  local_348 = local_348;
  local_3b8 = local_3b8;
  goto LAB_00159d37;
LAB_00157f7b:
  piVar3 = (int *)(img.accesses_._16_8_ + local_338 + 0x10 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(lVar32 + 4 + img.img_._16_8_ + lVar18) != '\0') goto code_r0x00157f91;
  local_2f8 = local_2f8 + local_2f0 * uVar22;
  piVar3 = (int *)(local_2f8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  local_2e8 = local_2e8 + local_2e0 * uVar22;
  uVar12 = *(undefined4 *)(local_2e8 + lVar32 * 4);
  piVar3 = (int *)(local_2f8 + 8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(local_2e8 + 8 + lVar32 * 4) = uVar12;
  goto LAB_0015847a;
code_r0x00157f91:
  piVar3 = (int *)(local_2f0 * (uVar22 - 2) + local_2f8 + 0x10 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  uVar10 = *(uint *)((uVar22 - 2) * local_2e0 + local_2e8 + 0x10 + lVar32 * 4);
  piVar3 = (int *)(local_2f0 * uVar22 + local_2f8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_2e0 * uVar22 + local_2e8 + lVar32 * 4));
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + 8 + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  lVar32 = img_labels.accesses_._16_8_;
  uVar23 = uVar21;
  local_1f0 = local_1f8;
  local_320 = (long *)img_labels.img_._72_8_;
  local_1e8 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_3a0 = img_labels.accesses_._16_8_;
  local_398 = (long *)img_labels.img_._16_8_;
  local_390 = img_labels.img_._16_8_;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_358 = img_labels.img_._16_8_;
  goto LAB_00153fc1;
LAB_00155ec3:
  lVar35 = local_338 * (uVar22 | 1) + img.accesses_._16_8_;
  lVar40 = (long)(int)uVar21;
  piVar3 = (int *)(lVar35 + lVar40 * 4);
  *piVar3 = *piVar3 + 1;
  lVar27 = (uVar22 | 1) * lVar18 + img.img_._16_8_;
  local_3c8 = (long *)img.img_._16_8_;
  lVar32 = img.accesses_._16_8_;
  if (*(char *)(lVar40 + lVar27) != '\0') {
    piVar3 = (int *)(local_338 * uVar22 + img.accesses_._16_8_ + 4 + lVar40 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar40 + 1 + lVar18 * uVar22 + img.img_._16_8_) == '\0') goto LAB_0015607a;
    piVar3 = (int *)(lVar35 + -4 + lVar40 * 4);
    *piVar3 = *piVar3 + 1;
    if (*(char *)(lVar27 + -1 + lVar40) != '\0') {
      lVar40 = lVar40 + 1;
      local_368 = uVar21;
LAB_00155f66:
      lVar41 = local_338 * (uVar22 - 1);
      piVar3 = (int *)(img.accesses_._16_8_ + lVar41 + lVar40 * 4);
      *piVar3 = *piVar3 + 1;
      lVar35 = (uVar22 - 1) * lVar18;
      if (*(char *)(lVar40 + img.img_._16_8_ + lVar35) != '\0') {
        uVar21 = (ulong)(int)local_368;
        piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar21 * 4);
        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + uVar21 * 4))
        ;
        piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_
                        + uVar21 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = *(long *)img_labels.img_._72_8_;
        local_358 = img_labels.img_._16_8_;
        goto LAB_00159593;
      }
      uVar23 = local_368 & 0xffffffff;
LAB_001566fe:
      uVar21 = uVar23;
      uVar23 = (ulong)(int)uVar21;
      piVar3 = (int *)(img.accesses_._16_8_ + lVar41 + 8 + uVar23 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(uVar23 + 2 + img.img_._16_8_ + lVar35) == '\0') goto LAB_00156ad5;
      lVar32 = uVar22 - 2;
      piVar3 = (int *)(img.accesses_._16_8_ + local_338 * lVar32 + 4 + uVar23 * 4);
      *piVar3 = *piVar3 + 1;
      if (*(char *)(uVar23 + 1 + img.img_._16_8_ + lVar18 * lVar32) == '\0') {
        uVar29 = (ulong)(int)uVar21;
        piVar3 = (int *)(img.accesses_._16_8_ + lVar41 + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        lVar18 = local_340 * lVar32 + local_300;
        lVar32 = lVar32 * local_1f0 + local_1e8;
        if (*(char *)(img.img_._16_8_ + lVar35 + uVar29) == '\0') {
          piVar3 = (int *)(lVar18 + 8 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          uVar14 = *(uint *)(lVar32 + 8 + uVar23 * 4);
          piVar3 = (int *)(local_300 + local_340 * uVar22 + -8 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = *(uint *)(local_1e8 + local_1f0 * uVar22 + -8 + uVar29 * 4);
        }
        else {
          piVar3 = (int *)(lVar18 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = *(uint *)(lVar32 + uVar29 * 4);
          piVar3 = (int *)(lVar18 + 8 + uVar23 * 4);
          *piVar3 = *piVar3 + 1;
          uVar14 = RemSP::MemMerge(uVar10,*(uint *)(lVar32 + 8 + uVar23 * 4));
          piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 +
                           img_labels.accesses_._16_8_ + -8 + uVar29 * 4);
          *piVar3 = *piVar3 + 1;
          uVar10 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_ + -8
                            + uVar29 * 4);
        }
        uVar10 = RemSP::MemMerge(uVar14,uVar10);
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar29 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        uVar21 = uVar21 & 0xffffffff;
        lVar32 = img_labels.accesses_._16_8_;
        uVar23 = uVar29;
        local_1f0 = local_1f8;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
      }
      else {
        piVar3 = (int *)(local_340 * lVar32 + local_300 + 8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = *(uint *)(lVar32 * local_1f0 + local_1e8 + 8 + uVar23 * 4);
        piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + uVar23 * 4))
        ;
        local_328 = *(ulong *)img_labels.accesses_._72_8_;
        piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
        *piVar3 = *piVar3 + 1;
        local_1f8 = *(long *)img_labels.img_._72_8_;
        uVar21 = uVar21 & 0xffffffff;
        lVar32 = img_labels.accesses_._16_8_;
        local_1f0 = local_1f8;
        local_320 = (long *)img_labels.img_._72_8_;
        local_1e8 = img_labels.img_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_3c0 = img_labels.accesses_._16_8_;
        local_3b8 = img_labels.accesses_._16_8_;
        local_3b0 = (long *)img_labels.accesses_._72_8_;
        local_3a0 = img_labels.accesses_._16_8_;
        local_398 = (long *)img_labels.img_._16_8_;
        local_390 = img_labels.img_._16_8_;
        local_388 = img_labels.img_._16_8_;
        local_380 = img_labels.accesses_._16_8_;
        local_378 = img_labels.accesses_._16_8_;
        local_370 = img_labels.img_._16_8_;
        local_358 = img_labels.img_._16_8_;
      }
      goto LAB_00153fc1;
    }
    goto LAB_00153af5;
  }
LAB_00153acd:
  piVar3 = (int *)(local_338 * uVar22 + lVar32 + 4 + (long)(int)uVar21 * 4);
  *piVar3 = *piVar3 + 1;
  uVar23 = uVar21 & 0xffffffff;
  if (*(char *)((long)(int)uVar21 + 1 + lVar18 * uVar22 + (long)local_3c8) != '\0')
  goto LAB_00153af5;
  goto LAB_0015509b;
LAB_00159b0c:
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + uVar23 * 4)
  ;
  *piVar3 = *piVar3 + 1;
  lVar27 = uVar22 - 2;
  local_398 = (long *)img_labels.img_._16_8_;
  local_320 = (long *)img_labels.img_._72_8_;
  lVar32 = img_labels.accesses_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_1e8 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  if (*(char *)(uVar23 + lVar18 * (uVar22 - 1) + img.img_._16_8_) != '\0') {
    local_328 = *(ulong *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_328 * lVar27 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f8 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)(lVar27 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f0 = local_1f8;
    local_3b8 = img_labels.accesses_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_358 = img_labels.img_._16_8_;
    goto LAB_00153fc1;
  }
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  cVar28 = *(char *)(uVar23 + img.img_._16_8_ + lVar18 * lVar27);
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * lVar27 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)(lVar27 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
  if (cVar28 != '\0') {
    piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_380 = img_labels.accesses_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_1f0 = local_1f8;
    local_3b8 = local_3c0;
    local_390 = (long)local_398;
    local_388 = (long)local_398;
    local_378 = local_3c0;
    local_370 = (long)local_398;
    local_358 = (long)local_398;
    goto LAB_00153fc1;
  }
  piVar3 = (int *)(img_labels.accesses_._16_8_ + local_328 * uVar22 + -8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  goto LAB_0015a970;
LAB_0015c49d:
  lVar27 = uVar22 - 2;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + lVar32 * 4);
  *piVar3 = *piVar3 + 1;
  lVar18 = lVar18 * lVar27 + (long)local_3c8;
  iVar19 = (int)uVar21;
  if (*(char *)(lVar32 + lVar18) == '\0') {
    lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar27 + img_labels.accesses_._16_8_;
    lVar32 = (long)iVar19;
    piVar3 = (int *)(lVar18 + -8 + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
    lVar27 = lVar27 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
    uVar10 = *(uint *)(lVar27 + -8 + lVar32 * 4);
    piVar3 = (int *)(lVar18 + 8 + lVar32 * 4);
    *piVar3 = *piVar3 + 1;
  }
  else {
    uVar23 = (ulong)iVar19;
    piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_328 = *(ulong *)img_labels.accesses_._72_8_;
    lVar32 = local_328 * lVar27 + img_labels.accesses_._16_8_;
    if (*(char *)(lVar18 + uVar23) != '\0') {
      piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
      *piVar3 = *piVar3 + 1;
      local_1f8 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(uint *)(lVar27 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
      goto LAB_00153efe;
    }
    piVar3 = (int *)(lVar32 + -8 + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar27 = lVar27 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
    uVar10 = *(uint *)(lVar27 + -8 + uVar23 * 4);
    piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
  }
  uVar23 = (ulong)iVar19;
  uVar14 = *(uint *)(lVar27 + 8 + uVar23 * 4);
  goto LAB_00153f49;
LAB_00156ad5:
  uVar16 = (ulong)(int)uVar21;
  piVar3 = (int *)(lVar41 + img.accesses_._16_8_ + uVar16 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar16 + lVar35 + img.img_._16_8_) != '\0') {
    piVar3 = (int *)(local_340 * (uVar22 - 2) + local_300 + uVar16 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + local_1e8 + uVar16 * 4);
    piVar3 = (int *)(local_340 * uVar22 + local_300 + -8 + uVar16 * 4);
    *piVar3 = *piVar3 + 1;
    uVar10 = RemSP::MemMerge(uVar10,*(uint *)(local_1f0 * uVar22 + local_1e8 + -8 + uVar16 * 4));
    local_3b0 = (long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_ +
                    uVar16 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f0 = *(long *)img_labels.img_._72_8_;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_398 = (long *)img_labels.img_._16_8_;
    local_3c0 = img_labels.accesses_._16_8_;
    local_358 = img_labels.img_._16_8_;
    local_3b8 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_348 = img_labels.accesses_._16_8_;
    local_320 = (long *)img_labels.img_._72_8_;
    local_1e8 = img_labels.img_._16_8_;
    goto LAB_00153cbb;
  }
  local_300 = local_300 + local_340 * uVar22;
  piVar3 = (int *)(local_300 + -8 + uVar16 * 4);
  *piVar3 = *piVar3 + 1;
  local_1e8 = local_1e8 + local_1f0 * uVar22;
  uVar12 = *(undefined4 *)(local_1e8 + -8 + uVar16 * 4);
  piVar3 = (int *)(local_300 + uVar16 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(local_1e8 + uVar16 * 4) = uVar12;
  goto LAB_00157c21;
LAB_00153af5:
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(local_338 * (uVar22 - 1) + lVar32 + 4 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar23 + 1 + (uVar22 - 1) * lVar18 + (long)local_3c8) != '\0') {
    lVar32 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(lVar32 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar18 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)((uVar22 - 2) * lVar18 + img_labels.img_._16_8_ + uVar23 * 4);
    piVar3 = (int *)(lVar32 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_368 = uVar21;
    uVar21 = uVar23;
    local_358 = img_labels.img_._16_8_;
    goto LAB_00159593;
  }
LAB_00153b6a:
  uVar23 = (ulong)(int)uVar21;
  lVar32 = local_338 * (uVar22 - 1) + lVar32;
  piVar3 = (int *)(lVar32 + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  lVar27 = (uVar22 - 1) * lVar18 + (long)local_3c8;
  cVar28 = *(char *)(uVar23 + 2 + lVar27);
  piVar3 = (int *)(lVar32 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  cVar5 = *(char *)(uVar23 + lVar27);
  if (cVar28 != '\0') {
    if (cVar5 != '\0') goto LAB_00153b9f;
    local_328 = *(ulong *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(local_328 * (uVar22 - 2) + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f8 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)((uVar22 - 2) * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
    goto LAB_00153efe;
  }
  if (cVar5 != '\0') {
    local_3b0 = (long *)img_labels.accesses_._72_8_;
    lVar18 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_1f0 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(uint *)((uVar22 - 2) * local_1f0 + img_labels.img_._16_8_ + uVar23 * 4);
    piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    local_390 = img_labels.img_._16_8_;
    local_388 = img_labels.img_._16_8_;
    local_380 = img_labels.accesses_._16_8_;
    local_370 = img_labels.img_._16_8_;
    local_378 = img_labels.accesses_._16_8_;
    local_398 = (long *)img_labels.img_._16_8_;
    local_3c0 = img_labels.accesses_._16_8_;
    local_358 = img_labels.img_._16_8_;
    local_3b8 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    local_3a0 = img_labels.accesses_._16_8_;
    local_348 = img_labels.accesses_._16_8_;
    uVar16 = uVar23;
    local_320 = (long *)img_labels.img_._72_8_;
    local_1e8 = img_labels.img_._16_8_;
    goto LAB_00153cbb;
  }
  uVar10 = RemSP::MemNewLabel();
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_2e0 = *(long *)img_labels.img_._72_8_;
  *(uint *)(local_2e0 * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = uVar10;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_398 = (long *)img_labels.img_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_358 = img_labels.img_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_348 = img_labels.accesses_._16_8_;
  local_2e8 = img_labels.img_._16_8_;
  local_3a0 = img_labels.accesses_._16_8_;
  local_2f8 = img_labels.accesses_._16_8_;
  local_320 = (long *)img_labels.img_._72_8_;
  local_390 = img_labels.img_._16_8_;
  local_2f0 = local_328;
  local_1f8 = local_2e0;
  goto LAB_00157c21;
LAB_00153b9f:
  lVar32 = uVar22 - 2;
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + 4 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar23 + 1 + lVar18 * lVar32 + (long)local_3c8) == '\0') goto LAB_00153f0d;
  local_328 = *(ulong *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_328 * lVar32 + img_labels.accesses_._16_8_ + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1f8 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)(lVar32 * local_1f8 + img_labels.img_._16_8_ + 8 + uVar23 * 4);
LAB_00153efe:
  piVar3 = (int *)(local_328 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = img_labels.accesses_._16_8_;
  local_1f0 = local_1f8;
  local_320 = (long *)img_labels.img_._72_8_;
  local_1e8 = img_labels.img_._16_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_3c0 = img_labels.accesses_._16_8_;
  local_3b8 = img_labels.accesses_._16_8_;
  local_3b0 = (long *)img_labels.accesses_._72_8_;
  local_3a0 = img_labels.accesses_._16_8_;
  local_398 = (long *)img_labels.img_._16_8_;
  local_390 = img_labels.img_._16_8_;
  local_388 = img_labels.img_._16_8_;
  local_380 = img_labels.accesses_._16_8_;
  local_378 = img_labels.accesses_._16_8_;
  local_370 = img_labels.img_._16_8_;
  local_358 = img_labels.img_._16_8_;
  goto LAB_00153fc1;
LAB_00153f0d:
  lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar32 + img_labels.accesses_._16_8_;
  uVar23 = (ulong)(int)uVar21;
  piVar3 = (int *)(lVar18 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = lVar32 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
  uVar10 = *(uint *)(lVar32 + uVar23 * 4);
  piVar3 = (int *)(lVar18 + 8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  uVar14 = *(uint *)(lVar32 + 8 + uVar23 * 4);
  goto LAB_00153f49;
code_r0x0015b816:
  lVar18 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(local_308 * lVar18 + lVar40 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  lVar37 = *(long *)img_labels.img_._72_8_;
  uVar12 = *(undefined4 *)(local_308 * lVar37 + lVar42 + lVar25 * 4);
  piVar3 = (int *)(lVar18 * uVar22 + lVar40 + lVar25 * 4);
  *piVar3 = *piVar3 + 1;
  *(undefined4 *)(lVar37 * uVar22 + lVar42 + lVar25 * 4) = uVar12;
  local_360 = local_360 + 0x200000000;
  lVar25 = lVar25 + 2;
  goto LAB_0015b759;
LAB_0015665f:
  lVar32 = uVar22 - 2;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar32 + img.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  if (*(char *)(uVar23 + lVar18 * lVar32 + img.img_._16_8_) != '\0') {
LAB_0015c85b:
    lVar18 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(lVar18 * (uVar22 - 2) + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = *(long *)img_labels.img_._72_8_;
    uVar12 = *(undefined4 *)((uVar22 - 2) * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
    piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = lVar32 * uVar22 + img_labels.img_._16_8_;
LAB_0015b9cd:
    *(undefined4 *)(lVar32 + uVar23 * 4) = uVar12;
    local_380 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0015b9d6;
  }
  lVar18 = *(long *)img_labels.accesses_._72_8_ * lVar32 + img_labels.accesses_._16_8_;
  piVar3 = (int *)(lVar18 + -8 + (long)(int)uVar10 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = lVar32 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
  uVar10 = *(uint *)(lVar32 + -8 + (long)(int)uVar10 * 4);
  piVar3 = (int *)(lVar18 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  uVar14 = *(uint *)(lVar32 + uVar23 * 4);
  goto LAB_00156d6e;
LAB_001597b6:
  lVar27 = (long)(int)uVar10;
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * (uVar22 - 1) + img.accesses_._16_8_ + 4 +
                  lVar27 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = lVar18 * (uVar22 - 1);
  if (*(char *)(lVar27 + 1 + img.img_._16_8_ + lVar32) == '\0') {
    lVar18 = *(long *)img_labels.accesses_._72_8_ * uVar22 + img_labels.accesses_._16_8_;
    piVar3 = (int *)(lVar18 + -8 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = *(long *)img_labels.img_._72_8_ * uVar22 + img_labels.img_._16_8_;
    uVar12 = *(undefined4 *)(lVar32 + -8 + lVar27 * 4);
    piVar3 = (int *)(lVar18 + lVar27 * 4);
    *piVar3 = *piVar3 + 1;
    *(undefined4 *)(lVar32 + lVar27 * 4) = uVar12;
    local_380 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0015b9d6;
  }
LAB_00159fbd:
  uVar23 = (ulong)(int)uVar10;
  piVar3 = (int *)((uVar22 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + uVar23 * 4)
  ;
  *piVar3 = *piVar3 + 1;
  lVar27 = uVar22 - 2;
  if (*(char *)(uVar23 + lVar32 + img.img_._16_8_) != '\0') {
    lVar18 = *(long *)img_labels.accesses_._72_8_;
    piVar3 = (int *)(lVar18 * lVar27 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = *(long *)img_labels.img_._72_8_;
    uVar12 = *(undefined4 *)(lVar27 * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
    piVar3 = (int *)(lVar18 * uVar22 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    lVar32 = lVar32 * uVar22 + img_labels.img_._16_8_;
LAB_0015a038:
    *(undefined4 *)(lVar32 + uVar23 * 4) = uVar12;
    local_380 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0015b9d6;
  }
  piVar3 = (int *)(*(long *)img.accesses_._72_8_ * lVar27 + img.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  cVar28 = *(char *)(uVar23 + img.img_._16_8_ + lVar18 * lVar27);
  lVar18 = *(long *)img_labels.accesses_._72_8_;
  piVar3 = (int *)(lVar18 * lVar27 + img_labels.accesses_._16_8_ + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  lVar32 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(uint *)(lVar27 * lVar32 + img_labels.img_._16_8_ + uVar23 * 4);
  lVar18 = lVar18 * uVar22;
  if (cVar28 != '\0') {
    piVar3 = (int *)(lVar18 + img_labels.accesses_._16_8_ + uVar23 * 4);
    *piVar3 = *piVar3 + 1;
    *(uint *)(lVar32 * uVar22 + img_labels.img_._16_8_ + uVar23 * 4) = uVar10;
    local_380 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    goto LAB_0015b9d6;
  }
  piVar3 = (int *)(img_labels.accesses_._16_8_ + lVar18 + -8 + uVar23 * 4);
  *piVar3 = *piVar3 + 1;
  local_1e8 = img_labels.img_._16_8_ + lVar32 * uVar22;
LAB_00156a8f:
  uVar14 = *(uint *)(local_1e8 + -8 + uVar23 * 4);
LAB_00156d6e:
  uVar10 = RemSP::MemMerge(uVar10,uVar14);
  goto LAB_0015a734;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}